

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unaryop_x86_avx.cpp
# Opt level: O1

int __thiscall
ncnn::UnaryOp_x86_avx::forward_inplace(UnaryOp_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int iVar7;
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  ulong uVar19;
  uint uVar20;
  long lVar21;
  undefined1 (*pauVar22) [32];
  int iVar23;
  int iVar24;
  uint uVar25;
  uint uVar26;
  ulong uVar27;
  float *pfVar28;
  long lVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar75 [32];
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd_00;
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dd_01;
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dd_02;
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dd_03;
  undefined1 auVar111 [16];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dd_04;
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Dc_05;
  undefined4 extraout_XMM0_Dd_05;
  undefined1 auVar112 [16];
  undefined1 extraout_var_17 [60];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined4 extraout_XMM0_Db_06;
  undefined4 extraout_XMM0_Dc_06;
  undefined4 extraout_XMM0_Dd_06;
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined4 extraout_XMM0_Db_07;
  undefined4 extraout_XMM0_Dc_07;
  undefined4 extraout_XMM0_Dd_07;
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  undefined1 auVar101 [64];
  undefined4 extraout_XMM0_Db_08;
  undefined4 extraout_XMM0_Dc_08;
  undefined4 extraout_XMM0_Dd_08;
  undefined1 auVar102 [64];
  undefined1 auVar103 [64];
  undefined1 auVar104 [64];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined4 extraout_XMM0_Db_09;
  undefined4 extraout_XMM0_Dc_09;
  undefined4 extraout_XMM0_Dd_09;
  undefined1 auVar105 [64];
  undefined1 auVar106 [64];
  undefined1 auVar107 [64];
  undefined4 extraout_XMM0_Db_10;
  undefined4 extraout_XMM0_Dc_10;
  undefined4 extraout_XMM0_Dd_10;
  undefined1 auVar108 [64];
  undefined1 auVar109 [64];
  undefined1 auVar110 [64];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  float fVar113;
  undefined1 auVar133 [16];
  float fVar167;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar114 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar123 [16];
  undefined1 auVar155 [32];
  undefined1 auVar157 [32];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar158 [32];
  undefined1 auVar136 [16];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  float fVar165;
  float fVar166;
  float fVar168;
  float fVar169;
  float fVar170;
  undefined1 in_ZMM1 [64];
  undefined1 auVar171 [16];
  undefined1 auVar174 [16];
  undefined1 auVar184 [32];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar182 [16];
  undefined1 auVar186 [32];
  undefined1 auVar183 [32];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar187 [32];
  undefined1 in_ZMM2 [64];
  undefined1 auVar188 [64];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar185 [32];
  undefined1 auVar189 [64];
  float fVar190;
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [32];
  float fVar207;
  undefined1 auVar200 [32];
  undefined1 auVar191 [16];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  float fVar205;
  float fVar206;
  float fVar208;
  float fVar209;
  float fVar210;
  undefined1 in_ZMM3 [64];
  float fVar211;
  float fVar212;
  float fVar230;
  float fVar232;
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  float fVar234;
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  float fVar231;
  float fVar233;
  float fVar235;
  float fVar236;
  float fVar237;
  float fVar238;
  float fVar239;
  float fVar240;
  float fVar241;
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [32];
  undefined1 in_ZMM5 [64];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  undefined1 auVar281 [32];
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  undefined1 auVar287 [32];
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  undefined1 auVar290 [32];
  undefined1 auVar291 [32];
  undefined1 auVar292 [32];
  undefined1 auVar293 [32];
  undefined1 auVar294 [32];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [32];
  undefined1 auVar311 [32];
  undefined1 auVar312 [32];
  undefined1 auVar313 [32];
  undefined1 auVar314 [32];
  undefined1 auVar315 [32];
  undefined1 auVar316 [32];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [32];
  undefined1 auVar343 [32];
  undefined1 auVar344 [32];
  undefined1 auVar345 [32];
  undefined1 auVar346 [32];
  undefined1 auVar347 [32];
  undefined1 auVar348 [32];
  undefined1 auVar349 [32];
  undefined1 auVar350 [32];
  undefined1 auVar351 [32];
  undefined1 auVar352 [32];
  undefined1 auVar353 [32];
  undefined1 in_ZMM9 [64];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  undefined1 auVar364 [32];
  undefined1 auVar365 [32];
  undefined1 auVar366 [32];
  undefined1 auVar367 [32];
  undefined1 auVar368 [32];
  undefined1 in_ZMM10 [64];
  undefined1 auVar369 [16];
  undefined1 auVar370 [16];
  undefined1 auVar371 [16];
  undefined1 auVar372 [16];
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  undefined1 auVar375 [16];
  undefined1 auVar376 [16];
  undefined1 auVar378 [32];
  undefined1 auVar377 [16];
  undefined1 in_ZMM11 [64];
  undefined1 auVar379 [64];
  undefined1 auVar380 [16];
  undefined1 auVar381 [16];
  undefined1 auVar382 [16];
  undefined1 auVar383 [16];
  undefined1 auVar384 [16];
  undefined1 auVar385 [16];
  undefined1 auVar386 [16];
  undefined1 auVar387 [16];
  undefined1 auVar388 [16];
  undefined1 auVar389 [16];
  undefined1 local_118 [16];
  undefined1 local_e8 [16];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined1 extraout_var_03 [60];
  undefined1 extraout_var_04 [60];
  undefined1 extraout_var_05 [60];
  undefined1 extraout_var_06 [60];
  undefined1 extraout_var_07 [60];
  undefined1 extraout_var_08 [60];
  undefined1 extraout_var_09 [60];
  undefined1 extraout_var_10 [60];
  undefined1 extraout_var_11 [60];
  undefined1 extraout_var_12 [60];
  undefined1 extraout_var_13 [60];
  undefined1 extraout_var_14 [60];
  undefined1 extraout_var_15 [60];
  undefined1 extraout_var_16 [60];
  undefined1 extraout_var_18 [60];
  undefined1 extraout_var_19 [60];
  undefined1 extraout_var_20 [60];
  undefined1 extraout_var_21 [60];
  undefined1 extraout_var_22 [60];
  undefined1 extraout_var_23 [60];
  undefined1 extraout_var_24 [60];
  undefined1 extraout_var_25 [60];
  undefined1 extraout_var_26 [60];
  undefined1 extraout_var_27 [60];
  undefined1 extraout_var_28 [60];
  undefined1 extraout_var_29 [60];
  undefined1 extraout_var_30 [60];
  undefined1 extraout_var_31 [60];
  undefined1 extraout_var_32 [60];
  undefined1 extraout_var_33 [60];
  undefined1 extraout_var_34 [60];
  undefined1 auVar148 [32];
  undefined1 auVar151 [32];
  undefined1 auVar156 [32];
  undefined1 auVar159 [32];
  undefined1 auVar162 [32];
  
  auVar286 = _DAT_005e2da0;
  auVar260 = _DAT_005e2d80;
  auVar195 = in_ZMM3._0_16_;
  auVar180 = in_ZMM5._0_16_;
  switch((this->super_UnaryOp).op_type) {
  case 0:
    iVar7 = bottom_top_blob->c;
    if (0 < (long)iVar7) {
      uVar20 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      lVar21 = 0;
      auVar47._8_4_ = 0x7fffffff;
      auVar47._0_8_ = 0x7fffffff7fffffff;
      auVar47._12_4_ = 0x7fffffff;
      auVar47._16_4_ = 0x7fffffff;
      auVar47._20_4_ = 0x7fffffff;
      auVar47._24_4_ = 0x7fffffff;
      auVar47._28_4_ = 0x7fffffff;
      auVar114._8_4_ = 0x7fffffff;
      auVar114._0_8_ = 0x7fffffff7fffffff;
      auVar114._12_4_ = 0x7fffffff;
      auVar213._8_8_ = 0x8000000000000000;
      auVar213._0_8_ = 0x8000000000000000;
      auVar195 = vpcmpeqd_avx(auVar180,auVar180);
      do {
        pauVar22 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * lVar21 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar20 < 8) {
          uVar26 = 0;
        }
        else {
          iVar24 = 7;
          do {
            auVar351 = vandps_avx(auVar47,*pauVar22);
            *pauVar22 = auVar351;
            pauVar22 = pauVar22 + 1;
            iVar24 = iVar24 + 8;
            uVar26 = uVar20 & 0xfffffff8;
          } while (iVar24 < (int)uVar20);
        }
        uVar25 = uVar26 | 3;
        while ((int)uVar25 < (int)uVar20) {
          auVar180 = vandps_avx(auVar114,*(undefined1 (*) [16])*pauVar22);
          *(undefined1 (*) [16])*pauVar22 = auVar180;
          pauVar22 = (undefined1 (*) [32])(*pauVar22 + 0x10);
          uVar25 = uVar26 + 7;
          uVar26 = uVar26 + 4;
        }
        if ((int)uVar26 < (int)uVar20) {
          uVar19 = CONCAT44(0,~uVar26 + uVar20);
          auVar249._8_8_ = 0;
          auVar249._0_8_ = uVar19;
          auVar251 = vpshufd_avx(auVar249,0x44);
          auVar180 = vorps_avx(auVar251,auVar213);
          auVar141 = vorps_avx(auVar251,auVar213);
          auVar251 = vorps_avx(auVar251,auVar213);
          uVar27 = 0;
          do {
            auVar317._8_8_ = 0;
            auVar317._0_8_ = uVar27;
            auVar262 = vpshufd_avx(auVar317,0x44);
            auVar342._16_16_ = auVar262;
            auVar342._0_16_ = auVar262;
            auVar351 = vorps_avx(auVar342,auVar260);
            auVar293 = vorps_avx(auVar342,auVar286);
            auVar369._0_8_ = auVar293._16_8_ ^ 0x8000000000000000;
            auVar369._8_4_ = auVar293._24_4_;
            auVar369._12_4_ = auVar293._28_4_ ^ 0x80000000;
            auVar262 = vpcmpgtq_avx(auVar369,auVar180);
            auVar318._0_8_ = auVar293._0_8_ ^ 0x8000000000000000;
            auVar318._8_4_ = auVar293._8_4_;
            auVar318._12_4_ = auVar293._12_4_ ^ 0x80000000;
            auVar112 = vpcmpgtq_avx(auVar318,auVar141);
            auVar262 = vpackssdw_avx(auVar112,auVar262);
            auVar370._0_8_ = auVar351._16_8_ ^ 0x8000000000000000;
            auVar370._8_4_ = auVar351._24_4_;
            auVar370._12_4_ = auVar351._28_4_ ^ 0x80000000;
            auVar112 = vpcmpgtq_avx(auVar370,auVar180);
            auVar354._0_8_ = auVar351._0_8_ ^ 0x8000000000000000;
            auVar354._8_4_ = auVar351._8_4_;
            auVar354._12_4_ = auVar351._12_4_ ^ 0x80000000;
            auVar111 = vpcmpgtq_avx(auVar354,auVar251);
            auVar112 = vpackssdw_avx(auVar111,auVar112);
            auVar262 = vpackssdw_avx(auVar112 ^ auVar195,auVar262 ^ auVar195);
            auVar112 = vpmovsxwd_avx(auVar262);
            auVar262 = vpunpckhwd_avx(auVar262,auVar262);
            auVar343._16_16_ = auVar262;
            auVar343._0_16_ = auVar112;
            auVar351 = vmaskmovps_avx(auVar343,*(undefined1 (*) [32])(*pauVar22 + uVar27 * 4));
            auVar351 = vandps_avx(auVar351,auVar47);
            auVar351 = vmaskmovps_avx(auVar343,auVar351);
            *(undefined1 (*) [32])(*pauVar22 + uVar27 * 4) = auVar351;
            uVar27 = uVar27 + 8;
          } while ((uVar19 + 8 & 0x1fffffff8) != uVar27);
        }
        lVar21 = lVar21 + 1;
      } while (lVar21 != iVar7);
    }
    break;
  case 1:
    iVar7 = bottom_top_blob->c;
    if (0 < (long)iVar7) {
      uVar20 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      lVar21 = 0;
      auVar222._8_8_ = 0x8000000000000000;
      auVar222._0_8_ = 0x8000000000000000;
      auVar195 = vpcmpeqd_avx(auVar180,auVar180);
      do {
        pauVar22 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * lVar21 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar20 < 8) {
          uVar26 = 0;
        }
        else {
          iVar24 = 7;
          do {
            auVar351 = *pauVar22;
            auVar259._0_8_ = auVar351._0_8_ ^ 0x8000000080000000;
            auVar259._8_4_ = auVar351._8_4_ ^ 0x80000000;
            auVar259._12_4_ = auVar351._12_4_ ^ 0x80000000;
            auVar259._16_4_ = auVar351._16_4_ ^ 0x80000000;
            auVar259._20_4_ = auVar351._20_4_ ^ 0x80000000;
            auVar259._24_4_ = auVar351._24_4_ ^ 0x80000000;
            auVar259._28_4_ = auVar351._28_4_ ^ 0x80000000;
            *pauVar22 = auVar259;
            pauVar22 = pauVar22 + 1;
            iVar24 = iVar24 + 8;
            uVar26 = uVar20 & 0xfffffff8;
          } while (iVar24 < (int)uVar20);
        }
        uVar25 = uVar26 | 3;
        while ((int)uVar25 < (int)uVar20) {
          auVar180 = *(undefined1 (*) [16])*pauVar22;
          auVar253._0_8_ = auVar180._0_8_ ^ 0x8000000080000000;
          auVar253._8_4_ = auVar180._8_4_ ^ 0x80000000;
          auVar253._12_4_ = auVar180._12_4_ ^ 0x80000000;
          *(undefined1 (*) [16])*pauVar22 = auVar253;
          pauVar22 = (undefined1 (*) [32])(*pauVar22 + 0x10);
          uVar25 = uVar26 + 7;
          uVar26 = uVar26 + 4;
        }
        if ((int)uVar26 < (int)uVar20) {
          uVar19 = CONCAT44(0,~uVar26 + uVar20);
          auVar254._8_8_ = 0;
          auVar254._0_8_ = uVar19;
          auVar251 = vpshufd_avx(auVar254,0x44);
          auVar180 = vorps_avx(auVar251,auVar222);
          auVar141 = vorps_avx(auVar251,auVar222);
          auVar251 = vorps_avx(auVar251,auVar222);
          uVar27 = 0;
          do {
            auVar330._8_8_ = 0;
            auVar330._0_8_ = uVar27;
            auVar262 = vpshufd_avx(auVar330,0x44);
            auVar349._16_16_ = auVar262;
            auVar349._0_16_ = auVar262;
            auVar351 = vorps_avx(auVar349,auVar260);
            auVar293 = vorps_avx(auVar349,auVar286);
            auVar375._0_8_ = auVar293._16_8_ ^ 0x8000000000000000;
            auVar375._8_4_ = auVar293._24_4_;
            auVar375._12_4_ = auVar293._28_4_ ^ 0x80000000;
            auVar262 = vpcmpgtq_avx(auVar375,auVar180);
            auVar331._0_8_ = auVar293._0_8_ ^ 0x8000000000000000;
            auVar331._8_4_ = auVar293._8_4_;
            auVar331._12_4_ = auVar293._12_4_ ^ 0x80000000;
            auVar112 = vpcmpgtq_avx(auVar331,auVar141);
            auVar262 = vpackssdw_avx(auVar112,auVar262);
            auVar376._0_8_ = auVar351._16_8_ ^ 0x8000000000000000;
            auVar376._8_4_ = auVar351._24_4_;
            auVar376._12_4_ = auVar351._28_4_ ^ 0x80000000;
            auVar112 = vpcmpgtq_avx(auVar376,auVar180);
            auVar358._0_8_ = auVar351._0_8_ ^ 0x8000000000000000;
            auVar358._8_4_ = auVar351._8_4_;
            auVar358._12_4_ = auVar351._12_4_ ^ 0x80000000;
            auVar111 = vpcmpgtq_avx(auVar358,auVar251);
            auVar112 = vpackssdw_avx(auVar111,auVar112);
            auVar262 = vpackssdw_avx(auVar112 ^ auVar195,auVar262 ^ auVar195);
            auVar112 = vpmovsxwd_avx(auVar262);
            auVar262 = vpunpckhwd_avx(auVar262,auVar262);
            auVar350._16_16_ = auVar262;
            auVar350._0_16_ = auVar112;
            auVar351 = vmaskmovps_avx(auVar350,*(undefined1 (*) [32])(*pauVar22 + uVar27 * 4));
            auVar366._0_8_ = auVar351._0_8_ ^ 0x8000000080000000;
            auVar366._8_4_ = auVar351._8_4_ ^ 0x80000000;
            auVar366._12_4_ = auVar351._12_4_ ^ 0x80000000;
            auVar366._16_4_ = auVar351._16_4_ ^ 0x80000000;
            auVar366._20_4_ = auVar351._20_4_ ^ 0x80000000;
            auVar366._24_4_ = auVar351._24_4_ ^ 0x80000000;
            auVar366._28_4_ = auVar351._28_4_ ^ 0x80000000;
            auVar351 = vmaskmovps_avx(auVar350,auVar366);
            *(undefined1 (*) [32])(*pauVar22 + uVar27 * 4) = auVar351;
            uVar27 = uVar27 + 8;
          } while ((uVar19 + 8 & 0x1fffffff8) != uVar27);
        }
        lVar21 = lVar21 + 1;
      } while (lVar21 != iVar7);
    }
    break;
  case 2:
    iVar7 = bottom_top_blob->c;
    if (0 < (long)iVar7) {
      uVar20 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      lVar21 = 0;
      auVar177._8_8_ = 0x8000000000000000;
      auVar177._0_8_ = 0x8000000000000000;
      auVar195 = vpcmpeqd_avx(auVar195,auVar195);
      do {
        pauVar22 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * lVar21 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar20 < 8) {
          uVar26 = 0;
        }
        else {
          iVar24 = 7;
          do {
            auVar351 = vroundps_avx(*pauVar22,1);
            *pauVar22 = auVar351;
            pauVar22 = pauVar22 + 1;
            iVar24 = iVar24 + 8;
            uVar26 = uVar20 & 0xfffffff8;
          } while (iVar24 < (int)uVar20);
        }
        uVar25 = uVar26 | 3;
        while ((int)uVar25 < (int)uVar20) {
          auVar180 = vroundps_avx(*(undefined1 (*) [16])*pauVar22,1);
          *(undefined1 (*) [16])*pauVar22 = auVar180;
          pauVar22 = (undefined1 (*) [32])(*pauVar22 + 0x10);
          uVar25 = uVar26 + 7;
          uVar26 = uVar26 + 4;
        }
        if ((int)uVar26 < (int)uVar20) {
          uVar19 = CONCAT44(0,~uVar26 + uVar20);
          auVar218._8_8_ = 0;
          auVar218._0_8_ = uVar19;
          auVar251 = vpshufd_avx(auVar218,0x44);
          auVar180 = vorps_avx(auVar251,auVar177);
          auVar141 = vorps_avx(auVar251,auVar177);
          auVar251 = vorps_avx(auVar251,auVar177);
          uVar27 = 0;
          do {
            auVar265._8_8_ = 0;
            auVar265._0_8_ = uVar27;
            auVar262 = vpshufd_avx(auVar265,0x44);
            auVar282._16_16_ = auVar262;
            auVar282._0_16_ = auVar262;
            auVar351 = vorps_avx(auVar282,auVar260);
            auVar293 = vorps_avx(auVar282,auVar286);
            auVar324._0_8_ = auVar293._16_8_ ^ 0x8000000000000000;
            auVar324._8_4_ = auVar293._24_4_;
            auVar324._12_4_ = auVar293._28_4_ ^ 0x80000000;
            auVar262 = vpcmpgtq_avx(auVar324,auVar180);
            auVar266._0_8_ = auVar293._0_8_ ^ 0x8000000000000000;
            auVar266._8_4_ = auVar293._8_4_;
            auVar266._12_4_ = auVar293._12_4_ ^ 0x80000000;
            auVar112 = vpcmpgtq_avx(auVar266,auVar141);
            auVar262 = vpackssdw_avx(auVar112,auVar262);
            auVar325._0_8_ = auVar351._16_8_ ^ 0x8000000000000000;
            auVar325._8_4_ = auVar351._24_4_;
            auVar325._12_4_ = auVar351._28_4_ ^ 0x80000000;
            auVar112 = vpcmpgtq_avx(auVar325,auVar180);
            auVar299._0_8_ = auVar351._0_8_ ^ 0x8000000000000000;
            auVar299._8_4_ = auVar351._8_4_;
            auVar299._12_4_ = auVar351._12_4_ ^ 0x80000000;
            auVar111 = vpcmpgtq_avx(auVar299,auVar251);
            auVar112 = vpackssdw_avx(auVar111,auVar112);
            auVar262 = vpackssdw_avx(auVar112 ^ auVar195,auVar262 ^ auVar195);
            auVar112 = vpmovsxwd_avx(auVar262);
            auVar262 = vpunpckhwd_avx(auVar262,auVar262);
            auVar283._16_16_ = auVar262;
            auVar283._0_16_ = auVar112;
            auVar351 = vmaskmovps_avx(auVar283,*(undefined1 (*) [32])(*pauVar22 + uVar27 * 4));
            auVar351 = vroundps_avx(auVar351,9);
            auVar351 = vmaskmovps_avx(auVar283,auVar351);
            *(undefined1 (*) [32])(*pauVar22 + uVar27 * 4) = auVar351;
            uVar27 = uVar27 + 8;
          } while ((uVar19 + 8 & 0x1fffffff8) != uVar27);
        }
        lVar21 = lVar21 + 1;
      } while (lVar21 != iVar7);
    }
    break;
  case 3:
    iVar7 = bottom_top_blob->c;
    if (0 < (long)iVar7) {
      uVar20 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      lVar21 = 0;
      auVar178._8_8_ = 0x8000000000000000;
      auVar178._0_8_ = 0x8000000000000000;
      auVar195 = vpcmpeqd_avx(auVar195,auVar195);
      do {
        pauVar22 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * lVar21 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar20 < 8) {
          uVar26 = 0;
        }
        else {
          iVar24 = 7;
          do {
            auVar351 = vroundps_avx(*pauVar22,2);
            *pauVar22 = auVar351;
            pauVar22 = pauVar22 + 1;
            iVar24 = iVar24 + 8;
            uVar26 = uVar20 & 0xfffffff8;
          } while (iVar24 < (int)uVar20);
        }
        uVar25 = uVar26 | 3;
        while ((int)uVar25 < (int)uVar20) {
          auVar180 = vroundps_avx(*(undefined1 (*) [16])*pauVar22,2);
          *(undefined1 (*) [16])*pauVar22 = auVar180;
          pauVar22 = (undefined1 (*) [32])(*pauVar22 + 0x10);
          uVar25 = uVar26 + 7;
          uVar26 = uVar26 + 4;
        }
        if ((int)uVar26 < (int)uVar20) {
          uVar19 = CONCAT44(0,~uVar26 + uVar20);
          auVar220._8_8_ = 0;
          auVar220._0_8_ = uVar19;
          auVar251 = vpshufd_avx(auVar220,0x44);
          auVar180 = vorps_avx(auVar251,auVar178);
          auVar141 = vorps_avx(auVar251,auVar178);
          auVar251 = vorps_avx(auVar251,auVar178);
          uVar27 = 0;
          do {
            auVar267._8_8_ = 0;
            auVar267._0_8_ = uVar27;
            auVar262 = vpshufd_avx(auVar267,0x44);
            auVar284._16_16_ = auVar262;
            auVar284._0_16_ = auVar262;
            auVar351 = vorps_avx(auVar284,auVar260);
            auVar293 = vorps_avx(auVar284,auVar286);
            auVar328._0_8_ = auVar293._16_8_ ^ 0x8000000000000000;
            auVar328._8_4_ = auVar293._24_4_;
            auVar328._12_4_ = auVar293._28_4_ ^ 0x80000000;
            auVar262 = vpcmpgtq_avx(auVar328,auVar180);
            auVar268._0_8_ = auVar293._0_8_ ^ 0x8000000000000000;
            auVar268._8_4_ = auVar293._8_4_;
            auVar268._12_4_ = auVar293._12_4_ ^ 0x80000000;
            auVar112 = vpcmpgtq_avx(auVar268,auVar141);
            auVar262 = vpackssdw_avx(auVar112,auVar262);
            auVar329._0_8_ = auVar351._16_8_ ^ 0x8000000000000000;
            auVar329._8_4_ = auVar351._24_4_;
            auVar329._12_4_ = auVar351._28_4_ ^ 0x80000000;
            auVar112 = vpcmpgtq_avx(auVar329,auVar180);
            auVar300._0_8_ = auVar351._0_8_ ^ 0x8000000000000000;
            auVar300._8_4_ = auVar351._8_4_;
            auVar300._12_4_ = auVar351._12_4_ ^ 0x80000000;
            auVar111 = vpcmpgtq_avx(auVar300,auVar251);
            auVar112 = vpackssdw_avx(auVar111,auVar112);
            auVar262 = vpackssdw_avx(auVar112 ^ auVar195,auVar262 ^ auVar195);
            auVar112 = vpmovsxwd_avx(auVar262);
            auVar262 = vpunpckhwd_avx(auVar262,auVar262);
            auVar285._16_16_ = auVar262;
            auVar285._0_16_ = auVar112;
            auVar351 = vmaskmovps_avx(auVar285,*(undefined1 (*) [32])(*pauVar22 + uVar27 * 4));
            auVar351 = vroundps_avx(auVar351,10);
            auVar351 = vmaskmovps_avx(auVar285,auVar351);
            *(undefined1 (*) [32])(*pauVar22 + uVar27 * 4) = auVar351;
            uVar27 = uVar27 + 8;
          } while ((uVar19 + 8 & 0x1fffffff8) != uVar27);
        }
        lVar21 = lVar21 + 1;
      } while (lVar21 != iVar7);
    }
    break;
  case 4:
    iVar7 = bottom_top_blob->c;
    if (0 < (long)iVar7) {
      uVar20 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      lVar21 = 0;
      auVar173._8_8_ = 0x8000000000000000;
      auVar173._0_8_ = 0x8000000000000000;
      auVar195 = vpcmpeqd_avx(auVar195,auVar195);
      do {
        pauVar22 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * lVar21 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar20 < 8) {
          uVar26 = 0;
        }
        else {
          iVar24 = 7;
          do {
            auVar8._4_4_ = *(float *)(*pauVar22 + 4) * *(float *)(*pauVar22 + 4);
            auVar8._0_4_ = *(float *)*pauVar22 * *(float *)*pauVar22;
            auVar8._8_4_ = *(float *)(*pauVar22 + 8) * *(float *)(*pauVar22 + 8);
            auVar8._12_4_ = *(float *)(*pauVar22 + 0xc) * *(float *)(*pauVar22 + 0xc);
            auVar8._16_4_ = *(float *)(*pauVar22 + 0x10) * *(float *)(*pauVar22 + 0x10);
            auVar8._20_4_ = *(float *)(*pauVar22 + 0x14) * *(float *)(*pauVar22 + 0x14);
            auVar8._24_4_ = *(float *)(*pauVar22 + 0x18) * *(float *)(*pauVar22 + 0x18);
            auVar8._28_4_ = *(undefined4 *)(*pauVar22 + 0x1c);
            *pauVar22 = auVar8;
            pauVar22 = pauVar22 + 1;
            iVar24 = iVar24 + 8;
            uVar26 = uVar20 & 0xfffffff8;
          } while (iVar24 < (int)uVar20);
        }
        uVar25 = uVar26 | 3;
        while ((int)uVar25 < (int)uVar20) {
          auVar215._0_4_ = *(float *)*pauVar22 * *(float *)*pauVar22;
          auVar215._4_4_ = *(float *)(*pauVar22 + 4) * *(float *)(*pauVar22 + 4);
          auVar215._8_4_ = *(float *)(*pauVar22 + 8) * *(float *)(*pauVar22 + 8);
          auVar215._12_4_ = *(float *)(*pauVar22 + 0xc) * *(float *)(*pauVar22 + 0xc);
          *(undefined1 (*) [16])*pauVar22 = auVar215;
          pauVar22 = (undefined1 (*) [32])(*pauVar22 + 0x10);
          uVar25 = uVar26 + 7;
          uVar26 = uVar26 + 4;
        }
        if ((int)uVar26 < (int)uVar20) {
          uVar19 = CONCAT44(0,~uVar26 + uVar20);
          auVar216._8_8_ = 0;
          auVar216._0_8_ = uVar19;
          auVar251 = vpshufd_avx(auVar216,0x44);
          auVar180 = vorps_avx(auVar251,auVar173);
          auVar141 = vorps_avx(auVar251,auVar173);
          auVar251 = vorps_avx(auVar251,auVar173);
          uVar27 = 0;
          do {
            auVar263._8_8_ = 0;
            auVar263._0_8_ = uVar27;
            auVar262 = vpshufd_avx(auVar263,0x44);
            auVar278._16_16_ = auVar262;
            auVar278._0_16_ = auVar262;
            auVar351 = vorps_avx(auVar278,auVar260);
            auVar293 = vorps_avx(auVar278,auVar286);
            auVar321._0_8_ = auVar293._16_8_ ^ 0x8000000000000000;
            auVar321._8_4_ = auVar293._24_4_;
            auVar321._12_4_ = auVar293._28_4_ ^ 0x80000000;
            auVar262 = vpcmpgtq_avx(auVar321,auVar180);
            auVar264._0_8_ = auVar293._0_8_ ^ 0x8000000000000000;
            auVar264._8_4_ = auVar293._8_4_;
            auVar264._12_4_ = auVar293._12_4_ ^ 0x80000000;
            auVar112 = vpcmpgtq_avx(auVar264,auVar141);
            auVar262 = vpackssdw_avx(auVar112,auVar262);
            auVar322._0_8_ = auVar351._16_8_ ^ 0x8000000000000000;
            auVar322._8_4_ = auVar351._24_4_;
            auVar322._12_4_ = auVar351._28_4_ ^ 0x80000000;
            auVar112 = vpcmpgtq_avx(auVar322,auVar180);
            auVar296._0_8_ = auVar351._0_8_ ^ 0x8000000000000000;
            auVar296._8_4_ = auVar351._8_4_;
            auVar296._12_4_ = auVar351._12_4_ ^ 0x80000000;
            auVar111 = vpcmpgtq_avx(auVar296,auVar251);
            auVar112 = vpackssdw_avx(auVar111,auVar112);
            auVar262 = vpackssdw_avx(auVar112 ^ auVar195,auVar262 ^ auVar195);
            auVar112 = vpmovsxwd_avx(auVar262);
            auVar262 = vpunpckhwd_avx(auVar262,auVar262);
            auVar279._16_16_ = auVar262;
            auVar279._0_16_ = auVar112;
            auVar351 = vmaskmovps_avx(auVar279,*(undefined1 (*) [32])(*pauVar22 + uVar27 * 4));
            auVar9._4_4_ = auVar351._4_4_ * auVar351._4_4_;
            auVar9._0_4_ = auVar351._0_4_ * auVar351._0_4_;
            auVar9._8_4_ = auVar351._8_4_ * auVar351._8_4_;
            auVar9._12_4_ = auVar351._12_4_ * auVar351._12_4_;
            auVar9._16_4_ = auVar351._16_4_ * auVar351._16_4_;
            auVar9._20_4_ = auVar351._20_4_ * auVar351._20_4_;
            auVar9._24_4_ = auVar351._24_4_ * auVar351._24_4_;
            auVar9._28_4_ = auVar351._28_4_;
            auVar351 = vmaskmovps_avx(auVar279,auVar9);
            *(undefined1 (*) [32])(*pauVar22 + uVar27 * 4) = auVar351;
            uVar27 = uVar27 + 8;
          } while ((uVar19 + 8 & 0x1fffffff8) != uVar27);
        }
        lVar21 = lVar21 + 1;
      } while (lVar21 != iVar7);
    }
    break;
  case 5:
    iVar7 = bottom_top_blob->c;
    if (0 < (long)iVar7) {
      uVar20 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      lVar21 = 0;
      auVar181._8_8_ = 0x8000000000000000;
      auVar181._0_8_ = 0x8000000000000000;
      auVar195 = vpcmpeqd_avx(auVar195,auVar195);
      do {
        pauVar22 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * lVar21 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar20 < 8) {
          uVar26 = 0;
        }
        else {
          iVar24 = 7;
          do {
            auVar351 = vsqrtps_avx(*pauVar22);
            *pauVar22 = auVar351;
            pauVar22 = pauVar22 + 1;
            iVar24 = iVar24 + 8;
            uVar26 = uVar20 & 0xfffffff8;
          } while (iVar24 < (int)uVar20);
        }
        uVar25 = uVar26 | 3;
        while ((int)uVar25 < (int)uVar20) {
          auVar180 = vsqrtps_avx(*(undefined1 (*) [16])*pauVar22);
          *(undefined1 (*) [16])*pauVar22 = auVar180;
          pauVar22 = (undefined1 (*) [32])(*pauVar22 + 0x10);
          uVar25 = uVar26 + 7;
          uVar26 = uVar26 + 4;
        }
        if ((int)uVar26 < (int)uVar20) {
          uVar19 = CONCAT44(0,~uVar26 + uVar20);
          auVar223._8_8_ = 0;
          auVar223._0_8_ = uVar19;
          auVar251 = vpshufd_avx(auVar223,0x44);
          auVar180 = vorps_avx(auVar251,auVar181);
          auVar141 = vorps_avx(auVar251,auVar181);
          auVar251 = vorps_avx(auVar251,auVar181);
          uVar27 = 0;
          do {
            auVar270._8_8_ = 0;
            auVar270._0_8_ = uVar27;
            auVar262 = vpshufd_avx(auVar270,0x44);
            auVar287._16_16_ = auVar262;
            auVar287._0_16_ = auVar262;
            auVar351 = vorps_avx(auVar287,auVar260);
            auVar293 = vorps_avx(auVar287,auVar286);
            auVar333._0_8_ = auVar293._16_8_ ^ 0x8000000000000000;
            auVar333._8_4_ = auVar293._24_4_;
            auVar333._12_4_ = auVar293._28_4_ ^ 0x80000000;
            auVar262 = vpcmpgtq_avx(auVar333,auVar180);
            auVar271._0_8_ = auVar293._0_8_ ^ 0x8000000000000000;
            auVar271._8_4_ = auVar293._8_4_;
            auVar271._12_4_ = auVar293._12_4_ ^ 0x80000000;
            auVar112 = vpcmpgtq_avx(auVar271,auVar141);
            auVar262 = vpackssdw_avx(auVar112,auVar262);
            auVar334._0_8_ = auVar351._16_8_ ^ 0x8000000000000000;
            auVar334._8_4_ = auVar351._24_4_;
            auVar334._12_4_ = auVar351._28_4_ ^ 0x80000000;
            auVar112 = vpcmpgtq_avx(auVar334,auVar180);
            auVar302._0_8_ = auVar351._0_8_ ^ 0x8000000000000000;
            auVar302._8_4_ = auVar351._8_4_;
            auVar302._12_4_ = auVar351._12_4_ ^ 0x80000000;
            auVar111 = vpcmpgtq_avx(auVar302,auVar251);
            auVar112 = vpackssdw_avx(auVar111,auVar112);
            auVar262 = vpackssdw_avx(auVar112 ^ auVar195,auVar262 ^ auVar195);
            auVar112 = vpmovsxwd_avx(auVar262);
            auVar262 = vpunpckhwd_avx(auVar262,auVar262);
            auVar288._16_16_ = auVar262;
            auVar288._0_16_ = auVar112;
            auVar351 = vmaskmovps_avx(auVar288,*(undefined1 (*) [32])(*pauVar22 + uVar27 * 4));
            auVar351 = vsqrtps_avx(auVar351);
            auVar351 = vmaskmovps_avx(auVar288,auVar351);
            *(undefined1 (*) [32])(*pauVar22 + uVar27 * 4) = auVar351;
            uVar27 = uVar27 + 8;
          } while ((uVar19 + 8 & 0x1fffffff8) != uVar27);
        }
        lVar21 = lVar21 + 1;
      } while (lVar21 != iVar7);
    }
    break;
  case 6:
    iVar7 = bottom_top_blob->c;
    if (0 < (long)iVar7) {
      uVar20 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      lVar21 = 0;
      auVar182._8_8_ = 0x8000000000000000;
      auVar182._0_8_ = 0x8000000000000000;
      auVar195 = vpcmpeqd_avx(auVar195,auVar195);
      auVar229._8_4_ = 0x3f800000;
      auVar229._0_8_ = 0x3f8000003f800000;
      auVar229._12_4_ = 0x3f800000;
      auVar229._16_4_ = 0x3f800000;
      auVar229._20_4_ = 0x3f800000;
      auVar229._24_4_ = 0x3f800000;
      auVar229._28_4_ = 0x3f800000;
      do {
        pauVar22 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * lVar21 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar20 < 8) {
          uVar26 = 0;
        }
        else {
          iVar24 = 7;
          do {
            auVar351 = vrsqrtps_avx(*pauVar22);
            *pauVar22 = auVar351;
            pauVar22 = pauVar22 + 1;
            iVar24 = iVar24 + 8;
            uVar26 = uVar20 & 0xfffffff8;
          } while (iVar24 < (int)uVar20);
        }
        uVar25 = uVar26 | 3;
        while ((int)uVar25 < (int)uVar20) {
          auVar180 = vrsqrtps_avx(*(undefined1 (*) [16])*pauVar22);
          *(undefined1 (*) [16])*pauVar22 = auVar180;
          pauVar22 = (undefined1 (*) [32])(*pauVar22 + 0x10);
          uVar25 = uVar26 + 7;
          uVar26 = uVar26 + 4;
        }
        if ((int)uVar26 < (int)uVar20) {
          uVar19 = CONCAT44(0,~uVar26 + uVar20);
          auVar245._8_8_ = 0;
          auVar245._0_8_ = uVar19;
          auVar251 = vpshufd_avx(auVar245,0x44);
          auVar180 = vorps_avx(auVar251,auVar182);
          auVar141 = vorps_avx(auVar251,auVar182);
          auVar251 = vorps_avx(auVar251,auVar182);
          uVar27 = 0;
          do {
            auVar304._8_8_ = 0;
            auVar304._0_8_ = uVar27;
            auVar262 = vpshufd_avx(auVar304,0x44);
            auVar314._16_16_ = auVar262;
            auVar314._0_16_ = auVar262;
            auVar351 = vorps_avx(auVar314,auVar260);
            auVar293 = vorps_avx(auVar314,auVar286);
            auVar361._0_8_ = auVar293._16_8_ ^ 0x8000000000000000;
            auVar361._8_4_ = auVar293._24_4_;
            auVar361._12_4_ = auVar293._28_4_ ^ 0x80000000;
            auVar262 = vpcmpgtq_avx(auVar361,auVar180);
            auVar305._0_8_ = auVar293._0_8_ ^ 0x8000000000000000;
            auVar305._8_4_ = auVar293._8_4_;
            auVar305._12_4_ = auVar293._12_4_ ^ 0x80000000;
            auVar112 = vpcmpgtq_avx(auVar305,auVar141);
            auVar262 = vpackssdw_avx(auVar112,auVar262);
            auVar362._0_8_ = auVar351._16_8_ ^ 0x8000000000000000;
            auVar362._8_4_ = auVar351._24_4_;
            auVar362._12_4_ = auVar351._28_4_ ^ 0x80000000;
            auVar112 = vpcmpgtq_avx(auVar362,auVar180);
            auVar336._0_8_ = auVar351._0_8_ ^ 0x8000000000000000;
            auVar336._8_4_ = auVar351._8_4_;
            auVar336._12_4_ = auVar351._12_4_ ^ 0x80000000;
            auVar111 = vpcmpgtq_avx(auVar336,auVar251);
            auVar112 = vpackssdw_avx(auVar111,auVar112);
            auVar262 = vpackssdw_avx(auVar112 ^ auVar195,auVar262 ^ auVar195);
            auVar112 = vpmovsxwd_avx(auVar262);
            auVar262 = vpunpckhwd_avx(auVar262,auVar262);
            auVar315._16_16_ = auVar262;
            auVar315._0_16_ = auVar112;
            auVar351 = vmaskmovps_avx(auVar315,*(undefined1 (*) [32])(*pauVar22 + uVar27 * 4));
            auVar351 = vsqrtps_avx(auVar351);
            auVar351 = vdivps_avx(auVar229,auVar351);
            auVar351 = vmaskmovps_avx(auVar315,auVar351);
            *(undefined1 (*) [32])(*pauVar22 + uVar27 * 4) = auVar351;
            uVar27 = uVar27 + 8;
          } while ((uVar19 + 8 & 0x1fffffff8) != uVar27);
        }
        lVar21 = lVar21 + 1;
      } while (lVar21 != iVar7);
    }
    break;
  case 7:
    iVar7 = bottom_top_blob->c;
    if (0 < (long)iVar7) {
      uVar20 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      lVar21 = 0;
      do {
        auVar312._8_4_ = 0x3f800000;
        auVar312._0_8_ = 0x3f8000003f800000;
        auVar248._8_4_ = 0xc2b0c0a5;
        auVar248._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar227._8_4_ = 0x42b0c0a5;
        auVar227._0_8_ = 0x42b0c0a542b0c0a5;
        auVar312._12_4_ = 0x3f800000;
        auVar248._12_4_ = 0xc2b0c0a5;
        auVar227._12_4_ = 0x42b0c0a5;
        auVar312._16_4_ = 0x3f800000;
        auVar248._16_4_ = 0xc2b0c0a5;
        auVar227._16_4_ = 0x42b0c0a5;
        auVar312._20_4_ = 0x3f800000;
        auVar248._20_4_ = 0xc2b0c0a5;
        auVar227._20_4_ = 0x42b0c0a5;
        auVar389._8_4_ = 0x3f800000;
        auVar389._0_8_ = 0x3f8000003f800000;
        auVar312._24_4_ = 0x3f800000;
        auVar248._24_4_ = 0xc2b0c0a5;
        auVar227._24_4_ = 0x42b0c0a5;
        auVar389._12_4_ = 0x3f800000;
        auVar312._28_4_ = 0x3f800000;
        auVar248._28_4_ = 0xc2b0c0a5;
        auVar227._28_4_ = 0x42b0c0a5;
        pauVar22 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * lVar21 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar20 < 8) {
          uVar26 = 0;
        }
        else {
          iVar24 = 7;
          do {
            auVar260 = vminps_avx(auVar227,*pauVar22);
            auVar286 = vmaxps_avx(auVar260,auVar248);
            auVar158._0_4_ = auVar286._0_4_ * 1.442695 + 0.5;
            auVar158._4_4_ = auVar286._4_4_ * 1.442695 + 0.5;
            auVar158._8_4_ = auVar286._8_4_ * 1.442695 + 0.5;
            auVar158._12_4_ = auVar286._12_4_ * 1.442695 + 0.5;
            auVar158._16_4_ = auVar286._16_4_ * 1.442695 + 0.5;
            auVar158._20_4_ = auVar286._20_4_ * 1.442695 + 0.5;
            auVar158._24_4_ = auVar286._24_4_ * 1.442695 + 0.5;
            auVar158._28_4_ = in_ZMM1._28_4_ + 0.5;
            auVar351 = vroundps_avx(auVar158,1);
            auVar260 = vcmpps_avx(auVar158,auVar351,1);
            auVar260 = vandps_avx(auVar312,auVar260);
            auVar260 = vsubps_avx(auVar351,auVar260);
            fVar113 = auVar286._0_4_ + auVar260._0_4_ * -0.6931472;
            fVar165 = auVar286._4_4_ + auVar260._4_4_ * -0.6931472;
            fVar166 = auVar286._8_4_ + auVar260._8_4_ * -0.6931472;
            fVar167 = auVar286._12_4_ + auVar260._12_4_ * -0.6931472;
            fVar168 = auVar286._16_4_ + auVar260._16_4_ * -0.6931472;
            fVar169 = auVar286._20_4_ + auVar260._20_4_ * -0.6931472;
            fVar170 = auVar286._24_4_ + auVar260._24_4_ * -0.6931472;
            auVar130._0_4_ = (int)auVar260._0_4_;
            auVar130._4_4_ = (int)auVar260._4_4_;
            auVar130._8_4_ = (int)auVar260._8_4_;
            auVar130._12_4_ = (int)auVar260._12_4_;
            auVar159._16_4_ = (int)auVar260._16_4_;
            auVar159._0_16_ = auVar130;
            auVar159._20_4_ = (int)auVar260._20_4_;
            auVar159._24_4_ = (int)auVar260._24_4_;
            auVar159._28_4_ = (int)auVar260._28_4_;
            auVar180 = vpslld_avx(auVar130,0x17);
            auVar195 = vpslld_avx(auVar159._16_16_,0x17);
            auVar195 = vpaddd_avx(auVar389,auVar195);
            auVar180 = vpaddd_avx(auVar389,auVar180);
            in_ZMM1 = ZEXT3264(CONCAT1616(auVar195,auVar180));
            *(float *)*pauVar22 =
                 (fVar113 + 1.0 +
                 fVar113 * fVar113 *
                 (((((fVar113 * 0.00019875691 + 0.0013981999) * fVar113 + 0.008333452) * fVar113 +
                   0.041665796) * fVar113 + 0.16666666) * fVar113 + 0.5)) * auVar180._0_4_;
            *(float *)(*pauVar22 + 4) =
                 (fVar165 + 1.0 +
                 fVar165 * fVar165 *
                 (((((fVar165 * 0.00019875691 + 0.0013981999) * fVar165 + 0.008333452) * fVar165 +
                   0.041665796) * fVar165 + 0.16666666) * fVar165 + 0.5)) * auVar180._4_4_;
            *(float *)(*pauVar22 + 8) =
                 (fVar166 + 1.0 +
                 fVar166 * fVar166 *
                 (((((fVar166 * 0.00019875691 + 0.0013981999) * fVar166 + 0.008333452) * fVar166 +
                   0.041665796) * fVar166 + 0.16666666) * fVar166 + 0.5)) * auVar180._8_4_;
            *(float *)(*pauVar22 + 0xc) =
                 (fVar167 + 1.0 +
                 fVar167 * fVar167 *
                 (((((fVar167 * 0.00019875691 + 0.0013981999) * fVar167 + 0.008333452) * fVar167 +
                   0.041665796) * fVar167 + 0.16666666) * fVar167 + 0.5)) * auVar180._12_4_;
            *(float *)(*pauVar22 + 0x10) =
                 (fVar168 + 1.0 +
                 fVar168 * fVar168 *
                 (((((fVar168 * 0.00019875691 + 0.0013981999) * fVar168 + 0.008333452) * fVar168 +
                   0.041665796) * fVar168 + 0.16666666) * fVar168 + 0.5)) * auVar195._0_4_;
            *(float *)(*pauVar22 + 0x14) =
                 (fVar169 + 1.0 +
                 fVar169 * fVar169 *
                 (((((fVar169 * 0.00019875691 + 0.0013981999) * fVar169 + 0.008333452) * fVar169 +
                   0.041665796) * fVar169 + 0.16666666) * fVar169 + 0.5)) * auVar195._4_4_;
            *(float *)(*pauVar22 + 0x18) =
                 (fVar170 + 1.0 +
                 fVar170 * fVar170 *
                 (((((fVar170 * 0.00019875691 + 0.0013981999) * fVar170 + 0.008333452) * fVar170 +
                   0.041665796) * fVar170 + 0.16666666) * fVar170 + 0.5)) * auVar195._8_4_;
            *(float *)(*pauVar22 + 0x1c) = auVar286._28_4_ + auVar351._28_4_ + 1.0 + auVar351._28_4_
            ;
            pauVar22 = pauVar22 + 1;
            iVar24 = iVar24 + 8;
            uVar26 = uVar20 & 0xfffffff8;
          } while (iVar24 < (int)uVar20);
        }
        auVar221._8_4_ = 0x42b0c0a5;
        auVar221._0_8_ = 0x42b0c0a542b0c0a5;
        auVar221._12_4_ = 0x42b0c0a5;
        auVar244._8_4_ = 0xc2b0c0a5;
        auVar244._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar244._12_4_ = 0xc2b0c0a5;
        auVar15._8_8_ = 0x8000000000000000;
        auVar15._0_8_ = 0x8000000000000000;
        uVar25 = uVar26 | 3;
        while ((int)uVar25 < (int)uVar20) {
          auVar195 = vminps_avx(auVar221,*(undefined1 (*) [16])*pauVar22);
          auVar141 = vmaxps_avx(auVar195,auVar244);
          auVar131._0_4_ = auVar141._0_4_ * 1.442695 + 0.5;
          auVar131._4_4_ = auVar141._4_4_ * 1.442695 + 0.5;
          auVar131._8_4_ = auVar141._8_4_ * 1.442695 + 0.5;
          auVar131._12_4_ = auVar141._12_4_ * 1.442695 + 0.5;
          auVar179._0_4_ = (int)auVar131._0_4_;
          auVar179._4_4_ = (int)auVar131._4_4_;
          auVar179._8_4_ = (int)auVar131._8_4_;
          auVar179._12_4_ = (int)auVar131._12_4_;
          auVar180 = vcvtdq2ps_avx(auVar179);
          auVar195 = vcmpps_avx(auVar131,auVar180,1);
          auVar195 = vandps_avx(auVar389,auVar195);
          auVar195 = vsubps_avx(auVar180,auVar195);
          fVar113 = auVar141._0_4_ + auVar195._0_4_ * -0.6931472;
          fVar165 = auVar141._4_4_ + auVar195._4_4_ * -0.6931472;
          fVar166 = auVar141._8_4_ + auVar195._8_4_ * -0.6931472;
          fVar167 = auVar141._12_4_ + auVar195._12_4_ * -0.6931472;
          auVar132._0_4_ = (int)auVar195._0_4_;
          auVar132._4_4_ = (int)auVar195._4_4_;
          auVar132._8_4_ = (int)auVar195._8_4_;
          auVar132._12_4_ = (int)auVar195._12_4_;
          auVar195 = vpslld_avx(auVar132,0x17);
          auVar195 = vpaddd_avx(auVar389,auVar195);
          in_ZMM1 = ZEXT1664(auVar195);
          *(float *)*pauVar22 =
               (fVar113 + 1.0 +
               fVar113 * fVar113 *
               (((((fVar113 * 0.00019875691 + 0.0013981999) * fVar113 + 0.008333452) * fVar113 +
                 0.041665796) * fVar113 + 0.16666666) * fVar113 + 0.5)) * auVar195._0_4_;
          *(float *)(*pauVar22 + 4) =
               (fVar165 + 1.0 +
               fVar165 * fVar165 *
               (((((fVar165 * 0.00019875691 + 0.0013981999) * fVar165 + 0.008333452) * fVar165 +
                 0.041665796) * fVar165 + 0.16666666) * fVar165 + 0.5)) * auVar195._4_4_;
          *(float *)(*pauVar22 + 8) =
               (fVar166 + 1.0 +
               fVar166 * fVar166 *
               (((((fVar166 * 0.00019875691 + 0.0013981999) * fVar166 + 0.008333452) * fVar166 +
                 0.041665796) * fVar166 + 0.16666666) * fVar166 + 0.5)) * auVar195._8_4_;
          *(float *)(*pauVar22 + 0xc) =
               (fVar167 + 1.0 +
               fVar167 * fVar167 *
               (((((fVar167 * 0.00019875691 + 0.0013981999) * fVar167 + 0.008333452) * fVar167 +
                 0.041665796) * fVar167 + 0.16666666) * fVar167 + 0.5)) * auVar195._12_4_;
          pauVar22 = (undefined1 (*) [32])(*pauVar22 + 0x10);
          uVar25 = uVar26 + 7;
          uVar26 = uVar26 + 4;
        }
        auVar195 = vpcmpeqd_avx(auVar221,auVar221);
        if ((int)uVar26 < (int)uVar20) {
          uVar19 = CONCAT44(0,~uVar26 + uVar20);
          auVar36._8_8_ = 0;
          auVar36._0_8_ = uVar19;
          auVar251 = vpshufd_avx(auVar36,0x44);
          auVar180 = vpor_avx(auVar15,auVar251);
          auVar141 = vpor_avx(auVar15,auVar251);
          uVar27 = 0;
          auVar260 = _DAT_005e2da0;
          do {
            auVar3._8_8_ = 0x8000000000000000;
            auVar3._0_8_ = 0x8000000000000000;
            auVar37._8_8_ = 0;
            auVar37._0_8_ = uVar27;
            auVar262 = vpshufd_avx(auVar37,0x44);
            auVar61._16_16_ = auVar262;
            auVar61._0_16_ = auVar262;
            auVar286 = vorps_avx(auVar61,_DAT_005e2d80);
            auVar260 = vorps_avx(auVar61,auVar260);
            auVar111 = vpor_avx(auVar3,auVar251);
            auVar262 = vpcmpgtq_avx(auVar3 ^ auVar260._16_16_,auVar111);
            auVar112 = vpcmpgtq_avx(auVar3 ^ auVar260._0_16_,auVar180);
            auVar262 = vpackssdw_avx(auVar112,auVar262);
            auVar112 = vpcmpgtq_avx(auVar3 ^ auVar286._16_16_,auVar111);
            auVar133._0_8_ = auVar286._0_8_ ^ 0x8000000000000000;
            auVar133._8_4_ = auVar286._8_4_;
            auVar133._12_4_ = auVar286._12_4_ ^ 0x80000000;
            auVar111 = vpcmpgtq_avx(auVar133,auVar141);
            auVar112 = vpackssdw_avx(auVar111,auVar112);
            auVar262 = vpackssdw_avx(auVar112 ^ auVar195,auVar262 ^ auVar195);
            auVar112 = vpmovsxwd_avx(auVar262);
            auVar262 = vpunpckhwd_avx(auVar262,auVar262);
            auVar62._16_16_ = auVar262;
            auVar62._0_16_ = auVar112;
            auVar260 = vmaskmovps_avx(auVar62,*(undefined1 (*) [32])(*pauVar22 + uVar27 * 4));
            auVar111 = auVar260._16_16_;
            local_118._0_4_ = expf(auVar260._16_4_);
            local_118._4_4_ = extraout_XMM0_Db_03;
            local_118._8_4_ = extraout_XMM0_Dc_03;
            local_118._12_4_ = extraout_XMM0_Dd_03;
            auVar262 = vmovshdup_avx(auVar111);
            auVar88._0_4_ = expf(auVar262._0_4_);
            auVar88._4_60_ = extraout_var_11;
            auVar262 = vinsertps_avx(local_118,auVar88._0_16_,0x10);
            auVar112 = vpermilpd_avx(auVar111,1);
            auVar89._0_4_ = expf(auVar112._0_4_);
            auVar89._4_60_ = extraout_var_12;
            auVar262 = vinsertps_avx(auVar262,auVar89._0_16_,0x20);
            auVar112 = vpermilps_avx(auVar111,0xff);
            auVar90._0_4_ = expf(auVar112._0_4_);
            auVar90._4_60_ = extraout_var_13;
            auVar262 = vinsertps_avx(auVar262,auVar90._0_16_,0x30);
            local_e8._0_4_ = auVar260._0_4_;
            local_118._0_4_ = expf((float)local_e8._0_4_);
            local_118._4_4_ = extraout_XMM0_Db_04;
            local_118._8_4_ = extraout_XMM0_Dc_04;
            local_118._12_4_ = extraout_XMM0_Dd_04;
            local_e8 = auVar260._0_16_;
            auVar112 = vmovshdup_avx(local_e8);
            auVar91._0_4_ = expf(auVar112._0_4_);
            auVar91._4_60_ = extraout_var_14;
            auVar112 = vinsertps_avx(local_118,auVar91._0_16_,0x10);
            auVar111 = vpermilpd_avx(local_e8,1);
            auVar92._0_4_ = expf(auVar111._0_4_);
            auVar92._4_60_ = extraout_var_15;
            auVar112 = vinsertps_avx(auVar112,auVar92._0_16_,0x20);
            auVar111 = vpermilps_avx(local_e8,0xff);
            auVar93._0_4_ = expf(auVar111._0_4_);
            auVar260 = _DAT_005e2da0;
            auVar93._4_60_ = extraout_var_16;
            auVar195 = vpcmpeqd_avx(auVar195,auVar195);
            auVar112 = vinsertps_avx(auVar112,auVar93._0_16_,0x30);
            auVar63._16_16_ = auVar262;
            auVar63._0_16_ = auVar112;
            in_ZMM1 = ZEXT3264(auVar62);
            auVar286 = vmaskmovps_avx(auVar62,auVar63);
            *(undefined1 (*) [32])(*pauVar22 + uVar27 * 4) = auVar286;
            uVar27 = uVar27 + 8;
          } while ((uVar19 + 8 & 0x1fffffff8) != uVar27);
        }
        lVar21 = lVar21 + 1;
      } while (lVar21 != iVar7);
    }
    break;
  case 8:
    iVar7 = bottom_top_blob->c;
    if (0 < (long)iVar7) {
      uVar20 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      lVar21 = 0;
      do {
        auVar247 = in_ZMM5._0_16_;
        auVar368._8_4_ = 0x3f3504f3;
        auVar368._0_8_ = 0x3f3504f33f3504f3;
        auVar353._8_4_ = 0x3f000000;
        auVar353._0_8_ = 0x3f0000003f000000;
        auVar316._8_4_ = 0x807fffff;
        auVar316._0_8_ = 0x807fffff807fffff;
        auVar292._8_4_ = 0x800000;
        auVar292._0_8_ = 0x80000000800000;
        auVar368._12_4_ = 0x3f3504f3;
        auVar353._12_4_ = 0x3f000000;
        auVar316._12_4_ = 0x807fffff;
        auVar292._12_4_ = 0x800000;
        auVar368._16_4_ = 0x3f3504f3;
        auVar353._16_4_ = 0x3f000000;
        auVar316._16_4_ = 0x807fffff;
        auVar292._16_4_ = 0x800000;
        auVar368._20_4_ = 0x3f3504f3;
        auVar353._20_4_ = 0x3f000000;
        auVar316._20_4_ = 0x807fffff;
        auVar292._20_4_ = 0x800000;
        auVar256._8_4_ = 0xffffff81;
        auVar256._0_8_ = 0xffffff81ffffff81;
        auVar368._24_4_ = 0x3f3504f3;
        auVar353._24_4_ = 0x3f000000;
        auVar316._24_4_ = 0x807fffff;
        auVar292._24_4_ = 0x800000;
        auVar368._28_4_ = 0x3f3504f3;
        auVar353._28_4_ = 0x3f000000;
        auVar316._28_4_ = 0x807fffff;
        auVar292._28_4_ = 0x800000;
        auVar256._12_4_ = 0xffffff81;
        pauVar22 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * lVar21 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar20 < 8) {
          uVar26 = 0;
        }
        else {
          iVar24 = 7;
          do {
            auVar351 = vmaxps_avx(*pauVar22,auVar292);
            auVar195 = vpsrld_avx(auVar351._16_16_,0x17);
            auVar260 = vandps_avx(auVar316,auVar351);
            auVar293 = vorps_avx(auVar353,auVar260);
            auVar286 = vcmpps_avx(auVar368,auVar293,2);
            auVar260 = vandnps_avx(auVar286,auVar293);
            fVar113 = auVar293._0_4_ + -1.0 + auVar260._0_4_;
            fVar165 = auVar293._4_4_ + -1.0 + auVar260._4_4_;
            fVar166 = auVar293._8_4_ + -1.0 + auVar260._8_4_;
            fVar167 = auVar293._12_4_ + -1.0 + auVar260._12_4_;
            fVar168 = auVar293._16_4_ + -1.0 + auVar260._16_4_;
            fVar169 = auVar293._20_4_ + -1.0 + auVar260._20_4_;
            fVar170 = auVar293._24_4_ + -1.0 + auVar260._24_4_;
            auVar195 = vpsubd_avx(auVar195,auVar286._16_16_);
            auVar180 = vpsrld_avx(auVar351._0_16_,0x17);
            auVar195 = vpaddd_avx(auVar195,auVar256);
            auVar180 = vpsubd_avx(auVar180,auVar286._0_16_);
            auVar180 = vpaddd_avx(auVar180,auVar256);
            auVar187._16_16_ = auVar195;
            auVar187._0_16_ = auVar180;
            auVar247._8_4_ = 0xbf000000;
            auVar247._0_8_ = 0xbf000000bf000000;
            auVar247._12_4_ = 0xbf000000;
            auVar286 = vcvtdq2ps_avx(auVar187);
            auVar164._0_4_ =
                 auVar286._0_4_ * 0.6931472 + fVar113 +
                 fVar113 * fVar113 *
                 (((((((((fVar113 * 0.070376836 + -0.1151461) * fVar113 + 0.116769984) * fVar113 +
                       -0.12420141) * fVar113 + 0.14249323) * fVar113 + -0.16668057) * fVar113 +
                    0.20000714) * fVar113 + -0.24999994) * fVar113 + 0.3333333) * fVar113 + -0.5);
            auVar164._4_4_ =
                 auVar286._4_4_ * 0.6931472 + fVar165 +
                 fVar165 * fVar165 *
                 (((((((((fVar165 * 0.070376836 + -0.1151461) * fVar165 + 0.116769984) * fVar165 +
                       -0.12420141) * fVar165 + 0.14249323) * fVar165 + -0.16668057) * fVar165 +
                    0.20000714) * fVar165 + -0.24999994) * fVar165 + 0.3333333) * fVar165 + -0.5);
            auVar164._8_4_ =
                 auVar286._8_4_ * 0.6931472 + fVar166 +
                 fVar166 * fVar166 *
                 (((((((((fVar166 * 0.070376836 + -0.1151461) * fVar166 + 0.116769984) * fVar166 +
                       -0.12420141) * fVar166 + 0.14249323) * fVar166 + -0.16668057) * fVar166 +
                    0.20000714) * fVar166 + -0.24999994) * fVar166 + 0.3333333) * fVar166 + -0.5);
            auVar164._12_4_ =
                 auVar286._12_4_ * 0.6931472 + fVar167 +
                 fVar167 * fVar167 *
                 (((((((((fVar167 * 0.070376836 + -0.1151461) * fVar167 + 0.116769984) * fVar167 +
                       -0.12420141) * fVar167 + 0.14249323) * fVar167 + -0.16668057) * fVar167 +
                    0.20000714) * fVar167 + -0.24999994) * fVar167 + 0.3333333) * fVar167 + -0.5);
            auVar164._16_4_ =
                 auVar286._16_4_ * 0.6931472 + fVar168 +
                 fVar168 * fVar168 *
                 (((((((((fVar168 * 0.070376836 + -0.1151461) * fVar168 + 0.116769984) * fVar168 +
                       -0.12420141) * fVar168 + 0.14249323) * fVar168 + -0.16668057) * fVar168 +
                    0.20000714) * fVar168 + -0.24999994) * fVar168 + 0.3333333) * fVar168 + -0.5);
            auVar164._20_4_ =
                 auVar286._20_4_ * 0.6931472 + fVar169 +
                 fVar169 * fVar169 *
                 (((((((((fVar169 * 0.070376836 + -0.1151461) * fVar169 + 0.116769984) * fVar169 +
                       -0.12420141) * fVar169 + 0.14249323) * fVar169 + -0.16668057) * fVar169 +
                    0.20000714) * fVar169 + -0.24999994) * fVar169 + 0.3333333) * fVar169 + -0.5);
            auVar164._24_4_ =
                 auVar286._24_4_ * 0.6931472 + fVar170 +
                 fVar170 * fVar170 *
                 (((((((((fVar170 * 0.070376836 + -0.1151461) * fVar170 + 0.116769984) * fVar170 +
                       -0.12420141) * fVar170 + 0.14249323) * fVar170 + -0.16668057) * fVar170 +
                    0.20000714) * fVar170 + -0.24999994) * fVar170 + 0.3333333) * fVar170 + -0.5);
            auVar164._28_4_ = auVar286._28_4_ + auVar293._28_4_ + -1.0 + auVar260._28_4_ + 0.0;
            auVar260 = vcmpps_avx(*pauVar22,ZEXT432(0) << 0x20,2);
            auVar260 = vorps_avx(auVar260,auVar164);
            *pauVar22 = auVar260;
            pauVar22 = pauVar22 + 1;
            iVar24 = iVar24 + 8;
            uVar26 = uVar20 & 0xfffffff8;
          } while (iVar24 < (int)uVar20);
        }
        auVar275._8_4_ = 0x807fffff;
        auVar275._0_8_ = 0x807fffff807fffff;
        auVar275._12_4_ = 0x807fffff;
        auVar308._8_4_ = 0x3f000000;
        auVar308._0_8_ = 0x3f0000003f000000;
        auVar308._12_4_ = 0x3f000000;
        auVar339._8_4_ = 0xffffff82;
        auVar339._0_8_ = 0xffffff82ffffff82;
        auVar339._12_4_ = 0xffffff82;
        auVar363._8_4_ = 0x3f3504f3;
        auVar363._0_8_ = 0x3f3504f33f3504f3;
        auVar363._12_4_ = 0x3f3504f3;
        auVar383._8_4_ = 0x3f800000;
        auVar383._0_8_ = 0x3f8000003f800000;
        auVar383._12_4_ = 0x3f800000;
        uVar25 = uVar26 | 3;
        while ((int)uVar25 < (int)uVar20) {
          auVar143._8_4_ = 0x800000;
          auVar143._0_8_ = 0x80000000800000;
          auVar143._12_4_ = 0x800000;
          auVar195 = vmaxps_avx(*(undefined1 (*) [16])*pauVar22,auVar143);
          auVar180 = vpsrld_avx(auVar195,0x17);
          auVar180 = vpaddd_avx(auVar339,auVar180);
          auVar195 = vandps_avx(auVar195,auVar275);
          auVar251 = vorps_avx(auVar308,auVar195);
          auVar141 = vcvtdq2ps_avx(auVar180);
          auVar180 = vcmpps_avx(auVar251,auVar363,1);
          auVar195 = vandps_avx(auVar180,auVar251);
          fVar113 = auVar251._0_4_ + -1.0 + auVar195._0_4_;
          fVar165 = auVar251._4_4_ + -1.0 + auVar195._4_4_;
          fVar166 = auVar251._8_4_ + -1.0 + auVar195._8_4_;
          fVar167 = auVar251._12_4_ + -1.0 + auVar195._12_4_;
          auVar195 = vandps_avx(auVar383,auVar180);
          auVar195 = vsubps_avx(auVar141,auVar195);
          auVar247._8_4_ = 0xbf000000;
          auVar247._0_8_ = 0xbf000000bf000000;
          auVar247._12_4_ = 0xbf000000;
          auVar144._0_4_ =
               auVar195._0_4_ * 0.6931472 + fVar113 +
               fVar113 * fVar113 *
               (((((((((fVar113 * 0.070376836 + -0.1151461) * fVar113 + 0.116769984) * fVar113 +
                     -0.12420141) * fVar113 + 0.14249323) * fVar113 + -0.16668057) * fVar113 +
                  0.20000714) * fVar113 + -0.24999994) * fVar113 + 0.3333333) * fVar113 + -0.5);
          auVar144._4_4_ =
               auVar195._4_4_ * 0.6931472 + fVar165 +
               fVar165 * fVar165 *
               (((((((((fVar165 * 0.070376836 + -0.1151461) * fVar165 + 0.116769984) * fVar165 +
                     -0.12420141) * fVar165 + 0.14249323) * fVar165 + -0.16668057) * fVar165 +
                  0.20000714) * fVar165 + -0.24999994) * fVar165 + 0.3333333) * fVar165 + -0.5);
          auVar144._8_4_ =
               auVar195._8_4_ * 0.6931472 + fVar166 +
               fVar166 * fVar166 *
               (((((((((fVar166 * 0.070376836 + -0.1151461) * fVar166 + 0.116769984) * fVar166 +
                     -0.12420141) * fVar166 + 0.14249323) * fVar166 + -0.16668057) * fVar166 +
                  0.20000714) * fVar166 + -0.24999994) * fVar166 + 0.3333333) * fVar166 + -0.5);
          auVar144._12_4_ =
               auVar195._12_4_ * 0.6931472 + fVar167 +
               fVar167 * fVar167 *
               (((((((((fVar167 * 0.070376836 + -0.1151461) * fVar167 + 0.116769984) * fVar167 +
                     -0.12420141) * fVar167 + 0.14249323) * fVar167 + -0.16668057) * fVar167 +
                  0.20000714) * fVar167 + -0.24999994) * fVar167 + 0.3333333) * fVar167 + -0.5);
          auVar195 = vcmpps_avx(*(undefined1 (*) [16])*pauVar22,_DAT_005e2030,2);
          auVar195 = vorps_avx(auVar195,auVar144);
          *(undefined1 (*) [16])*pauVar22 = auVar195;
          pauVar22 = (undefined1 (*) [32])(*pauVar22 + 0x10);
          uVar25 = uVar26 + 7;
          uVar26 = uVar26 + 4;
        }
        auVar18._8_8_ = 0x8000000000000000;
        auVar18._0_8_ = 0x8000000000000000;
        auVar195 = vpcmpeqd_avx(auVar247,auVar247);
        in_ZMM5 = ZEXT1664(auVar195);
        if ((int)uVar26 < (int)uVar20) {
          uVar19 = CONCAT44(0,~uVar26 + uVar20);
          auVar45._8_8_ = 0;
          auVar45._0_8_ = uVar19;
          auVar141 = vpshufd_avx(auVar45,0x44);
          auVar195 = vpor_avx(auVar141,auVar18);
          auVar180 = vpor_avx(auVar141,auVar18);
          uVar27 = 0;
          auVar260 = _DAT_005e2da0;
          do {
            auVar6._8_8_ = 0x8000000000000000;
            auVar6._0_8_ = 0x8000000000000000;
            auVar46._8_8_ = 0;
            auVar46._0_8_ = uVar27;
            auVar251 = vpshufd_avx(auVar46,0x44);
            auVar73._16_16_ = auVar251;
            auVar73._0_16_ = auVar251;
            auVar286 = vorps_avx(auVar73,_DAT_005e2d80);
            auVar260 = vorps_avx(auVar73,auVar260);
            auVar112 = vpor_avx(auVar141,auVar6);
            auVar251 = vpcmpgtq_avx(auVar260._16_16_ ^ auVar6,auVar112);
            auVar262 = vpcmpgtq_avx(auVar260._0_16_ ^ auVar6,auVar195);
            auVar251 = vpackssdw_avx(auVar262,auVar251);
            auVar111 = in_ZMM5._0_16_;
            auVar262 = vpcmpgtq_avx(auVar286._16_16_ ^ auVar6,auVar112);
            auVar145._0_8_ = auVar286._0_8_ ^ 0x8000000000000000;
            auVar145._8_4_ = auVar286._8_4_;
            auVar145._12_4_ = auVar286._12_4_ ^ 0x80000000;
            auVar112 = vpcmpgtq_avx(auVar145,auVar180);
            auVar262 = vpackssdw_avx(auVar112,auVar262);
            auVar251 = vpackssdw_avx(auVar262 ^ auVar111,auVar251 ^ auVar111);
            auVar262 = vpmovsxwd_avx(auVar251);
            auVar251 = vpunpckhwd_avx(auVar251,auVar251);
            auVar74._16_16_ = auVar251;
            auVar74._0_16_ = auVar262;
            auVar260 = vmaskmovps_avx(auVar74,*(undefined1 (*) [32])(*pauVar22 + uVar27 * 4));
            auVar112 = auVar260._16_16_;
            local_118._0_4_ = logf(auVar260._16_4_);
            local_118._4_4_ = extraout_XMM0_Db_09;
            local_118._8_4_ = extraout_XMM0_Dc_09;
            local_118._12_4_ = extraout_XMM0_Dd_09;
            auVar251 = vmovshdup_avx(auVar112);
            auVar105._0_4_ = logf(auVar251._0_4_);
            auVar105._4_60_ = extraout_var_29;
            auVar251 = vinsertps_avx(local_118,auVar105._0_16_,0x10);
            auVar262 = vpermilpd_avx(auVar112,1);
            auVar106._0_4_ = logf(auVar262._0_4_);
            auVar106._4_60_ = extraout_var_30;
            auVar251 = vinsertps_avx(auVar251,auVar106._0_16_,0x20);
            auVar262 = vpermilps_avx(auVar112,0xff);
            auVar107._0_4_ = logf(auVar262._0_4_);
            auVar107._4_60_ = extraout_var_31;
            auVar251 = vinsertps_avx(auVar251,auVar107._0_16_,0x30);
            local_e8._0_4_ = auVar260._0_4_;
            local_118._0_4_ = logf((float)local_e8._0_4_);
            local_118._4_4_ = extraout_XMM0_Db_10;
            local_118._8_4_ = extraout_XMM0_Dc_10;
            local_118._12_4_ = extraout_XMM0_Dd_10;
            local_e8 = auVar260._0_16_;
            auVar262 = vmovshdup_avx(local_e8);
            auVar108._0_4_ = logf(auVar262._0_4_);
            auVar108._4_60_ = extraout_var_32;
            auVar262 = vinsertps_avx(local_118,auVar108._0_16_,0x10);
            auVar112 = vpermilpd_avx(local_e8,1);
            auVar109._0_4_ = logf(auVar112._0_4_);
            auVar109._4_60_ = extraout_var_33;
            auVar262 = vinsertps_avx(auVar262,auVar109._0_16_,0x20);
            auVar112 = vpermilps_avx(local_e8,0xff);
            auVar110._0_4_ = logf(auVar112._0_4_);
            auVar260 = _DAT_005e2da0;
            auVar110._4_60_ = extraout_var_34;
            auVar112 = vpcmpeqd_avx(auVar111,auVar111);
            in_ZMM5 = ZEXT1664(auVar112);
            auVar262 = vinsertps_avx(auVar262,auVar110._0_16_,0x30);
            auVar75._16_16_ = auVar251;
            auVar75._0_16_ = auVar262;
            auVar286 = vmaskmovps_avx(auVar74,auVar75);
            *(undefined1 (*) [32])(*pauVar22 + uVar27 * 4) = auVar286;
            uVar27 = uVar27 + 8;
          } while ((uVar19 + 8 & 0x1fffffff8) != uVar27);
        }
        lVar21 = lVar21 + 1;
      } while (lVar21 != iVar7);
    }
    break;
  case 9:
    iVar7 = bottom_top_blob->c;
    if (0 < (long)iVar7) {
      uVar20 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      lVar21 = 0;
      auVar195 = vpcmpeqd_avx(in_ZMM10._0_16_,in_ZMM10._0_16_);
      auVar379 = ZEXT1664(auVar195);
      auVar372._8_8_ = 0xfffffffefffffffe;
      auVar372._0_8_ = 0xfffffffefffffffe;
      auVar381._8_8_ = 0x8000000080000000;
      auVar381._0_8_ = 0x8000000080000000;
      do {
        auVar281._8_4_ = 0x7fffffff;
        auVar281._0_8_ = 0x7fffffff7fffffff;
        auVar203._8_4_ = 0x80000000;
        auVar203._0_8_ = 0x8000000080000000;
        auVar281._12_4_ = 0x7fffffff;
        auVar203._12_4_ = 0x80000000;
        auVar281._16_4_ = 0x7fffffff;
        auVar203._16_4_ = 0x80000000;
        auVar281._20_4_ = 0x7fffffff;
        auVar203._20_4_ = 0x80000000;
        auVar386._8_4_ = 2;
        auVar386._0_8_ = 0x200000002;
        auVar281._24_4_ = 0x7fffffff;
        auVar203._24_4_ = 0x80000000;
        auVar386._12_4_ = 2;
        auVar281._28_4_ = 0x7fffffff;
        auVar203._28_4_ = 0x80000000;
        pauVar22 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * lVar21 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        auVar195 = auVar379._0_16_;
        if ((int)uVar20 < 8) {
          uVar26 = 0;
        }
        else {
          iVar24 = 7;
          do {
            auVar260 = *pauVar22;
            auVar286 = vandps_avx(auVar260,auVar281);
            auVar351 = vandps_avx(auVar260,auVar203);
            auVar125._0_4_ = (int)(auVar286._0_4_ * 1.2732395);
            auVar125._4_4_ = (int)(auVar286._4_4_ * 1.2732395);
            auVar125._8_4_ = (int)(auVar286._8_4_ * 1.2732395);
            auVar125._12_4_ = (int)(auVar286._12_4_ * 1.2732395);
            auVar156._16_4_ = (int)(auVar286._16_4_ * 1.2732395);
            auVar156._0_16_ = auVar125;
            auVar156._20_4_ = (int)(auVar286._20_4_ * 1.2732395);
            auVar156._24_4_ = (int)(auVar286._24_4_ * 1.2732395);
            auVar156._28_4_ = (int)auVar260._28_4_;
            auVar251 = vpsubd_avx(auVar125,auVar195);
            auVar262 = vpsubd_avx(auVar156._16_16_,auVar195);
            auVar180 = vpand_avx(auVar372,auVar251);
            auVar141 = vpand_avx(auVar372,auVar262);
            auVar226._16_16_ = auVar141;
            auVar226._0_16_ = auVar180;
            auVar260 = vcvtdq2ps_avx(auVar226);
            auVar180 = vpslld_avx(auVar251,0x1d);
            auVar180 = vpand_avx(auVar381,auVar180);
            auVar141 = vpslld_avx(auVar262,0x1d);
            auVar141 = vpand_avx(auVar381,auVar141);
            fVar113 = auVar286._0_4_ + auVar260._0_4_ * -0.7853982;
            fVar165 = auVar286._4_4_ + auVar260._4_4_ * -0.7853982;
            fVar166 = auVar286._8_4_ + auVar260._8_4_ * -0.7853982;
            fVar167 = auVar286._12_4_ + auVar260._12_4_ * -0.7853982;
            fVar168 = auVar286._16_4_ + auVar260._16_4_ * -0.7853982;
            fVar169 = auVar286._20_4_ + auVar260._20_4_ * -0.7853982;
            fVar170 = auVar286._24_4_ + auVar260._24_4_ * -0.7853982;
            fVar190 = fVar113 * fVar113;
            fVar205 = fVar165 * fVar165;
            fVar206 = fVar166 * fVar166;
            fVar207 = fVar167 * fVar167;
            fVar208 = fVar168 * fVar168;
            fVar209 = fVar169 * fVar169;
            fVar210 = fVar170 * fVar170;
            auVar184._0_4_ =
                 fVar190 * fVar113 *
                 ((fVar190 * -0.00019515296 + 0.008332161) * fVar190 + -0.16666655) + fVar113;
            auVar184._4_4_ =
                 fVar205 * fVar165 *
                 ((fVar205 * -0.00019515296 + 0.008332161) * fVar205 + -0.16666655) + fVar165;
            auVar184._8_4_ =
                 fVar206 * fVar166 *
                 ((fVar206 * -0.00019515296 + 0.008332161) * fVar206 + -0.16666655) + fVar166;
            auVar184._12_4_ =
                 fVar207 * fVar167 *
                 ((fVar207 * -0.00019515296 + 0.008332161) * fVar207 + -0.16666655) + fVar167;
            auVar184._16_4_ =
                 fVar208 * fVar168 *
                 ((fVar208 * -0.00019515296 + 0.008332161) * fVar208 + -0.16666655) + fVar168;
            auVar184._20_4_ =
                 fVar209 * fVar169 *
                 ((fVar209 * -0.00019515296 + 0.008332161) * fVar209 + -0.16666655) + fVar169;
            auVar184._24_4_ =
                 fVar210 * fVar170 *
                 ((fVar210 * -0.00019515296 + 0.008332161) * fVar210 + -0.16666655) + fVar170;
            auVar184._28_4_ = auVar260._28_4_ + auVar286._28_4_ + auVar260._28_4_;
            auVar251 = vpand_avx(auVar386,auVar251);
            auVar262 = vpand_avx(auVar386,auVar262);
            auVar55._16_16_ = auVar262;
            auVar55._0_16_ = auVar251;
            auVar157._0_4_ =
                 (((fVar190 * 2.4433157e-05 + -0.0013887316) * fVar190 + 0.041666646) * fVar190 +
                 -0.5) * fVar190 + 1.0;
            auVar157._4_4_ =
                 (((fVar205 * 2.4433157e-05 + -0.0013887316) * fVar205 + 0.041666646) * fVar205 +
                 -0.5) * fVar205 + 1.0;
            auVar157._8_4_ =
                 (((fVar206 * 2.4433157e-05 + -0.0013887316) * fVar206 + 0.041666646) * fVar206 +
                 -0.5) * fVar206 + 1.0;
            auVar157._12_4_ =
                 (((fVar207 * 2.4433157e-05 + -0.0013887316) * fVar207 + 0.041666646) * fVar207 +
                 -0.5) * fVar207 + 1.0;
            auVar157._16_4_ =
                 (((fVar208 * 2.4433157e-05 + -0.0013887316) * fVar208 + 0.041666646) * fVar208 +
                 -0.5) * fVar208 + 1.0;
            auVar157._20_4_ =
                 (((fVar209 * 2.4433157e-05 + -0.0013887316) * fVar209 + 0.041666646) * fVar209 +
                 -0.5) * fVar209 + 1.0;
            auVar157._24_4_ =
                 (((fVar210 * 2.4433157e-05 + -0.0013887316) * fVar210 + 0.041666646) * fVar210 +
                 -0.5) * fVar210 + 1.0;
            auVar157._28_4_ = 0x3f0a5141;
            auVar260 = vcvtdq2ps_avx(auVar55);
            auVar286 = vcmpps_avx(auVar260,ZEXT432(0) << 0x20,0);
            auVar260 = vandps_avx(auVar286,auVar184);
            auVar286 = vandnps_avx(auVar286,auVar157);
            auVar56._0_4_ =
                 auVar351._0_4_ ^ auVar180._0_4_ ^ (uint)(auVar286._0_4_ + auVar260._0_4_);
            auVar56._4_4_ =
                 auVar351._4_4_ ^ auVar180._4_4_ ^ (uint)(auVar286._4_4_ + auVar260._4_4_);
            auVar56._8_4_ =
                 auVar351._8_4_ ^ auVar180._8_4_ ^ (uint)(auVar286._8_4_ + auVar260._8_4_);
            auVar56._12_4_ =
                 auVar351._12_4_ ^ auVar180._12_4_ ^ (uint)(auVar286._12_4_ + auVar260._12_4_);
            auVar56._16_4_ =
                 auVar351._16_4_ ^ auVar141._0_4_ ^ (uint)(auVar286._16_4_ + auVar260._16_4_);
            auVar56._20_4_ =
                 auVar351._20_4_ ^ auVar141._4_4_ ^ (uint)(auVar286._20_4_ + auVar260._20_4_);
            auVar56._24_4_ =
                 auVar351._24_4_ ^ auVar141._8_4_ ^ (uint)(auVar286._24_4_ + auVar260._24_4_);
            auVar56._28_4_ =
                 auVar351._28_4_ ^ auVar141._12_4_ ^ (uint)(auVar286._28_4_ + auVar260._28_4_);
            *pauVar22 = auVar56;
            pauVar22 = pauVar22 + 1;
            iVar24 = iVar24 + 8;
            uVar26 = uVar20 & 0xfffffff8;
          } while (iVar24 < (int)uVar20);
        }
        auVar298._8_4_ = 0xfffffffe;
        auVar298._0_8_ = 0xfffffffefffffffe;
        auVar298._12_4_ = 0xfffffffe;
        uVar25 = uVar26 | 3;
        while ((int)uVar25 < (int)uVar20) {
          auVar126._8_4_ = 0x7fffffff;
          auVar126._0_8_ = 0x7fffffff7fffffff;
          auVar126._12_4_ = 0x7fffffff;
          auVar180 = vandps_avx(*(undefined1 (*) [16])*pauVar22,auVar126);
          auVar175._0_4_ = (int)(auVar180._0_4_ * 1.2732395);
          auVar175._4_4_ = (int)(auVar180._4_4_ * 1.2732395);
          auVar175._8_4_ = (int)(auVar180._8_4_ * 1.2732395);
          auVar175._12_4_ = (int)(auVar180._12_4_ * 1.2732395);
          auVar251 = vpsubd_avx(auVar175,auVar195);
          auVar141 = vpand_avx(auVar298,auVar251);
          auVar141 = vcvtdq2ps_avx(auVar141);
          fVar113 = auVar180._0_4_ + auVar141._0_4_ * -0.7853982;
          fVar165 = auVar180._4_4_ + auVar141._4_4_ * -0.7853982;
          fVar166 = auVar180._8_4_ + auVar141._8_4_ * -0.7853982;
          fVar167 = auVar180._12_4_ + auVar141._12_4_ * -0.7853982;
          fVar168 = fVar113 * fVar113;
          fVar169 = fVar165 * fVar165;
          fVar170 = fVar166 * fVar166;
          fVar190 = fVar167 * fVar167;
          auVar127._0_4_ =
               fVar168 * fVar113 *
               ((fVar168 * -0.00019515296 + 0.008332161) * fVar168 + -0.16666655) + fVar113;
          auVar127._4_4_ =
               fVar169 * fVar165 *
               ((fVar169 * -0.00019515296 + 0.008332161) * fVar169 + -0.16666655) + fVar165;
          auVar127._8_4_ =
               fVar170 * fVar166 *
               ((fVar170 * -0.00019515296 + 0.008332161) * fVar170 + -0.16666655) + fVar166;
          auVar127._12_4_ =
               fVar190 * fVar167 *
               ((fVar190 * -0.00019515296 + 0.008332161) * fVar190 + -0.16666655) + fVar167;
          auVar180 = vpand_avx(auVar386,auVar251);
          auVar180 = vpcmpeqd_avx(auVar180,_DAT_005e2030);
          auVar217._0_4_ =
               (((fVar168 * 2.4433157e-05 + -0.0013887316) * fVar168 + 0.041666646) * fVar168 + -0.5
               ) * fVar168 + 1.0;
          auVar217._4_4_ =
               (((fVar169 * 2.4433157e-05 + -0.0013887316) * fVar169 + 0.041666646) * fVar169 + -0.5
               ) * fVar169 + 1.0;
          auVar217._8_4_ =
               (((fVar170 * 2.4433157e-05 + -0.0013887316) * fVar170 + 0.041666646) * fVar170 + -0.5
               ) * fVar170 + 1.0;
          auVar217._12_4_ =
               (((fVar190 * 2.4433157e-05 + -0.0013887316) * fVar190 + 0.041666646) * fVar190 + -0.5
               ) * fVar190 + 1.0;
          auVar180 = vblendvps_avx(auVar217,auVar127,auVar180);
          auVar141 = vpslld_avx(auVar251,0x1d);
          auVar176._8_4_ = 0x80000000;
          auVar176._0_8_ = 0x8000000080000000;
          auVar176._12_4_ = 0x80000000;
          auVar141 = vpand_avx(auVar141 ^ *(undefined1 (*) [16])*pauVar22,auVar176);
          *(undefined1 (*) [16])*pauVar22 = auVar141 ^ auVar180;
          pauVar22 = (undefined1 (*) [32])(*pauVar22 + 0x10);
          uVar25 = uVar26 + 7;
          uVar26 = uVar26 + 4;
        }
        auVar14._8_8_ = 0x8000000000000000;
        auVar14._0_8_ = 0x8000000000000000;
        if ((int)uVar26 < (int)uVar20) {
          uVar19 = CONCAT44(0,~uVar26 + uVar20);
          auVar34._8_8_ = 0;
          auVar34._0_8_ = uVar19;
          auVar141 = vpshufd_avx(auVar34,0x44);
          auVar195 = vpor_avx(auVar141,auVar14);
          auVar180 = vpor_avx(auVar141,auVar14);
          uVar27 = 0;
          auVar260 = _DAT_005e2da0;
          do {
            auVar2._8_8_ = 0x8000000000000000;
            auVar2._0_8_ = 0x8000000000000000;
            auVar35._8_8_ = 0;
            auVar35._0_8_ = uVar27;
            auVar251 = vpshufd_avx(auVar35,0x44);
            auVar57._16_16_ = auVar251;
            auVar57._0_16_ = auVar251;
            auVar286 = vorps_avx(auVar57,_DAT_005e2d80);
            auVar260 = vorps_avx(auVar57,auVar260);
            auVar112 = vpor_avx(auVar141,auVar2);
            auVar251 = vpcmpgtq_avx(auVar260._16_16_ ^ auVar2,auVar112);
            auVar262 = vpcmpgtq_avx(auVar260._0_16_ ^ auVar2,auVar195);
            auVar251 = vpackssdw_avx(auVar262,auVar251);
            auVar111 = auVar379._0_16_;
            auVar262 = vpcmpgtq_avx(auVar286._16_16_ ^ auVar2,auVar112);
            auVar128._0_8_ = auVar286._0_8_ ^ 0x8000000000000000;
            auVar128._8_4_ = auVar286._8_4_;
            auVar128._12_4_ = auVar286._12_4_ ^ 0x80000000;
            auVar112 = vpcmpgtq_avx(auVar128,auVar180);
            auVar262 = vpackssdw_avx(auVar112,auVar262);
            auVar251 = vpackssdw_avx(auVar111 ^ auVar262,auVar111 ^ auVar251);
            auVar262 = vpmovsxwd_avx(auVar251);
            auVar251 = vpunpckhwd_avx(auVar251,auVar251);
            auVar58._16_16_ = auVar251;
            auVar58._0_16_ = auVar262;
            auVar260 = vmaskmovps_avx(auVar58,*(undefined1 (*) [32])(*pauVar22 + uVar27 * 4));
            auVar112 = auVar260._16_16_;
            local_118._0_4_ = sinf(auVar260._16_4_);
            local_118._4_4_ = extraout_XMM0_Db_01;
            local_118._8_4_ = extraout_XMM0_Dc_01;
            local_118._12_4_ = extraout_XMM0_Dd_01;
            auVar251 = vmovshdup_avx(auVar112);
            auVar82._0_4_ = sinf(auVar251._0_4_);
            auVar82._4_60_ = extraout_var_05;
            auVar251 = vinsertps_avx(local_118,auVar82._0_16_,0x10);
            auVar262 = vpermilpd_avx(auVar112,1);
            auVar83._0_4_ = sinf(auVar262._0_4_);
            auVar83._4_60_ = extraout_var_06;
            auVar251 = vinsertps_avx(auVar251,auVar83._0_16_,0x20);
            auVar262 = vpermilps_avx(auVar112,0xff);
            auVar84._0_4_ = sinf(auVar262._0_4_);
            auVar84._4_60_ = extraout_var_07;
            auVar251 = vinsertps_avx(auVar251,auVar84._0_16_,0x30);
            local_e8._0_4_ = auVar260._0_4_;
            local_118._0_4_ = sinf((float)local_e8._0_4_);
            local_118._4_4_ = extraout_XMM0_Db_02;
            local_118._8_4_ = extraout_XMM0_Dc_02;
            local_118._12_4_ = extraout_XMM0_Dd_02;
            local_e8 = auVar260._0_16_;
            auVar262 = vmovshdup_avx(local_e8);
            auVar85._0_4_ = sinf(auVar262._0_4_);
            auVar85._4_60_ = extraout_var_08;
            auVar262 = vinsertps_avx(local_118,auVar85._0_16_,0x10);
            auVar112 = vpermilpd_avx(local_e8,1);
            auVar86._0_4_ = sinf(auVar112._0_4_);
            auVar86._4_60_ = extraout_var_09;
            auVar262 = vinsertps_avx(auVar262,auVar86._0_16_,0x20);
            auVar112 = vpermilps_avx(local_e8,0xff);
            auVar87._0_4_ = sinf(auVar112._0_4_);
            auVar260 = _DAT_005e2da0;
            auVar87._4_60_ = extraout_var_10;
            auVar112 = vpcmpeqd_avx(auVar111,auVar111);
            auVar379 = ZEXT1664(auVar112);
            auVar262 = vinsertps_avx(auVar262,auVar87._0_16_,0x30);
            auVar59._16_16_ = auVar251;
            auVar59._0_16_ = auVar262;
            auVar286 = vmaskmovps_avx(auVar58,auVar59);
            *(undefined1 (*) [32])(*pauVar22 + uVar27 * 4) = auVar286;
            uVar27 = uVar27 + 8;
          } while ((uVar19 + 8 & 0x1fffffff8) != uVar27);
        }
        lVar21 = lVar21 + 1;
      } while (lVar21 != iVar7);
    }
    break;
  case 10:
    iVar7 = bottom_top_blob->c;
    if (0 < (long)iVar7) {
      uVar20 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      lVar21 = 0;
      auVar195 = vpcmpeqd_avx(in_ZMM9._0_16_,in_ZMM9._0_16_);
      auVar379 = ZEXT1664(auVar195);
      auVar197._8_8_ = 0xfffffffefffffffe;
      auVar197._0_8_ = 0xfffffffefffffffe;
      auVar307._8_8_ = 0x8000000080000000;
      auVar307._0_8_ = 0x8000000080000000;
      do {
        auVar367._8_4_ = 0x7fffffff;
        auVar367._0_8_ = 0x7fffffff7fffffff;
        auVar367._12_4_ = 0x7fffffff;
        auVar367._16_4_ = 0x7fffffff;
        auVar367._20_4_ = 0x7fffffff;
        auVar377._8_4_ = 0xfffffffe;
        auVar377._0_8_ = 0xfffffffefffffffe;
        auVar255._8_4_ = 2;
        auVar255._0_8_ = 0x200000002;
        auVar367._24_4_ = 0x7fffffff;
        auVar377._12_4_ = 0xfffffffe;
        auVar367._28_4_ = 0x7fffffff;
        auVar255._12_4_ = 2;
        pauVar22 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * lVar21 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        auVar195 = auVar379._0_16_;
        if ((int)uVar20 < 8) {
          uVar26 = 0;
        }
        else {
          iVar24 = 7;
          do {
            auVar260 = vandps_avx(auVar367,*pauVar22);
            auVar139._0_4_ = (int)(auVar260._0_4_ * 1.2732395);
            auVar139._4_4_ = (int)(auVar260._4_4_ * 1.2732395);
            auVar139._8_4_ = (int)(auVar260._8_4_ * 1.2732395);
            auVar139._12_4_ = (int)(auVar260._12_4_ * 1.2732395);
            auVar162._16_4_ = (int)(auVar260._16_4_ * 1.2732395);
            auVar162._0_16_ = auVar139;
            auVar162._20_4_ = (int)(auVar260._20_4_ * 1.2732395);
            auVar162._24_4_ = (int)(auVar260._24_4_ * 1.2732395);
            auVar162._28_4_ = 1;
            auVar180 = vpsubd_avx(auVar139,auVar195);
            auVar141 = vpsubd_avx(auVar162._16_16_,auVar195);
            auVar180 = vpand_avx(auVar180,auVar197);
            auVar141 = vpand_avx(auVar141,auVar197);
            auVar204._16_16_ = auVar141;
            auVar204._0_16_ = auVar180;
            auVar286 = vcvtdq2ps_avx(auVar204);
            auVar180 = vpaddd_avx(auVar377,auVar180);
            auVar141 = vpaddd_avx(auVar377,auVar141);
            auVar251 = vpslld_avx(auVar180,0x1d);
            auVar251 = vpandn_avx(auVar251,auVar307);
            auVar262 = vpslld_avx(auVar141,0x1d);
            auVar262 = vpandn_avx(auVar262,auVar307);
            fVar113 = auVar260._0_4_ + auVar286._0_4_ * -0.7853982;
            fVar165 = auVar260._4_4_ + auVar286._4_4_ * -0.7853982;
            fVar166 = auVar260._8_4_ + auVar286._8_4_ * -0.7853982;
            fVar167 = auVar260._12_4_ + auVar286._12_4_ * -0.7853982;
            fVar168 = auVar260._16_4_ + auVar286._16_4_ * -0.7853982;
            fVar169 = auVar260._20_4_ + auVar286._20_4_ * -0.7853982;
            fVar170 = auVar260._24_4_ + auVar286._24_4_ * -0.7853982;
            fVar190 = fVar113 * fVar113;
            fVar205 = fVar165 * fVar165;
            fVar206 = fVar166 * fVar166;
            fVar207 = fVar167 * fVar167;
            fVar208 = fVar168 * fVar168;
            fVar209 = fVar169 * fVar169;
            fVar210 = fVar170 * fVar170;
            auVar255._8_4_ = 2;
            auVar255._0_8_ = 0x200000002;
            auVar255._12_4_ = 2;
            auVar68._0_4_ =
                 fVar190 * fVar113 *
                 ((fVar190 * -0.00019515296 + 0.008332161) * fVar190 + -0.16666655) + fVar113;
            auVar68._4_4_ =
                 fVar205 * fVar165 *
                 ((fVar205 * -0.00019515296 + 0.008332161) * fVar205 + -0.16666655) + fVar165;
            auVar68._8_4_ =
                 fVar206 * fVar166 *
                 ((fVar206 * -0.00019515296 + 0.008332161) * fVar206 + -0.16666655) + fVar166;
            auVar68._12_4_ =
                 fVar207 * fVar167 *
                 ((fVar207 * -0.00019515296 + 0.008332161) * fVar207 + -0.16666655) + fVar167;
            auVar68._16_4_ =
                 fVar208 * fVar168 *
                 ((fVar208 * -0.00019515296 + 0.008332161) * fVar208 + -0.16666655) + fVar168;
            auVar68._20_4_ =
                 fVar209 * fVar169 *
                 ((fVar209 * -0.00019515296 + 0.008332161) * fVar209 + -0.16666655) + fVar169;
            auVar68._24_4_ =
                 fVar210 * fVar170 *
                 ((fVar210 * -0.00019515296 + 0.008332161) * fVar210 + -0.16666655) + fVar170;
            auVar68._28_4_ = auVar286._28_4_ + auVar260._28_4_ + auVar286._28_4_;
            auVar180 = vpand_avx(auVar180,auVar255);
            auVar141 = vpand_avx(auVar141,auVar255);
            auVar163._16_16_ = auVar141;
            auVar163._0_16_ = auVar180;
            auVar186._0_4_ =
                 (((fVar190 * 2.4433157e-05 + -0.0013887316) * fVar190 + 0.041666646) * fVar190 +
                 -0.5) * fVar190 + 1.0;
            auVar186._4_4_ =
                 (((fVar205 * 2.4433157e-05 + -0.0013887316) * fVar205 + 0.041666646) * fVar205 +
                 -0.5) * fVar205 + 1.0;
            auVar186._8_4_ =
                 (((fVar206 * 2.4433157e-05 + -0.0013887316) * fVar206 + 0.041666646) * fVar206 +
                 -0.5) * fVar206 + 1.0;
            auVar186._12_4_ =
                 (((fVar207 * 2.4433157e-05 + -0.0013887316) * fVar207 + 0.041666646) * fVar207 +
                 -0.5) * fVar207 + 1.0;
            auVar186._16_4_ =
                 (((fVar208 * 2.4433157e-05 + -0.0013887316) * fVar208 + 0.041666646) * fVar208 +
                 -0.5) * fVar208 + 1.0;
            auVar186._20_4_ =
                 (((fVar209 * 2.4433157e-05 + -0.0013887316) * fVar209 + 0.041666646) * fVar209 +
                 -0.5) * fVar209 + 1.0;
            auVar186._24_4_ =
                 (((fVar210 * 2.4433157e-05 + -0.0013887316) * fVar210 + 0.041666646) * fVar210 +
                 -0.5) * fVar210 + 1.0;
            auVar186._28_4_ = 0x3f0a4fa7;
            auVar260 = vcvtdq2ps_avx(auVar163);
            auVar286 = vcmpps_avx(auVar260,ZEXT432(0) << 0x20,0);
            auVar260 = vandps_avx(auVar286,auVar68);
            auVar286 = vandnps_avx(auVar286,auVar186);
            auVar69._0_4_ = auVar251._0_4_ ^ (uint)(auVar286._0_4_ + auVar260._0_4_);
            auVar69._4_4_ = auVar251._4_4_ ^ (uint)(auVar286._4_4_ + auVar260._4_4_);
            auVar69._8_4_ = auVar251._8_4_ ^ (uint)(auVar286._8_4_ + auVar260._8_4_);
            auVar69._12_4_ = auVar251._12_4_ ^ (uint)(auVar286._12_4_ + auVar260._12_4_);
            auVar69._16_4_ = auVar262._0_4_ ^ (uint)(auVar286._16_4_ + auVar260._16_4_);
            auVar69._20_4_ = auVar262._4_4_ ^ (uint)(auVar286._20_4_ + auVar260._20_4_);
            auVar69._24_4_ = auVar262._8_4_ ^ (uint)(auVar286._24_4_ + auVar260._24_4_);
            auVar69._28_4_ = auVar262._12_4_ ^ (uint)(auVar286._28_4_ + auVar260._28_4_);
            *pauVar22 = auVar69;
            pauVar22 = pauVar22 + 1;
            iVar24 = iVar24 + 8;
            uVar26 = uVar20 & 0xfffffff8;
          } while (iVar24 < (int)uVar20);
        }
        auVar246._8_4_ = 0x80000000;
        auVar246._0_8_ = 0x8000000080000000;
        auVar246._12_4_ = 0x80000000;
        uVar25 = uVar26 | 3;
        while ((int)uVar25 < (int)uVar20) {
          auVar41._8_4_ = 0x7fffffff;
          auVar41._0_8_ = 0x7fffffff7fffffff;
          auVar41._12_4_ = 0x7fffffff;
          auVar180 = vandps_avx(auVar41,*(undefined1 (*) [16])*pauVar22);
          auVar140._0_4_ = (int)(auVar180._0_4_ * 1.2732395);
          auVar140._4_4_ = (int)(auVar180._4_4_ * 1.2732395);
          auVar140._8_4_ = (int)(auVar180._8_4_ * 1.2732395);
          auVar140._12_4_ = (int)(auVar180._12_4_ * 1.2732395);
          auVar141 = vpsubd_avx(auVar140,auVar195);
          auVar251 = vpand_avx(auVar377,auVar141);
          auVar141 = vcvtdq2ps_avx(auVar251);
          fVar113 = auVar180._0_4_ + auVar141._0_4_ * -0.7853982;
          fVar165 = auVar180._4_4_ + auVar141._4_4_ * -0.7853982;
          fVar166 = auVar180._8_4_ + auVar141._8_4_ * -0.7853982;
          fVar167 = auVar180._12_4_ + auVar141._12_4_ * -0.7853982;
          fVar168 = fVar113 * fVar113;
          fVar169 = fVar165 * fVar165;
          fVar170 = fVar166 * fVar166;
          fVar190 = fVar167 * fVar167;
          auVar141 = vpaddd_avx(auVar377,auVar251);
          auVar42._0_4_ =
               fVar168 * fVar113 *
               ((fVar168 * -0.00019515296 + 0.008332161) * fVar168 + -0.16666655) + fVar113;
          auVar42._4_4_ =
               fVar169 * fVar165 *
               ((fVar169 * -0.00019515296 + 0.008332161) * fVar169 + -0.16666655) + fVar165;
          auVar42._8_4_ =
               fVar170 * fVar166 *
               ((fVar170 * -0.00019515296 + 0.008332161) * fVar170 + -0.16666655) + fVar166;
          auVar42._12_4_ =
               fVar190 * fVar167 *
               ((fVar190 * -0.00019515296 + 0.008332161) * fVar190 + -0.16666655) + fVar167;
          auVar180 = vpand_avx(auVar141,auVar255);
          auVar180 = vpcmpeqd_avx(auVar180,_DAT_005e2030);
          auVar198._0_4_ =
               (((fVar168 * 2.4433157e-05 + -0.0013887316) * fVar168 + 0.041666646) * fVar168 + -0.5
               ) * fVar168 + 1.0;
          auVar198._4_4_ =
               (((fVar169 * 2.4433157e-05 + -0.0013887316) * fVar169 + 0.041666646) * fVar169 + -0.5
               ) * fVar169 + 1.0;
          auVar198._8_4_ =
               (((fVar170 * 2.4433157e-05 + -0.0013887316) * fVar170 + 0.041666646) * fVar170 + -0.5
               ) * fVar170 + 1.0;
          auVar198._12_4_ =
               (((fVar190 * 2.4433157e-05 + -0.0013887316) * fVar190 + 0.041666646) * fVar190 + -0.5
               ) * fVar190 + 1.0;
          auVar180 = vblendvps_avx(auVar198,auVar42,auVar180);
          auVar141 = vpslld_avx(auVar141,0x1d);
          auVar141 = vpand_avx(auVar141,auVar246);
          *(undefined1 (*) [16])*pauVar22 = auVar141 ^ auVar246 ^ auVar180;
          pauVar22 = (undefined1 (*) [32])(*pauVar22 + 0x10);
          uVar25 = uVar26 + 7;
          uVar26 = uVar26 + 4;
        }
        auVar17._8_8_ = 0x8000000000000000;
        auVar17._0_8_ = 0x8000000000000000;
        if ((int)uVar26 < (int)uVar20) {
          uVar19 = CONCAT44(0,~uVar26 + uVar20);
          auVar43._8_8_ = 0;
          auVar43._0_8_ = uVar19;
          auVar141 = vpshufd_avx(auVar43,0x44);
          auVar195 = vpor_avx(auVar141,auVar17);
          auVar180 = vpor_avx(auVar141,auVar17);
          uVar27 = 0;
          auVar260 = _DAT_005e2da0;
          do {
            auVar5._8_8_ = 0x8000000000000000;
            auVar5._0_8_ = 0x8000000000000000;
            auVar44._8_8_ = 0;
            auVar44._0_8_ = uVar27;
            auVar251 = vpshufd_avx(auVar44,0x44);
            auVar70._16_16_ = auVar251;
            auVar70._0_16_ = auVar251;
            auVar286 = vorps_avx(auVar70,_DAT_005e2d80);
            auVar260 = vorps_avx(auVar70,auVar260);
            auVar112 = vpor_avx(auVar141,auVar5);
            auVar251 = vpcmpgtq_avx(auVar260._16_16_ ^ auVar5,auVar112);
            auVar262 = vpcmpgtq_avx(auVar260._0_16_ ^ auVar5,auVar195);
            auVar251 = vpackssdw_avx(auVar262,auVar251);
            auVar111 = auVar379._0_16_;
            auVar262 = vpcmpgtq_avx(auVar286._16_16_ ^ auVar5,auVar112);
            auVar142._0_8_ = auVar286._0_8_ ^ 0x8000000000000000;
            auVar142._8_4_ = auVar286._8_4_;
            auVar142._12_4_ = auVar286._12_4_ ^ 0x80000000;
            auVar112 = vpcmpgtq_avx(auVar142,auVar180);
            auVar262 = vpackssdw_avx(auVar112,auVar262);
            auVar251 = vpackssdw_avx(auVar111 ^ auVar262,auVar111 ^ auVar251);
            auVar262 = vpmovsxwd_avx(auVar251);
            auVar251 = vpunpckhwd_avx(auVar251,auVar251);
            auVar71._16_16_ = auVar251;
            auVar71._0_16_ = auVar262;
            auVar260 = vmaskmovps_avx(auVar71,*(undefined1 (*) [32])(*pauVar22 + uVar27 * 4));
            auVar112 = auVar260._16_16_;
            local_118._0_4_ = cosf(auVar260._16_4_);
            local_118._4_4_ = extraout_XMM0_Db_07;
            local_118._8_4_ = extraout_XMM0_Dc_07;
            local_118._12_4_ = extraout_XMM0_Dd_07;
            auVar251 = vmovshdup_avx(auVar112);
            auVar99._0_4_ = cosf(auVar251._0_4_);
            auVar99._4_60_ = extraout_var_23;
            auVar251 = vinsertps_avx(local_118,auVar99._0_16_,0x10);
            auVar262 = vpermilpd_avx(auVar112,1);
            auVar100._0_4_ = cosf(auVar262._0_4_);
            auVar100._4_60_ = extraout_var_24;
            auVar251 = vinsertps_avx(auVar251,auVar100._0_16_,0x20);
            auVar262 = vpermilps_avx(auVar112,0xff);
            auVar101._0_4_ = cosf(auVar262._0_4_);
            auVar101._4_60_ = extraout_var_25;
            auVar251 = vinsertps_avx(auVar251,auVar101._0_16_,0x30);
            local_e8._0_4_ = auVar260._0_4_;
            local_118._0_4_ = cosf((float)local_e8._0_4_);
            local_118._4_4_ = extraout_XMM0_Db_08;
            local_118._8_4_ = extraout_XMM0_Dc_08;
            local_118._12_4_ = extraout_XMM0_Dd_08;
            local_e8 = auVar260._0_16_;
            auVar262 = vmovshdup_avx(local_e8);
            auVar102._0_4_ = cosf(auVar262._0_4_);
            auVar102._4_60_ = extraout_var_26;
            auVar262 = vinsertps_avx(local_118,auVar102._0_16_,0x10);
            auVar112 = vpermilpd_avx(local_e8,1);
            auVar103._0_4_ = cosf(auVar112._0_4_);
            auVar103._4_60_ = extraout_var_27;
            auVar262 = vinsertps_avx(auVar262,auVar103._0_16_,0x20);
            auVar112 = vpermilps_avx(local_e8,0xff);
            auVar104._0_4_ = cosf(auVar112._0_4_);
            auVar260 = _DAT_005e2da0;
            auVar104._4_60_ = extraout_var_28;
            auVar112 = vpcmpeqd_avx(auVar111,auVar111);
            auVar379 = ZEXT1664(auVar112);
            auVar262 = vinsertps_avx(auVar262,auVar104._0_16_,0x30);
            auVar72._16_16_ = auVar251;
            auVar72._0_16_ = auVar262;
            auVar286 = vmaskmovps_avx(auVar71,auVar72);
            *(undefined1 (*) [32])(*pauVar22 + uVar27 * 4) = auVar286;
            uVar27 = uVar27 + 8;
          } while ((uVar19 + 8 & 0x1fffffff8) != uVar27);
        }
        lVar21 = lVar21 + 1;
      } while (lVar21 != iVar7);
    }
    break;
  case 0xb:
    iVar7 = bottom_top_blob->c;
    if (0 < (long)iVar7) {
      uVar20 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      lVar21 = 0;
      auVar195 = vpcmpeqd_avx(in_ZMM11._0_16_,in_ZMM11._0_16_);
      auVar379 = ZEXT1664(auVar195);
      auVar380._8_8_ = 0xfffffffefffffffe;
      auVar380._0_8_ = 0xfffffffefffffffe;
      auVar384._8_8_ = 0x8000000080000000;
      auVar384._0_8_ = 0x8000000080000000;
      do {
        auVar364._8_4_ = 0x80000000;
        auVar364._0_8_ = 0x8000000080000000;
        auVar257._8_4_ = 0x7fffffff;
        auVar257._0_8_ = 0x7fffffff7fffffff;
        auVar364._12_4_ = 0x80000000;
        auVar257._12_4_ = 0x7fffffff;
        auVar364._16_4_ = 0x80000000;
        auVar257._16_4_ = 0x7fffffff;
        auVar364._20_4_ = 0x80000000;
        auVar257._20_4_ = 0x7fffffff;
        auVar388._8_4_ = 2;
        auVar388._0_8_ = 0x200000002;
        auVar295._8_4_ = 0xc0000000;
        auVar295._0_8_ = 0xc0000000c0000000;
        auVar364._24_4_ = 0x80000000;
        auVar257._24_4_ = 0x7fffffff;
        auVar388._12_4_ = 2;
        auVar364._28_4_ = 0x80000000;
        auVar295._12_4_ = 0xc0000000;
        auVar257._28_4_ = 0x7fffffff;
        pauVar22 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * lVar21 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        auVar195 = auVar379._0_16_;
        if ((int)uVar20 < 8) {
          uVar26 = 0;
        }
        else {
          iVar24 = 7;
          do {
            auVar260 = vandps_avx(*pauVar22,auVar257);
            auVar286 = vandps_avx(auVar364,*pauVar22);
            auVar120._0_4_ = (int)(auVar260._0_4_ * 1.2732395);
            auVar120._4_4_ = (int)(auVar260._4_4_ * 1.2732395);
            auVar120._8_4_ = (int)(auVar260._8_4_ * 1.2732395);
            auVar120._12_4_ = (int)(auVar260._12_4_ * 1.2732395);
            auVar151._16_4_ = (int)(auVar260._16_4_ * 1.2732395);
            auVar151._0_16_ = auVar120;
            auVar151._20_4_ = (int)(auVar260._20_4_ * 1.2732395);
            auVar151._24_4_ = (int)(auVar260._24_4_ * 1.2732395);
            auVar151._28_4_ = 1;
            auVar309 = vpsubd_avx(auVar120,auVar195);
            auVar340 = vpsubd_avx(auVar151._16_16_,auVar195);
            auVar180 = vpand_avx(auVar380,auVar309);
            auVar141 = vpand_avx(auVar380,auVar340);
            auVar251 = vpslld_avx(auVar309,0x1d);
            auVar251 = vpand_avx(auVar384,auVar251);
            auVar262 = vpslld_avx(auVar340,0x1d);
            auVar262 = vpand_avx(auVar384,auVar262);
            auVar277._16_16_ = auVar141;
            auVar277._0_16_ = auVar180;
            auVar351 = vcvtdq2ps_avx(auVar277);
            fVar113 = auVar260._0_4_ + auVar351._0_4_ * -0.7853982;
            fVar165 = auVar260._4_4_ + auVar351._4_4_ * -0.7853982;
            fVar166 = auVar260._8_4_ + auVar351._8_4_ * -0.7853982;
            fVar167 = auVar260._12_4_ + auVar351._12_4_ * -0.7853982;
            fVar168 = auVar260._16_4_ + auVar351._16_4_ * -0.7853982;
            fVar169 = auVar260._20_4_ + auVar351._20_4_ * -0.7853982;
            fVar170 = auVar260._24_4_ + auVar351._24_4_ * -0.7853982;
            auVar180 = vpslld_avx(auVar180,0x1d);
            auVar180 = vpaddd_avx(auVar295,auVar180);
            auVar112 = vpandn_avx(auVar180,auVar384);
            auVar180 = vpslld_avx(auVar141,0x1d);
            auVar180 = vpaddd_avx(auVar295,auVar180);
            auVar111 = vpandn_avx(auVar180,auVar384);
            fVar190 = fVar113 * fVar113;
            fVar205 = fVar165 * fVar165;
            fVar206 = fVar166 * fVar166;
            fVar207 = fVar167 * fVar167;
            fVar208 = fVar168 * fVar168;
            fVar209 = fVar169 * fVar169;
            fVar210 = fVar170 * fVar170;
            auVar258._0_4_ =
                 fVar190 * fVar190 *
                 ((fVar190 * 2.4433157e-05 + -0.0013887316) * fVar190 + 0.041666646) +
                 fVar190 * -0.5 + 1.0;
            auVar258._4_4_ =
                 fVar205 * fVar205 *
                 ((fVar205 * 2.4433157e-05 + -0.0013887316) * fVar205 + 0.041666646) +
                 fVar205 * -0.5 + 1.0;
            auVar258._8_4_ =
                 fVar206 * fVar206 *
                 ((fVar206 * 2.4433157e-05 + -0.0013887316) * fVar206 + 0.041666646) +
                 fVar206 * -0.5 + 1.0;
            auVar258._12_4_ =
                 fVar207 * fVar207 *
                 ((fVar207 * 2.4433157e-05 + -0.0013887316) * fVar207 + 0.041666646) +
                 fVar207 * -0.5 + 1.0;
            auVar258._16_4_ =
                 fVar208 * fVar208 *
                 ((fVar208 * 2.4433157e-05 + -0.0013887316) * fVar208 + 0.041666646) +
                 fVar208 * -0.5 + 1.0;
            auVar258._20_4_ =
                 fVar209 * fVar209 *
                 ((fVar209 * 2.4433157e-05 + -0.0013887316) * fVar209 + 0.041666646) +
                 fVar209 * -0.5 + 1.0;
            auVar258._24_4_ =
                 fVar210 * fVar210 *
                 ((fVar210 * 2.4433157e-05 + -0.0013887316) * fVar210 + 0.041666646) +
                 fVar210 * -0.5 + 1.0;
            auVar258._28_4_ = 0x3f0a5141;
            auVar201._0_4_ =
                 fVar190 * fVar113 *
                 ((fVar190 * -0.00019515296 + 0.008332161) * fVar190 + -0.16666655) + fVar113;
            auVar201._4_4_ =
                 fVar205 * fVar165 *
                 ((fVar205 * -0.00019515296 + 0.008332161) * fVar205 + -0.16666655) + fVar165;
            auVar201._8_4_ =
                 fVar206 * fVar166 *
                 ((fVar206 * -0.00019515296 + 0.008332161) * fVar206 + -0.16666655) + fVar166;
            auVar201._12_4_ =
                 fVar207 * fVar167 *
                 ((fVar207 * -0.00019515296 + 0.008332161) * fVar207 + -0.16666655) + fVar167;
            auVar201._16_4_ =
                 fVar208 * fVar168 *
                 ((fVar208 * -0.00019515296 + 0.008332161) * fVar208 + -0.16666655) + fVar168;
            auVar201._20_4_ =
                 fVar209 * fVar169 *
                 ((fVar209 * -0.00019515296 + 0.008332161) * fVar209 + -0.16666655) + fVar169;
            auVar201._24_4_ =
                 fVar210 * fVar170 *
                 ((fVar210 * -0.00019515296 + 0.008332161) * fVar210 + -0.16666655) + fVar170;
            auVar201._28_4_ = auVar260._28_4_ + auVar351._28_4_ + 0.0;
            auVar180 = vpand_avx(auVar388,auVar309);
            auVar141 = vpand_avx(auVar388,auVar340);
            auVar49._16_16_ = auVar141;
            auVar49._0_16_ = auVar180;
            auVar260 = vcvtdq2ps_avx(auVar49);
            auVar351 = vcmpps_avx(auVar260,ZEXT432(0) << 0x20,0);
            auVar260 = vandps_avx(auVar351,auVar201);
            auVar351 = vandnps_avx(auVar351,auVar258);
            auVar50._0_4_ = auVar351._0_4_ + auVar260._0_4_;
            auVar50._4_4_ = auVar351._4_4_ + auVar260._4_4_;
            auVar50._8_4_ = auVar351._8_4_ + auVar260._8_4_;
            auVar50._12_4_ = auVar351._12_4_ + auVar260._12_4_;
            auVar50._16_4_ = auVar351._16_4_ + auVar260._16_4_;
            auVar50._20_4_ = auVar351._20_4_ + auVar260._20_4_;
            auVar50._24_4_ = auVar351._24_4_ + auVar260._24_4_;
            auVar50._28_4_ = auVar351._28_4_ + auVar260._28_4_;
            auVar152._0_4_ = auVar258._0_4_ + auVar201._0_4_;
            auVar152._4_4_ = auVar258._4_4_ + auVar201._4_4_;
            auVar152._8_4_ = auVar258._8_4_ + auVar201._8_4_;
            auVar152._12_4_ = auVar258._12_4_ + auVar201._12_4_;
            auVar152._16_4_ = auVar258._16_4_ + auVar201._16_4_;
            auVar152._20_4_ = auVar258._20_4_ + auVar201._20_4_;
            auVar152._24_4_ = auVar258._24_4_ + auVar201._24_4_;
            auVar152._28_4_ = auVar201._28_4_ + 0.54030234;
            auVar260 = vsubps_avx(auVar152,auVar50);
            auVar153._0_4_ = (float)(auVar112._0_4_ ^ auVar260._0_4_);
            auVar153._4_4_ = (float)(auVar112._4_4_ ^ auVar260._4_4_);
            auVar153._8_4_ = (float)(auVar112._8_4_ ^ auVar260._8_4_);
            auVar153._12_4_ = (float)(auVar112._12_4_ ^ auVar260._12_4_);
            auVar153._16_4_ = (float)(auVar111._0_4_ ^ auVar260._16_4_);
            auVar153._20_4_ = (float)(auVar111._4_4_ ^ auVar260._20_4_);
            auVar153._24_4_ = (float)(auVar111._8_4_ ^ auVar260._24_4_);
            auVar153._28_4_ = (float)(auVar111._12_4_ ^ auVar260._28_4_);
            auVar51._0_4_ = auVar286._0_4_ ^ auVar251._0_4_ ^ (uint)auVar50._0_4_;
            auVar51._4_4_ = auVar286._4_4_ ^ auVar251._4_4_ ^ (uint)auVar50._4_4_;
            auVar51._8_4_ = auVar286._8_4_ ^ auVar251._8_4_ ^ (uint)auVar50._8_4_;
            auVar51._12_4_ = auVar286._12_4_ ^ auVar251._12_4_ ^ (uint)auVar50._12_4_;
            auVar51._16_4_ = auVar286._16_4_ ^ auVar262._0_4_ ^ (uint)auVar50._16_4_;
            auVar51._20_4_ = auVar286._20_4_ ^ auVar262._4_4_ ^ (uint)auVar50._20_4_;
            auVar51._24_4_ = auVar286._24_4_ ^ auVar262._8_4_ ^ (uint)auVar50._24_4_;
            auVar51._28_4_ = auVar286._28_4_ ^ auVar262._12_4_ ^ (uint)auVar50._28_4_;
            auVar260 = vcmpps_avx(auVar153,ZEXT432(0) << 0x20,0);
            auVar202._8_4_ = 0x322bcc77;
            auVar202._0_8_ = 0x322bcc77322bcc77;
            auVar202._12_4_ = 0x322bcc77;
            auVar202._16_4_ = 0x322bcc77;
            auVar202._20_4_ = 0x322bcc77;
            auVar202._24_4_ = 0x322bcc77;
            auVar202._28_4_ = 0x322bcc77;
            auVar260 = vandps_avx(auVar260,auVar202);
            auVar154._0_4_ = auVar260._0_4_ + auVar153._0_4_;
            auVar154._4_4_ = auVar260._4_4_ + auVar153._4_4_;
            auVar154._8_4_ = auVar260._8_4_ + auVar153._8_4_;
            auVar154._12_4_ = auVar260._12_4_ + auVar153._12_4_;
            auVar154._16_4_ = auVar260._16_4_ + auVar153._16_4_;
            auVar154._20_4_ = auVar260._20_4_ + auVar153._20_4_;
            auVar154._24_4_ = auVar260._24_4_ + auVar153._24_4_;
            auVar154._28_4_ = auVar260._28_4_ + auVar153._28_4_;
            auVar260 = vdivps_avx(auVar51,auVar154);
            *pauVar22 = auVar260;
            pauVar22 = pauVar22 + 1;
            iVar24 = iVar24 + 8;
            uVar26 = uVar20 & 0xfffffff8;
          } while (iVar24 < (int)uVar20);
        }
        auVar320._8_4_ = 0xfffffffe;
        auVar320._0_8_ = 0xfffffffefffffffe;
        auVar320._12_4_ = 0xfffffffe;
        auVar385._8_4_ = 0xe0000000;
        auVar385._0_8_ = 0xe0000000e0000000;
        auVar385._12_4_ = 0xe0000000;
        auVar387._8_4_ = 0x80000000;
        auVar387._0_8_ = 0x8000000080000000;
        auVar387._12_4_ = 0x80000000;
        uVar25 = uVar26 | 3;
        while ((int)uVar25 < (int)uVar20) {
          auVar121._8_4_ = 0x7fffffff;
          auVar121._0_8_ = 0x7fffffff7fffffff;
          auVar121._12_4_ = 0x7fffffff;
          auVar180 = vandps_avx(*(undefined1 (*) [16])*pauVar22,auVar121);
          auVar122._0_4_ = (int)(auVar180._0_4_ * 1.2732395);
          auVar122._4_4_ = (int)(auVar180._4_4_ * 1.2732395);
          auVar122._8_4_ = (int)(auVar180._8_4_ * 1.2732395);
          auVar122._12_4_ = (int)(auVar180._12_4_ * 1.2732395);
          auVar262 = vpsubd_avx(auVar122,auVar195);
          auVar141 = vpand_avx(auVar320,auVar262);
          auVar141 = vcvtdq2ps_avx(auVar141);
          fVar113 = auVar180._0_4_ + auVar141._0_4_ * -0.7853982;
          fVar165 = auVar180._4_4_ + auVar141._4_4_ * -0.7853982;
          fVar166 = auVar180._8_4_ + auVar141._8_4_ * -0.7853982;
          fVar167 = auVar180._12_4_ + auVar141._12_4_ * -0.7853982;
          fVar168 = fVar113 * fVar113;
          fVar169 = fVar165 * fVar165;
          fVar170 = fVar166 * fVar166;
          fVar190 = fVar167 * fVar167;
          auVar243._0_4_ =
               fVar168 * fVar168 *
               ((fVar168 * 2.4433157e-05 + -0.0013887316) * fVar168 + 0.041666646) +
               fVar168 * -0.5 + 1.0;
          auVar243._4_4_ =
               fVar169 * fVar169 *
               ((fVar169 * 2.4433157e-05 + -0.0013887316) * fVar169 + 0.041666646) +
               fVar169 * -0.5 + 1.0;
          auVar243._8_4_ =
               fVar170 * fVar170 *
               ((fVar170 * 2.4433157e-05 + -0.0013887316) * fVar170 + 0.041666646) +
               fVar170 * -0.5 + 1.0;
          auVar243._12_4_ =
               fVar190 * fVar190 *
               ((fVar190 * 2.4433157e-05 + -0.0013887316) * fVar190 + 0.041666646) +
               fVar190 * -0.5 + 1.0;
          auVar180 = vpand_avx(auVar388,auVar262);
          auVar180 = vpcmpeqd_avx(ZEXT816(0) << 0x20,auVar180);
          auVar192._0_4_ =
               fVar168 * fVar113 *
               ((fVar168 * -0.00019515296 + 0.008332161) * fVar168 + -0.16666655) + fVar113;
          auVar192._4_4_ =
               fVar169 * fVar165 *
               ((fVar169 * -0.00019515296 + 0.008332161) * fVar169 + -0.16666655) + fVar165;
          auVar192._8_4_ =
               fVar170 * fVar166 *
               ((fVar170 * -0.00019515296 + 0.008332161) * fVar170 + -0.16666655) + fVar166;
          auVar192._12_4_ =
               fVar190 * fVar167 *
               ((fVar190 * -0.00019515296 + 0.008332161) * fVar190 + -0.16666655) + fVar167;
          auVar141 = vblendvps_avx(auVar243,auVar192,auVar180);
          auVar251 = vblendvps_avx(auVar192,auVar243,auVar180);
          auVar180 = vpslld_avx(auVar262,0x1d);
          auVar262 = vpand_avx(auVar387,auVar180 ^ *(undefined1 (*) [16])*pauVar22);
          auVar180 = vpslld_avx(auVar122,0x1d);
          auVar180 = vpaddd_avx(auVar385,auVar180);
          auVar112 = vpand_avx(auVar387,auVar180);
          auVar180 = vcmpps_avx(ZEXT816(0) << 0x20,auVar387 ^ auVar112 ^ auVar251,0);
          auVar193._8_4_ = 0x322bcc77;
          auVar193._0_8_ = 0x322bcc77322bcc77;
          auVar193._12_4_ = 0x322bcc77;
          auVar180 = vandps_avx(auVar180,auVar193);
          auVar180 = vsubps_avx(auVar180,auVar112 ^ auVar251);
          auVar180 = vdivps_avx(auVar262 ^ auVar141,auVar180);
          *(undefined1 (*) [16])*pauVar22 = auVar180;
          pauVar22 = (undefined1 (*) [32])(*pauVar22 + 0x10);
          uVar25 = uVar26 + 7;
          uVar26 = uVar26 + 4;
        }
        auVar13._8_8_ = 0x8000000000000000;
        auVar13._0_8_ = 0x8000000000000000;
        if ((int)uVar26 < (int)uVar20) {
          uVar19 = CONCAT44(0,~uVar26 + uVar20);
          auVar32._8_8_ = 0;
          auVar32._0_8_ = uVar19;
          auVar141 = vpshufd_avx(auVar32,0x44);
          auVar195 = vpor_avx(auVar141,auVar13);
          auVar180 = vpor_avx(auVar141,auVar13);
          uVar27 = 0;
          auVar260 = _DAT_005e2da0;
          do {
            auVar1._8_8_ = 0x8000000000000000;
            auVar1._0_8_ = 0x8000000000000000;
            auVar33._8_8_ = 0;
            auVar33._0_8_ = uVar27;
            auVar251 = vpshufd_avx(auVar33,0x44);
            auVar52._16_16_ = auVar251;
            auVar52._0_16_ = auVar251;
            auVar286 = vorps_avx(auVar52,_DAT_005e2d80);
            auVar260 = vorps_avx(auVar52,auVar260);
            auVar112 = vpor_avx(auVar141,auVar1);
            auVar251 = vpcmpgtq_avx(auVar260._16_16_ ^ auVar1,auVar112);
            auVar262 = vpcmpgtq_avx(auVar260._0_16_ ^ auVar1,auVar195);
            auVar251 = vpackssdw_avx(auVar262,auVar251);
            auVar111 = auVar379._0_16_;
            auVar262 = vpcmpgtq_avx(auVar286._16_16_ ^ auVar1,auVar112);
            auVar123._0_8_ = auVar286._0_8_ ^ 0x8000000000000000;
            auVar123._8_4_ = auVar286._8_4_;
            auVar123._12_4_ = auVar286._12_4_ ^ 0x80000000;
            auVar112 = vpcmpgtq_avx(auVar123,auVar180);
            auVar262 = vpackssdw_avx(auVar112,auVar262);
            auVar251 = vpackssdw_avx(auVar111 ^ auVar262,auVar111 ^ auVar251);
            auVar262 = vpmovsxwd_avx(auVar251);
            auVar251 = vpunpckhwd_avx(auVar251,auVar251);
            auVar53._16_16_ = auVar251;
            auVar53._0_16_ = auVar262;
            auVar260 = vmaskmovps_avx(auVar53,*(undefined1 (*) [32])(*pauVar22 + uVar27 * 4));
            auVar112 = auVar260._16_16_;
            local_118._0_4_ = tanf(auVar260._16_4_);
            local_118._4_4_ = extraout_XMM0_Db;
            local_118._8_4_ = extraout_XMM0_Dc;
            local_118._12_4_ = extraout_XMM0_Dd;
            auVar251 = vmovshdup_avx(auVar112);
            auVar76._0_4_ = tanf(auVar251._0_4_);
            auVar76._4_60_ = extraout_var;
            auVar251 = vinsertps_avx(local_118,auVar76._0_16_,0x10);
            auVar262 = vpermilpd_avx(auVar112,1);
            auVar77._0_4_ = tanf(auVar262._0_4_);
            auVar77._4_60_ = extraout_var_00;
            auVar251 = vinsertps_avx(auVar251,auVar77._0_16_,0x20);
            auVar262 = vpermilps_avx(auVar112,0xff);
            auVar78._0_4_ = tanf(auVar262._0_4_);
            auVar78._4_60_ = extraout_var_01;
            auVar251 = vinsertps_avx(auVar251,auVar78._0_16_,0x30);
            local_e8._0_4_ = auVar260._0_4_;
            local_118._0_4_ = tanf((float)local_e8._0_4_);
            local_118._4_4_ = extraout_XMM0_Db_00;
            local_118._8_4_ = extraout_XMM0_Dc_00;
            local_118._12_4_ = extraout_XMM0_Dd_00;
            local_e8 = auVar260._0_16_;
            auVar262 = vmovshdup_avx(local_e8);
            auVar79._0_4_ = tanf(auVar262._0_4_);
            auVar79._4_60_ = extraout_var_02;
            auVar262 = vinsertps_avx(local_118,auVar79._0_16_,0x10);
            auVar112 = vpermilpd_avx(local_e8,1);
            auVar80._0_4_ = tanf(auVar112._0_4_);
            auVar80._4_60_ = extraout_var_03;
            auVar262 = vinsertps_avx(auVar262,auVar80._0_16_,0x20);
            auVar112 = vpermilps_avx(local_e8,0xff);
            auVar81._0_4_ = tanf(auVar112._0_4_);
            auVar260 = _DAT_005e2da0;
            auVar81._4_60_ = extraout_var_04;
            auVar112 = vpcmpeqd_avx(auVar111,auVar111);
            auVar379 = ZEXT1664(auVar112);
            auVar262 = vinsertps_avx(auVar262,auVar81._0_16_,0x30);
            auVar54._16_16_ = auVar251;
            auVar54._0_16_ = auVar262;
            auVar286 = vmaskmovps_avx(auVar53,auVar54);
            *(undefined1 (*) [32])(*pauVar22 + uVar27 * 4) = auVar286;
            uVar27 = uVar27 + 8;
          } while ((uVar19 + 8 & 0x1fffffff8) != uVar27);
        }
        lVar21 = lVar21 + 1;
      } while (lVar21 != iVar7);
    }
    break;
  case 0xc:
    iVar7 = bottom_top_blob->c;
    if (0 < (long)iVar7) {
      uVar20 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      lVar21 = 0;
      do {
        auVar365._8_4_ = 0x3f800000;
        auVar365._0_8_ = 0x3f8000003f800000;
        auVar346._8_4_ = 0x3f000000;
        auVar346._0_8_ = 0x3f0000003f000000;
        auVar311._8_4_ = 0x7fffffff;
        auVar311._0_8_ = 0x7fffffff7fffffff;
        auVar280._8_4_ = 0x80000000;
        auVar280._0_8_ = 0x8000000080000000;
        auVar365._12_4_ = 0x3f800000;
        auVar346._12_4_ = 0x3f000000;
        auVar311._12_4_ = 0x7fffffff;
        auVar280._12_4_ = 0x80000000;
        auVar365._16_4_ = 0x3f800000;
        auVar346._16_4_ = 0x3f000000;
        auVar311._16_4_ = 0x7fffffff;
        auVar280._16_4_ = 0x80000000;
        auVar365._20_4_ = 0x3f800000;
        auVar346._20_4_ = 0x3f000000;
        auVar311._20_4_ = 0x7fffffff;
        auVar280._20_4_ = 0x80000000;
        auVar365._24_4_ = 0x3f800000;
        auVar346._24_4_ = 0x3f000000;
        auVar311._24_4_ = 0x7fffffff;
        auVar280._24_4_ = 0x80000000;
        auVar365._28_4_ = 0x3f800000;
        auVar346._28_4_ = 0x3f000000;
        auVar311._28_4_ = 0x7fffffff;
        auVar280._28_4_ = 0x80000000;
        pauVar22 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * lVar21 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar20 < 8) {
          uVar26 = 0;
        }
        else {
          iVar24 = 7;
          do {
            auVar260 = vandps_avx(auVar311,*pauVar22);
            auVar188._0_4_ = auVar260._0_4_ * 0.5;
            auVar188._4_4_ = auVar260._4_4_ * 0.5;
            auVar188._8_4_ = auVar260._8_4_ * 0.5;
            auVar188._12_4_ = auVar260._12_4_ * 0.5;
            auVar188._16_4_ = auVar260._16_4_ * 0.5;
            auVar188._20_4_ = auVar260._20_4_ * 0.5;
            auVar188._28_36_ = in_ZMM2._28_36_;
            auVar188._24_4_ = auVar260._24_4_ * 0.5;
            auVar286 = vsubps_avx(auVar346,auVar188._0_32_);
            auVar286 = vsqrtps_avx(auVar286);
            auVar351 = vcmpps_avx(auVar346,auVar260,1);
            auVar286 = vblendvps_avx(auVar260,auVar286,auVar351);
            fVar113 = auVar286._0_4_;
            fVar190 = fVar113 * fVar113;
            fVar165 = auVar286._4_4_;
            fVar206 = fVar165 * fVar165;
            fVar166 = auVar286._8_4_;
            fVar208 = fVar166 * fVar166;
            fVar167 = auVar286._12_4_;
            fVar210 = fVar167 * fVar167;
            fVar168 = auVar286._16_4_;
            fVar230 = fVar168 * fVar168;
            fVar169 = auVar286._20_4_;
            fVar234 = fVar169 * fVar169;
            fVar170 = auVar286._24_4_;
            fVar238 = fVar170 * fVar170;
            fVar212 = fVar190 * fVar190;
            fVar231 = fVar206 * fVar206;
            fVar233 = fVar208 * fVar208;
            fVar235 = fVar210 * fVar210;
            fVar237 = fVar230 * fVar230;
            fVar239 = fVar234 * fVar234;
            fVar241 = fVar238 * fVar238;
            auVar260 = vandps_avx(auVar365,auVar351);
            fVar205 = auVar260._0_4_ * 1.5707964;
            fVar207 = auVar260._4_4_ * 1.5707964;
            fVar209 = auVar260._8_4_ * 1.5707964;
            fVar211 = auVar260._12_4_ * 1.5707964;
            fVar232 = auVar260._16_4_ * 1.5707964;
            fVar236 = auVar260._20_4_ * 1.5707964;
            fVar240 = auVar260._24_4_ * 1.5707964;
            in_ZMM2 = ZEXT3264(CONCAT428(0x3fc90fdb,
                                         CONCAT424(fVar240,CONCAT420(fVar236,CONCAT416(fVar232,
                                                  CONCAT412(fVar211,CONCAT48(fVar209,CONCAT44(
                                                  fVar207,fVar205))))))));
            auVar155._0_4_ =
                 (auVar260._0_4_ * -3.0 + 1.0) * fVar113 *
                 ((fVar212 * 0.023994016 + 0.07494697) * fVar212 + 1.0 +
                 ((fVar212 * 0.042417344 + 0.045520633) * fVar212 + 0.16666782) * fVar190) + fVar205
            ;
            auVar155._4_4_ =
                 (auVar260._4_4_ * -3.0 + 1.0) * fVar165 *
                 ((fVar231 * 0.023994016 + 0.07494697) * fVar231 + 1.0 +
                 ((fVar231 * 0.042417344 + 0.045520633) * fVar231 + 0.16666782) * fVar206) + fVar207
            ;
            auVar155._8_4_ =
                 (auVar260._8_4_ * -3.0 + 1.0) * fVar166 *
                 ((fVar233 * 0.023994016 + 0.07494697) * fVar233 + 1.0 +
                 ((fVar233 * 0.042417344 + 0.045520633) * fVar233 + 0.16666782) * fVar208) + fVar209
            ;
            auVar155._12_4_ =
                 (auVar260._12_4_ * -3.0 + 1.0) * fVar167 *
                 ((fVar235 * 0.023994016 + 0.07494697) * fVar235 + 1.0 +
                 ((fVar235 * 0.042417344 + 0.045520633) * fVar235 + 0.16666782) * fVar210) + fVar211
            ;
            auVar155._16_4_ =
                 (auVar260._16_4_ * -3.0 + 1.0) * fVar168 *
                 ((fVar237 * 0.023994016 + 0.07494697) * fVar237 + 1.0 +
                 ((fVar237 * 0.042417344 + 0.045520633) * fVar237 + 0.16666782) * fVar230) + fVar232
            ;
            auVar155._20_4_ =
                 (auVar260._20_4_ * -3.0 + 1.0) * fVar169 *
                 ((fVar239 * 0.023994016 + 0.07494697) * fVar239 + 1.0 +
                 ((fVar239 * 0.042417344 + 0.045520633) * fVar239 + 0.16666782) * fVar234) + fVar236
            ;
            auVar155._24_4_ =
                 (auVar260._24_4_ * -3.0 + 1.0) * fVar170 *
                 ((fVar241 * 0.023994016 + 0.07494697) * fVar241 + 1.0 +
                 ((fVar241 * 0.042417344 + 0.045520633) * fVar241 + 0.16666782) * fVar238) + fVar240
            ;
            auVar155._28_4_ = auVar286._28_4_ + 1.5707964;
            auVar260 = vandps_avx(*pauVar22,auVar280);
            auVar260 = vorps_avx(auVar260,auVar155);
            *pauVar22 = auVar260;
            pauVar22 = pauVar22 + 1;
            iVar24 = iVar24 + 8;
            uVar26 = uVar20 & 0xfffffff8;
          } while (iVar24 < (int)uVar20);
        }
        auVar297._8_4_ = 0x7fffffff;
        auVar297._0_8_ = 0x7fffffff7fffffff;
        auVar297._12_4_ = 0x7fffffff;
        auVar323._8_4_ = 0x3f000000;
        auVar323._0_8_ = 0x3f0000003f000000;
        auVar323._12_4_ = 0x3f000000;
        auVar356._8_4_ = 0x3f800000;
        auVar356._0_8_ = 0x3f8000003f800000;
        auVar356._12_4_ = 0x3f800000;
        uVar25 = uVar26 | 3;
        while ((int)uVar25 < (int)uVar20) {
          auVar195 = vandps_avx(auVar297,*(undefined1 (*) [16])*pauVar22);
          auVar180 = vcmpps_avx(auVar323,auVar195,1);
          auVar194._0_4_ = auVar195._0_4_ * 0.5;
          auVar194._4_4_ = auVar195._4_4_ * 0.5;
          auVar194._8_4_ = auVar195._8_4_ * 0.5;
          auVar194._12_4_ = auVar195._12_4_ * 0.5;
          auVar141 = vsubps_avx(auVar323,auVar194);
          auVar141 = vsqrtps_avx(auVar141);
          auVar195 = vblendvps_avx(auVar195,auVar141,auVar180);
          fVar113 = auVar195._0_4_;
          fVar168 = fVar113 * fVar113;
          fVar165 = auVar195._4_4_;
          fVar169 = fVar165 * fVar165;
          fVar166 = auVar195._8_4_;
          fVar170 = fVar166 * fVar166;
          fVar167 = auVar195._12_4_;
          fVar190 = fVar167 * fVar167;
          fVar205 = fVar168 * fVar168;
          fVar206 = fVar169 * fVar169;
          fVar207 = fVar170 * fVar170;
          fVar208 = fVar190 * fVar190;
          auVar195 = vandps_avx(auVar356,auVar180);
          auVar124._0_4_ =
               (auVar195._0_4_ * -3.0 + 1.0) * fVar113 *
               ((fVar205 * 0.023994016 + 0.07494697) * fVar205 + 1.0 +
               ((fVar205 * 0.042417344 + 0.045520633) * fVar205 + 0.16666782) * fVar168) +
               auVar195._0_4_ * 1.5707964;
          auVar124._4_4_ =
               (auVar195._4_4_ * -3.0 + 1.0) * fVar165 *
               ((fVar206 * 0.023994016 + 0.07494697) * fVar206 + 1.0 +
               ((fVar206 * 0.042417344 + 0.045520633) * fVar206 + 0.16666782) * fVar169) +
               auVar195._4_4_ * 1.5707964;
          auVar124._8_4_ =
               (auVar195._8_4_ * -3.0 + 1.0) * fVar166 *
               ((fVar207 * 0.023994016 + 0.07494697) * fVar207 + 1.0 +
               ((fVar207 * 0.042417344 + 0.045520633) * fVar207 + 0.16666782) * fVar170) +
               auVar195._8_4_ * 1.5707964;
          auVar124._12_4_ =
               (auVar195._12_4_ * -3.0 + 1.0) * fVar167 *
               ((fVar208 * 0.023994016 + 0.07494697) * fVar208 + 1.0 +
               ((fVar208 * 0.042417344 + 0.045520633) * fVar208 + 0.16666782) * fVar190) +
               auVar195._12_4_ * 1.5707964;
          auVar174._8_4_ = 0x80000000;
          auVar174._0_8_ = 0x8000000080000000;
          auVar174._12_4_ = 0x80000000;
          in_ZMM2 = ZEXT1664(auVar174);
          auVar195 = vandps_avx(*(undefined1 (*) [16])*pauVar22,auVar174);
          auVar195 = vorps_avx(auVar195,auVar124);
          *(undefined1 (*) [16])*pauVar22 = auVar195;
          pauVar22 = (undefined1 (*) [32])(*pauVar22 + 0x10);
          uVar25 = uVar26 + 7;
          uVar26 = uVar26 + 4;
        }
        if (uVar20 - uVar26 != 0 && (int)uVar26 <= (int)uVar20) {
          lVar29 = 0;
          do {
            in_ZMM2 = ZEXT1664(in_ZMM2._0_16_);
            fVar113 = asinf(*(float *)(*pauVar22 + lVar29 * 4));
            *(float *)(*pauVar22 + lVar29 * 4) = fVar113;
            lVar29 = lVar29 + 1;
          } while (uVar20 - uVar26 != (int)lVar29);
        }
        lVar21 = lVar21 + 1;
      } while (lVar21 != iVar7);
    }
    break;
  case 0xd:
    iVar7 = bottom_top_blob->c;
    if (0 < (long)iVar7) {
      uVar20 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      lVar21 = 0;
      do {
        auVar352._8_4_ = 0x3f000000;
        auVar352._0_8_ = 0x3f0000003f000000;
        auVar313._8_4_ = 0x7fffffff;
        auVar313._0_8_ = 0x7fffffff7fffffff;
        auVar289._8_4_ = 0x80000000;
        auVar289._0_8_ = 0x8000000080000000;
        auVar352._12_4_ = 0x3f000000;
        auVar313._12_4_ = 0x7fffffff;
        auVar289._12_4_ = 0x80000000;
        auVar352._16_4_ = 0x3f000000;
        auVar313._16_4_ = 0x7fffffff;
        auVar289._16_4_ = 0x80000000;
        auVar352._20_4_ = 0x3f000000;
        auVar313._20_4_ = 0x7fffffff;
        auVar289._20_4_ = 0x80000000;
        auVar352._24_4_ = 0x3f000000;
        auVar313._24_4_ = 0x7fffffff;
        auVar289._24_4_ = 0x80000000;
        auVar352._28_4_ = 0x3f000000;
        auVar313._28_4_ = 0x7fffffff;
        auVar289._28_4_ = 0x80000000;
        pauVar22 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * lVar21 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar20 < 8) {
          uVar26 = 0;
        }
        else {
          iVar24 = 7;
          do {
            auVar260 = *pauVar22;
            auVar286 = vandps_avx(auVar313,auVar260);
            auVar189._0_4_ = auVar286._0_4_ * 0.5;
            auVar189._4_4_ = auVar286._4_4_ * 0.5;
            auVar189._8_4_ = auVar286._8_4_ * 0.5;
            auVar189._12_4_ = auVar286._12_4_ * 0.5;
            auVar189._16_4_ = auVar286._16_4_ * 0.5;
            auVar189._20_4_ = auVar286._20_4_ * 0.5;
            auVar189._28_36_ = in_ZMM2._28_36_;
            auVar189._24_4_ = auVar286._24_4_ * 0.5;
            auVar351 = vsubps_avx(auVar352,auVar189._0_32_);
            auVar351 = vsqrtps_avx(auVar351);
            auVar293 = vcmpps_avx(auVar352,auVar286,1);
            auVar351 = vblendvps_avx(auVar286,auVar351,auVar293);
            fVar113 = auVar351._0_4_;
            fVar190 = fVar113 * fVar113;
            fVar165 = auVar351._4_4_;
            fVar205 = fVar165 * fVar165;
            fVar166 = auVar351._8_4_;
            fVar206 = fVar166 * fVar166;
            fVar167 = auVar351._12_4_;
            fVar207 = fVar167 * fVar167;
            fVar168 = auVar351._16_4_;
            fVar208 = fVar168 * fVar168;
            fVar169 = auVar351._20_4_;
            fVar209 = fVar169 * fVar169;
            fVar170 = auVar351._24_4_;
            fVar210 = fVar170 * fVar170;
            fVar211 = fVar190 * fVar190;
            fVar230 = fVar205 * fVar205;
            fVar232 = fVar206 * fVar206;
            fVar234 = fVar207 * fVar207;
            fVar236 = fVar208 * fVar208;
            fVar238 = fVar209 * fVar209;
            fVar240 = fVar210 * fVar210;
            auVar286 = vandps_avx(auVar260,auVar289);
            fVar113 = ((fVar211 * 0.023994016 + 0.07494697) * fVar211 + 1.0 +
                      ((fVar211 * 0.042417344 + 0.045520633) * fVar211 + 0.16666782) * fVar190) *
                      fVar113;
            fVar165 = ((fVar230 * 0.023994016 + 0.07494697) * fVar230 + 1.0 +
                      ((fVar230 * 0.042417344 + 0.045520633) * fVar230 + 0.16666782) * fVar205) *
                      fVar165;
            auVar11._4_4_ = fVar165;
            auVar11._0_4_ = fVar113;
            fVar166 = ((fVar232 * 0.023994016 + 0.07494697) * fVar232 + 1.0 +
                      ((fVar232 * 0.042417344 + 0.045520633) * fVar232 + 0.16666782) * fVar206) *
                      fVar166;
            auVar11._8_4_ = fVar166;
            fVar167 = ((fVar234 * 0.023994016 + 0.07494697) * fVar234 + 1.0 +
                      ((fVar234 * 0.042417344 + 0.045520633) * fVar234 + 0.16666782) * fVar207) *
                      fVar167;
            auVar11._12_4_ = fVar167;
            fVar168 = ((fVar236 * 0.023994016 + 0.07494697) * fVar236 + 1.0 +
                      ((fVar236 * 0.042417344 + 0.045520633) * fVar236 + 0.16666782) * fVar208) *
                      fVar168;
            auVar11._16_4_ = fVar168;
            fVar169 = ((fVar238 * 0.023994016 + 0.07494697) * fVar238 + 1.0 +
                      ((fVar238 * 0.042417344 + 0.045520633) * fVar238 + 0.16666782) * fVar209) *
                      fVar169;
            auVar11._20_4_ = fVar169;
            fVar190 = auVar351._28_4_;
            fVar170 = ((fVar240 * 0.023994016 + 0.07494697) * fVar240 + 1.0 +
                      ((fVar240 * 0.042417344 + 0.045520633) * fVar240 + 0.16666782) * fVar210) *
                      fVar170;
            auVar11._24_4_ = fVar170;
            auVar11._28_4_ = fVar190;
            auVar351 = vorps_avx(auVar286,auVar11);
            in_ZMM2 = ZEXT3264(auVar351);
            auVar160._0_4_ = fVar113 + fVar113;
            auVar160._4_4_ = fVar165 + fVar165;
            auVar160._8_4_ = fVar166 + fVar166;
            auVar160._12_4_ = fVar167 + fVar167;
            auVar160._16_4_ = fVar168 + fVar168;
            auVar160._20_4_ = fVar169 + fVar169;
            auVar160._24_4_ = fVar170 + fVar170;
            auVar160._28_4_ = fVar190 + fVar190;
            auVar286 = vorps_avx(auVar286,auVar160);
            auVar260 = vcmpps_avx(auVar260,ZEXT832(0) << 0x20,1);
            auVar228._8_4_ = 0x40490fdb;
            auVar228._0_8_ = 0x40490fdb40490fdb;
            auVar228._12_4_ = 0x40490fdb;
            auVar228._16_4_ = 0x40490fdb;
            auVar228._20_4_ = 0x40490fdb;
            auVar228._24_4_ = 0x40490fdb;
            auVar228._28_4_ = 0x40490fdb;
            auVar260 = vandps_avx(auVar260,auVar228);
            auVar67._0_4_ = auVar260._0_4_ + auVar286._0_4_;
            auVar67._4_4_ = auVar260._4_4_ + auVar286._4_4_;
            auVar67._8_4_ = auVar260._8_4_ + auVar286._8_4_;
            auVar67._12_4_ = auVar260._12_4_ + auVar286._12_4_;
            auVar67._16_4_ = auVar260._16_4_ + auVar286._16_4_;
            auVar67._20_4_ = auVar260._20_4_ + auVar286._20_4_;
            auVar67._24_4_ = auVar260._24_4_ + auVar286._24_4_;
            auVar67._28_4_ = auVar260._28_4_ + auVar286._28_4_;
            auVar161._8_4_ = 0x3fc90fdb;
            auVar161._0_8_ = 0x3fc90fdb3fc90fdb;
            auVar161._12_4_ = 0x3fc90fdb;
            auVar161._16_4_ = 0x3fc90fdb;
            auVar161._20_4_ = 0x3fc90fdb;
            auVar161._24_4_ = 0x3fc90fdb;
            auVar161._28_4_ = 0x3fc90fdb;
            auVar260 = vsubps_avx(auVar161,auVar351);
            auVar260 = vblendvps_avx(auVar260,auVar67,auVar293);
            *pauVar22 = auVar260;
            pauVar22 = pauVar22 + 1;
            iVar24 = iVar24 + 8;
            uVar26 = uVar20 & 0xfffffff8;
          } while (iVar24 < (int)uVar20);
        }
        auVar303._8_4_ = 0x7fffffff;
        auVar303._0_8_ = 0x7fffffff7fffffff;
        auVar303._12_4_ = 0x7fffffff;
        auVar335._8_4_ = 0x3f000000;
        auVar335._0_8_ = 0x3f0000003f000000;
        auVar335._12_4_ = 0x3f000000;
        auVar272._8_4_ = 0x3fc90fdb;
        auVar272._0_8_ = 0x3fc90fdb3fc90fdb;
        auVar272._12_4_ = 0x3fc90fdb;
        uVar25 = uVar26 | 3;
        while ((int)uVar25 < (int)uVar20) {
          auVar195 = *(undefined1 (*) [16])*pauVar22;
          auVar180 = vandps_avx(auVar303,auVar195);
          auVar141 = vcmpps_avx(auVar335,auVar180,1);
          in_ZMM2 = ZEXT1664(auVar141);
          auVar196._0_4_ = auVar180._0_4_ * 0.5;
          auVar196._4_4_ = auVar180._4_4_ * 0.5;
          auVar196._8_4_ = auVar180._8_4_ * 0.5;
          auVar196._12_4_ = auVar180._12_4_ * 0.5;
          auVar251 = vsubps_avx(auVar335,auVar196);
          auVar251 = vsqrtps_avx(auVar251);
          auVar180 = vblendvps_avx(auVar180,auVar251,auVar141);
          fVar113 = auVar180._0_4_;
          fVar168 = fVar113 * fVar113;
          fVar165 = auVar180._4_4_;
          fVar169 = fVar165 * fVar165;
          fVar166 = auVar180._8_4_;
          fVar170 = fVar166 * fVar166;
          fVar167 = auVar180._12_4_;
          fVar190 = fVar167 * fVar167;
          fVar205 = fVar168 * fVar168;
          fVar206 = fVar169 * fVar169;
          fVar207 = fVar170 * fVar170;
          fVar208 = fVar190 * fVar190;
          auVar224._8_4_ = 0x80000000;
          auVar224._0_8_ = 0x8000000080000000;
          auVar224._12_4_ = 0x80000000;
          auVar180 = vandps_avx(auVar195,auVar224);
          auVar137._0_4_ =
               ((fVar205 * 0.023994016 + 0.07494697) * fVar205 + 1.0 +
               ((fVar205 * 0.042417344 + 0.045520633) * fVar205 + 0.16666782) * fVar168) * fVar113;
          auVar137._4_4_ =
               ((fVar206 * 0.023994016 + 0.07494697) * fVar206 + 1.0 +
               ((fVar206 * 0.042417344 + 0.045520633) * fVar206 + 0.16666782) * fVar169) * fVar165;
          auVar137._8_4_ =
               ((fVar207 * 0.023994016 + 0.07494697) * fVar207 + 1.0 +
               ((fVar207 * 0.042417344 + 0.045520633) * fVar207 + 0.16666782) * fVar170) * fVar166;
          auVar137._12_4_ =
               ((fVar208 * 0.023994016 + 0.07494697) * fVar208 + 1.0 +
               ((fVar208 * 0.042417344 + 0.045520633) * fVar208 + 0.16666782) * fVar190) * fVar167;
          auVar251 = vorps_avx(auVar180,auVar137);
          auVar138._0_4_ = auVar137._0_4_ + auVar137._0_4_;
          auVar138._4_4_ = auVar137._4_4_ + auVar137._4_4_;
          auVar138._8_4_ = auVar137._8_4_ + auVar137._8_4_;
          auVar138._12_4_ = auVar137._12_4_ + auVar137._12_4_;
          auVar180 = vorps_avx(auVar180,auVar138);
          auVar195 = vcmpps_avx(auVar195,_DAT_005e2030,1);
          auVar225._8_4_ = 0x40490fdb;
          auVar225._0_8_ = 0x40490fdb40490fdb;
          auVar225._12_4_ = 0x40490fdb;
          auVar195 = vandps_avx(auVar195,auVar225);
          auVar40._0_4_ = auVar195._0_4_ + auVar180._0_4_;
          auVar40._4_4_ = auVar195._4_4_ + auVar180._4_4_;
          auVar40._8_4_ = auVar195._8_4_ + auVar180._8_4_;
          auVar40._12_4_ = auVar195._12_4_ + auVar180._12_4_;
          auVar195 = vsubps_avx(auVar272,auVar251);
          auVar195 = vblendvps_avx(auVar195,auVar40,auVar141);
          *(undefined1 (*) [16])*pauVar22 = auVar195;
          pauVar22 = (undefined1 (*) [32])(*pauVar22 + 0x10);
          uVar25 = uVar26 + 7;
          uVar26 = uVar26 + 4;
        }
        if (uVar20 - uVar26 != 0 && (int)uVar26 <= (int)uVar20) {
          lVar29 = 0;
          do {
            in_ZMM2 = ZEXT1664(in_ZMM2._0_16_);
            fVar113 = acosf(*(float *)(*pauVar22 + lVar29 * 4));
            *(float *)(*pauVar22 + lVar29 * 4) = fVar113;
            lVar29 = lVar29 + 1;
          } while (uVar20 - uVar26 != (int)lVar29);
        }
        lVar21 = lVar21 + 1;
      } while (lVar21 != iVar7);
    }
    break;
  case 0xe:
    iVar7 = bottom_top_blob->c;
    if (0 < (long)iVar7) {
      uVar20 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      lVar21 = 0;
      do {
        auVar345._8_4_ = 0x3f800000;
        auVar345._0_8_ = 0x3f8000003f800000;
        auVar310._8_4_ = 0x7fffffff;
        auVar310._0_8_ = 0x7fffffff7fffffff;
        auVar276._8_4_ = 0x80000000;
        auVar276._0_8_ = 0x8000000080000000;
        auVar199._8_4_ = 0xbf800000;
        auVar199._0_8_ = 0xbf800000bf800000;
        auVar345._12_4_ = 0x3f800000;
        auVar310._12_4_ = 0x7fffffff;
        auVar276._12_4_ = 0x80000000;
        auVar199._12_4_ = 0xbf800000;
        auVar345._16_4_ = 0x3f800000;
        auVar310._16_4_ = 0x7fffffff;
        auVar276._16_4_ = 0x80000000;
        auVar199._16_4_ = 0xbf800000;
        auVar345._20_4_ = 0x3f800000;
        auVar310._20_4_ = 0x7fffffff;
        auVar276._20_4_ = 0x80000000;
        auVar199._20_4_ = 0xbf800000;
        auVar345._24_4_ = 0x3f800000;
        auVar310._24_4_ = 0x7fffffff;
        auVar276._24_4_ = 0x80000000;
        auVar199._24_4_ = 0xbf800000;
        auVar345._28_4_ = 0x3f800000;
        auVar310._28_4_ = 0x7fffffff;
        auVar276._28_4_ = 0x80000000;
        auVar199._28_4_ = 0xbf800000;
        pauVar22 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * lVar21 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar20 < 8) {
          uVar26 = 0;
        }
        else {
          iVar24 = 7;
          do {
            auVar260 = vandps_avx(auVar310,*pauVar22);
            auVar351 = vcmpps_avx(auVar345,auVar260,1);
            auVar286 = vblendvps_avx(auVar260,auVar199,auVar351);
            auVar260 = vmaxps_avx(auVar345,auVar260);
            auVar286 = vdivps_avx(auVar286,auVar260);
            fVar113 = auVar286._0_4_;
            fVar190 = fVar113 * fVar113;
            fVar165 = auVar286._4_4_;
            fVar205 = fVar165 * fVar165;
            fVar166 = auVar286._8_4_;
            fVar206 = fVar166 * fVar166;
            fVar167 = auVar286._12_4_;
            fVar207 = fVar167 * fVar167;
            fVar168 = auVar286._16_4_;
            fVar208 = fVar168 * fVar168;
            fVar169 = auVar286._20_4_;
            fVar209 = fVar169 * fVar169;
            fVar170 = auVar286._24_4_;
            fVar210 = fVar170 * fVar170;
            fVar211 = fVar190 * fVar190;
            fVar230 = fVar205 * fVar205;
            fVar232 = fVar206 * fVar206;
            fVar234 = fVar207 * fVar207;
            fVar236 = fVar208 * fVar208;
            fVar238 = fVar209 * fVar209;
            fVar240 = fVar210 * fVar210;
            auVar200._8_4_ = 0x3fc90fdb;
            auVar200._0_8_ = 0x3fc90fdb3fc90fdb;
            auVar200._12_4_ = 0x3fc90fdb;
            auVar200._16_4_ = 0x3fc90fdb;
            auVar200._20_4_ = 0x3fc90fdb;
            auVar200._24_4_ = 0x3fc90fdb;
            auVar200._28_4_ = 0x3fc90fdb;
            auVar260 = vandps_avx(auVar351,auVar200);
            auVar150._0_4_ =
                 ((((fVar211 * 0.0028498897 + 0.04269152) * fVar211 + 0.10640934) * fVar211 +
                  0.1999262) * fVar211 + 1.0 +
                 (((fVar211 * -0.01606863 + -0.07504295) * fVar211 + -0.14203644) * fVar211 +
                 -0.33333072) * fVar190) * fVar113 + auVar260._0_4_;
            auVar150._4_4_ =
                 ((((fVar230 * 0.0028498897 + 0.04269152) * fVar230 + 0.10640934) * fVar230 +
                  0.1999262) * fVar230 + 1.0 +
                 (((fVar230 * -0.01606863 + -0.07504295) * fVar230 + -0.14203644) * fVar230 +
                 -0.33333072) * fVar205) * fVar165 + auVar260._4_4_;
            auVar150._8_4_ =
                 ((((fVar232 * 0.0028498897 + 0.04269152) * fVar232 + 0.10640934) * fVar232 +
                  0.1999262) * fVar232 + 1.0 +
                 (((fVar232 * -0.01606863 + -0.07504295) * fVar232 + -0.14203644) * fVar232 +
                 -0.33333072) * fVar206) * fVar166 + auVar260._8_4_;
            auVar150._12_4_ =
                 ((((fVar234 * 0.0028498897 + 0.04269152) * fVar234 + 0.10640934) * fVar234 +
                  0.1999262) * fVar234 + 1.0 +
                 (((fVar234 * -0.01606863 + -0.07504295) * fVar234 + -0.14203644) * fVar234 +
                 -0.33333072) * fVar207) * fVar167 + auVar260._12_4_;
            auVar150._16_4_ =
                 ((((fVar236 * 0.0028498897 + 0.04269152) * fVar236 + 0.10640934) * fVar236 +
                  0.1999262) * fVar236 + 1.0 +
                 (((fVar236 * -0.01606863 + -0.07504295) * fVar236 + -0.14203644) * fVar236 +
                 -0.33333072) * fVar208) * fVar168 + auVar260._16_4_;
            auVar150._20_4_ =
                 ((((fVar238 * 0.0028498897 + 0.04269152) * fVar238 + 0.10640934) * fVar238 +
                  0.1999262) * fVar238 + 1.0 +
                 (((fVar238 * -0.01606863 + -0.07504295) * fVar238 + -0.14203644) * fVar238 +
                 -0.33333072) * fVar209) * fVar169 + auVar260._20_4_;
            auVar150._24_4_ =
                 ((((fVar240 * 0.0028498897 + 0.04269152) * fVar240 + 0.10640934) * fVar240 +
                  0.1999262) * fVar240 + 1.0 +
                 (((fVar240 * -0.01606863 + -0.07504295) * fVar240 + -0.14203644) * fVar240 +
                 -0.33333072) * fVar210) * fVar170 + auVar260._24_4_;
            auVar150._28_4_ = auVar286._28_4_ + auVar260._28_4_;
            auVar260 = vandps_avx(auVar276,*pauVar22);
            auVar260 = vorps_avx(auVar260,auVar150);
            *pauVar22 = auVar260;
            pauVar22 = pauVar22 + 1;
            iVar24 = iVar24 + 8;
            uVar26 = uVar20 & 0xfffffff8;
          } while (iVar24 < (int)uVar20);
        }
        auVar319._8_4_ = 0x3f800000;
        auVar319._0_8_ = 0x3f8000003f800000;
        auVar319._12_4_ = 0x3f800000;
        auVar355._8_4_ = 0xbf800000;
        auVar355._0_8_ = 0xbf800000bf800000;
        auVar355._12_4_ = 0xbf800000;
        uVar25 = uVar26 | 3;
        while ((int)uVar25 < (int)uVar20) {
          auVar118._8_4_ = 0x7fffffff;
          auVar118._0_8_ = 0x7fffffff7fffffff;
          auVar118._12_4_ = 0x7fffffff;
          auVar195 = vandps_avx(*(undefined1 (*) [16])*pauVar22,auVar118);
          auVar141 = vcmpps_avx(auVar319,auVar195,1);
          auVar180 = vblendvps_avx(auVar195,auVar355,auVar141);
          auVar195 = vmaxps_avx(auVar319,auVar195);
          auVar195 = vdivps_avx(auVar180,auVar195);
          fVar113 = auVar195._0_4_;
          fVar168 = fVar113 * fVar113;
          fVar165 = auVar195._4_4_;
          fVar169 = fVar165 * fVar165;
          fVar166 = auVar195._8_4_;
          fVar170 = fVar166 * fVar166;
          fVar167 = auVar195._12_4_;
          fVar190 = fVar167 * fVar167;
          fVar205 = fVar168 * fVar168;
          fVar206 = fVar169 * fVar169;
          fVar207 = fVar170 * fVar170;
          fVar208 = fVar190 * fVar190;
          auVar191._8_4_ = 0x3fc90fdb;
          auVar191._0_8_ = 0x3fc90fdb3fc90fdb;
          auVar191._12_4_ = 0x3fc90fdb;
          auVar195 = vandps_avx(auVar141,auVar191);
          auVar119._0_4_ =
               ((((fVar205 * 0.0028498897 + 0.04269152) * fVar205 + 0.10640934) * fVar205 +
                0.1999262) * fVar205 + 1.0 +
               (((fVar205 * -0.01606863 + -0.07504295) * fVar205 + -0.14203644) * fVar205 +
               -0.33333072) * fVar168) * fVar113 + auVar195._0_4_;
          auVar119._4_4_ =
               ((((fVar206 * 0.0028498897 + 0.04269152) * fVar206 + 0.10640934) * fVar206 +
                0.1999262) * fVar206 + 1.0 +
               (((fVar206 * -0.01606863 + -0.07504295) * fVar206 + -0.14203644) * fVar206 +
               -0.33333072) * fVar169) * fVar165 + auVar195._4_4_;
          auVar119._8_4_ =
               ((((fVar207 * 0.0028498897 + 0.04269152) * fVar207 + 0.10640934) * fVar207 +
                0.1999262) * fVar207 + 1.0 +
               (((fVar207 * -0.01606863 + -0.07504295) * fVar207 + -0.14203644) * fVar207 +
               -0.33333072) * fVar170) * fVar166 + auVar195._8_4_;
          auVar119._12_4_ =
               ((((fVar208 * 0.0028498897 + 0.04269152) * fVar208 + 0.10640934) * fVar208 +
                0.1999262) * fVar208 + 1.0 +
               (((fVar208 * -0.01606863 + -0.07504295) * fVar208 + -0.14203644) * fVar208 +
               -0.33333072) * fVar190) * fVar167 + auVar195._12_4_;
          auVar172._8_4_ = 0x80000000;
          auVar172._0_8_ = 0x8000000080000000;
          auVar172._12_4_ = 0x80000000;
          auVar195 = vandps_avx(*(undefined1 (*) [16])*pauVar22,auVar172);
          auVar195 = vorps_avx(auVar195,auVar119);
          *(undefined1 (*) [16])*pauVar22 = auVar195;
          pauVar22 = (undefined1 (*) [32])(*pauVar22 + 0x10);
          uVar25 = uVar26 + 7;
          uVar26 = uVar26 + 4;
        }
        if (uVar20 - uVar26 != 0 && (int)uVar26 <= (int)uVar20) {
          lVar29 = 0;
          do {
            fVar113 = atanf(*(float *)(*pauVar22 + lVar29 * 4));
            *(float *)(*pauVar22 + lVar29 * 4) = fVar113;
            lVar29 = lVar29 + 1;
          } while (uVar20 - uVar26 != (int)lVar29);
        }
        lVar21 = lVar21 + 1;
      } while (lVar21 != iVar7);
    }
    break;
  case 0xf:
    iVar7 = bottom_top_blob->c;
    if (0 < (long)iVar7) {
      uVar20 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      lVar21 = 0;
      auVar60._8_4_ = 0x3f800000;
      auVar60._0_8_ = 0x3f8000003f800000;
      auVar60._12_4_ = 0x3f800000;
      auVar60._16_4_ = 0x3f800000;
      auVar60._20_4_ = 0x3f800000;
      auVar60._24_4_ = 0x3f800000;
      auVar60._28_4_ = 0x3f800000;
      auVar129._8_4_ = 0x3f800000;
      auVar129._0_8_ = 0x3f8000003f800000;
      auVar129._12_4_ = 0x3f800000;
      auVar219._8_8_ = 0x8000000000000000;
      auVar219._0_8_ = 0x8000000000000000;
      auVar195 = vpcmpeqd_avx(auVar180,auVar180);
      do {
        pauVar22 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * lVar21 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar20 < 8) {
          uVar26 = 0;
        }
        else {
          iVar24 = 7;
          do {
            auVar351 = vdivps_avx(auVar60,*pauVar22);
            *pauVar22 = auVar351;
            pauVar22 = pauVar22 + 1;
            iVar24 = iVar24 + 8;
            uVar26 = uVar20 & 0xfffffff8;
          } while (iVar24 < (int)uVar20);
        }
        uVar25 = uVar26 | 3;
        while ((int)uVar25 < (int)uVar20) {
          auVar180 = vdivps_avx(auVar129,*(undefined1 (*) [16])*pauVar22);
          *(undefined1 (*) [16])*pauVar22 = auVar180;
          pauVar22 = (undefined1 (*) [32])(*pauVar22 + 0x10);
          uVar25 = uVar26 + 7;
          uVar26 = uVar26 + 4;
        }
        if ((int)uVar26 < (int)uVar20) {
          uVar19 = CONCAT44(0,~uVar26 + uVar20);
          auVar252._8_8_ = 0;
          auVar252._0_8_ = uVar19;
          auVar251 = vpshufd_avx(auVar252,0x44);
          auVar180 = vorps_avx(auVar251,auVar219);
          auVar141 = vorps_avx(auVar251,auVar219);
          auVar251 = vorps_avx(auVar251,auVar219);
          uVar27 = 0;
          do {
            auVar326._8_8_ = 0;
            auVar326._0_8_ = uVar27;
            auVar262 = vpshufd_avx(auVar326,0x44);
            auVar347._16_16_ = auVar262;
            auVar347._0_16_ = auVar262;
            auVar351 = vorps_avx(auVar347,auVar260);
            auVar293 = vorps_avx(auVar347,auVar286);
            auVar373._0_8_ = auVar293._16_8_ ^ 0x8000000000000000;
            auVar373._8_4_ = auVar293._24_4_;
            auVar373._12_4_ = auVar293._28_4_ ^ 0x80000000;
            auVar262 = vpcmpgtq_avx(auVar373,auVar180);
            auVar327._0_8_ = auVar293._0_8_ ^ 0x8000000000000000;
            auVar327._8_4_ = auVar293._8_4_;
            auVar327._12_4_ = auVar293._12_4_ ^ 0x80000000;
            auVar112 = vpcmpgtq_avx(auVar327,auVar141);
            auVar262 = vpackssdw_avx(auVar112,auVar262);
            auVar374._0_8_ = auVar351._16_8_ ^ 0x8000000000000000;
            auVar374._8_4_ = auVar351._24_4_;
            auVar374._12_4_ = auVar351._28_4_ ^ 0x80000000;
            auVar112 = vpcmpgtq_avx(auVar374,auVar180);
            auVar357._0_8_ = auVar351._0_8_ ^ 0x8000000000000000;
            auVar357._8_4_ = auVar351._8_4_;
            auVar357._12_4_ = auVar351._12_4_ ^ 0x80000000;
            auVar111 = vpcmpgtq_avx(auVar357,auVar251);
            auVar112 = vpackssdw_avx(auVar111,auVar112);
            auVar262 = vpackssdw_avx(auVar112 ^ auVar195,auVar262 ^ auVar195);
            auVar112 = vpmovsxwd_avx(auVar262);
            auVar262 = vpunpckhwd_avx(auVar262,auVar262);
            auVar348._16_16_ = auVar262;
            auVar348._0_16_ = auVar112;
            auVar351 = vmaskmovps_avx(auVar348,*(undefined1 (*) [32])(*pauVar22 + uVar27 * 4));
            auVar351 = vdivps_avx(auVar60,auVar351);
            auVar351 = vmaskmovps_avx(auVar348,auVar351);
            *(undefined1 (*) [32])(*pauVar22 + uVar27 * 4) = auVar351;
            uVar27 = uVar27 + 8;
          } while ((uVar19 + 8 & 0x1fffffff8) != uVar27);
        }
        lVar21 = lVar21 + 1;
      } while (lVar21 != iVar7);
    }
    break;
  case 0x10:
    iVar7 = bottom_top_blob->c;
    if (0 < (long)iVar7) {
      uVar20 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      lVar21 = 0;
      do {
        auVar344._8_4_ = 0x3f800000;
        auVar344._0_8_ = 0x3f8000003f800000;
        auVar183._8_4_ = 0xc2b0c0a5;
        auVar183._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar146._8_4_ = 0x42b0c0a5;
        auVar146._0_8_ = 0x42b0c0a542b0c0a5;
        auVar344._12_4_ = 0x3f800000;
        auVar183._12_4_ = 0xc2b0c0a5;
        auVar146._12_4_ = 0x42b0c0a5;
        auVar344._16_4_ = 0x3f800000;
        auVar183._16_4_ = 0xc2b0c0a5;
        auVar146._16_4_ = 0x42b0c0a5;
        auVar344._20_4_ = 0x3f800000;
        auVar183._20_4_ = 0xc2b0c0a5;
        auVar146._20_4_ = 0x42b0c0a5;
        auVar344._24_4_ = 0x3f800000;
        auVar183._24_4_ = 0xc2b0c0a5;
        auVar146._24_4_ = 0x42b0c0a5;
        auVar344._28_4_ = 0x3f800000;
        auVar183._28_4_ = 0xc2b0c0a5;
        auVar146._28_4_ = 0x42b0c0a5;
        pfVar28 = (float *)(bottom_top_blob->cstep * lVar21 * bottom_top_blob->elemsize +
                           (long)bottom_top_blob->data);
        if ((int)uVar20 < 8) {
          uVar26 = 0;
        }
        else {
          iVar24 = 7;
          do {
            auVar12._4_4_ = pfVar28[1] * -2.0;
            auVar12._0_4_ = *pfVar28 * -2.0;
            auVar12._8_4_ = pfVar28[2] * -2.0;
            auVar12._12_4_ = pfVar28[3] * -2.0;
            auVar12._16_4_ = pfVar28[4] * -2.0;
            auVar12._20_4_ = pfVar28[5] * -2.0;
            auVar12._24_4_ = pfVar28[6] * -2.0;
            auVar12._28_4_ = 0xc0000000;
            auVar260 = vminps_avx(auVar12,auVar146);
            auVar286 = vmaxps_avx(auVar260,auVar183);
            auVar147._0_4_ = auVar286._0_4_ * 1.442695 + 0.5;
            auVar147._4_4_ = auVar286._4_4_ * 1.442695 + 0.5;
            auVar147._8_4_ = auVar286._8_4_ * 1.442695 + 0.5;
            auVar147._12_4_ = auVar286._12_4_ * 1.442695 + 0.5;
            auVar147._16_4_ = auVar286._16_4_ * 1.442695 + 0.5;
            auVar147._20_4_ = auVar286._20_4_ * 1.442695 + 0.5;
            auVar147._24_4_ = auVar286._24_4_ * 1.442695 + 0.5;
            auVar147._28_4_ = 0x42b1c0a5;
            auVar351 = vroundps_avx(auVar147,1);
            auVar260 = vcmpps_avx(auVar147,auVar351,1);
            auVar260 = vandps_avx(auVar344,auVar260);
            auVar260 = vsubps_avx(auVar351,auVar260);
            fVar113 = auVar286._0_4_ + auVar260._0_4_ * -0.6931472;
            fVar165 = auVar286._4_4_ + auVar260._4_4_ * -0.6931472;
            fVar166 = auVar286._8_4_ + auVar260._8_4_ * -0.6931472;
            fVar167 = auVar286._12_4_ + auVar260._12_4_ * -0.6931472;
            fVar168 = auVar286._16_4_ + auVar260._16_4_ * -0.6931472;
            fVar169 = auVar286._20_4_ + auVar260._20_4_ * -0.6931472;
            fVar170 = auVar286._24_4_ + auVar260._24_4_ * -0.6931472;
            auVar115._0_4_ = (int)auVar260._0_4_;
            auVar115._4_4_ = (int)auVar260._4_4_;
            auVar115._8_4_ = (int)auVar260._8_4_;
            auVar115._12_4_ = (int)auVar260._12_4_;
            auVar148._16_4_ = (int)auVar260._16_4_;
            auVar148._0_16_ = auVar115;
            auVar148._20_4_ = (int)auVar260._20_4_;
            auVar148._24_4_ = (int)auVar260._24_4_;
            auVar148._28_4_ = (int)auVar260._28_4_;
            auVar180 = vpslld_avx(auVar115,0x17);
            auVar195 = vpslld_avx(auVar148._16_16_,0x17);
            auVar371._8_4_ = 0x3f800000;
            auVar371._0_8_ = 0x3f8000003f800000;
            auVar371._12_4_ = 0x3f800000;
            auVar195 = vpaddd_avx(auVar371,auVar195);
            auVar180 = vpaddd_avx(auVar371,auVar180);
            auVar48._0_4_ =
                 (fVar113 + 1.0 +
                 fVar113 * fVar113 *
                 (((((fVar113 * 0.00019875691 + 0.0013981999) * fVar113 + 0.008333452) * fVar113 +
                   0.041665796) * fVar113 + 0.16666666) * fVar113 + 0.5)) * auVar180._0_4_ + 1.0;
            auVar48._4_4_ =
                 (fVar165 + 1.0 +
                 fVar165 * fVar165 *
                 (((((fVar165 * 0.00019875691 + 0.0013981999) * fVar165 + 0.008333452) * fVar165 +
                   0.041665796) * fVar165 + 0.16666666) * fVar165 + 0.5)) * auVar180._4_4_ + 1.0;
            auVar48._8_4_ =
                 (fVar166 + 1.0 +
                 fVar166 * fVar166 *
                 (((((fVar166 * 0.00019875691 + 0.0013981999) * fVar166 + 0.008333452) * fVar166 +
                   0.041665796) * fVar166 + 0.16666666) * fVar166 + 0.5)) * auVar180._8_4_ + 1.0;
            auVar48._12_4_ =
                 (fVar167 + 1.0 +
                 fVar167 * fVar167 *
                 (((((fVar167 * 0.00019875691 + 0.0013981999) * fVar167 + 0.008333452) * fVar167 +
                   0.041665796) * fVar167 + 0.16666666) * fVar167 + 0.5)) * auVar180._12_4_ + 1.0;
            auVar48._16_4_ =
                 (fVar168 + 1.0 +
                 fVar168 * fVar168 *
                 (((((fVar168 * 0.00019875691 + 0.0013981999) * fVar168 + 0.008333452) * fVar168 +
                   0.041665796) * fVar168 + 0.16666666) * fVar168 + 0.5)) * auVar195._0_4_ + 1.0;
            auVar48._20_4_ =
                 (fVar169 + 1.0 +
                 fVar169 * fVar169 *
                 (((((fVar169 * 0.00019875691 + 0.0013981999) * fVar169 + 0.008333452) * fVar169 +
                   0.041665796) * fVar169 + 0.16666666) * fVar169 + 0.5)) * auVar195._4_4_ + 1.0;
            auVar48._24_4_ =
                 (fVar170 + 1.0 +
                 fVar170 * fVar170 *
                 (((((fVar170 * 0.00019875691 + 0.0013981999) * fVar170 + 0.008333452) * fVar170 +
                   0.041665796) * fVar170 + 0.16666666) * fVar170 + 0.5)) * auVar195._8_4_ + 1.0;
            auVar48._28_4_ = auVar286._28_4_ + auVar351._28_4_ + 1.0 + auVar351._28_4_ + 1.0;
            auVar149._8_4_ = 0x40000000;
            auVar149._0_8_ = 0x4000000040000000;
            auVar149._12_4_ = 0x40000000;
            auVar149._16_4_ = 0x40000000;
            auVar149._20_4_ = 0x40000000;
            auVar149._24_4_ = 0x40000000;
            auVar149._28_4_ = 0x40000000;
            auVar260 = vdivps_avx(auVar149,auVar48);
            *pfVar28 = auVar260._0_4_ + -1.0;
            pfVar28[1] = auVar260._4_4_ + -1.0;
            pfVar28[2] = auVar260._8_4_ + -1.0;
            pfVar28[3] = auVar260._12_4_ + -1.0;
            pfVar28[4] = auVar260._16_4_ + -1.0;
            pfVar28[5] = auVar260._20_4_ + -1.0;
            pfVar28[6] = auVar260._24_4_ + -1.0;
            pfVar28[7] = auVar260._28_4_ + -1.0;
            pfVar28 = pfVar28 + 8;
            iVar24 = iVar24 + 8;
            uVar26 = uVar20 & 0xfffffff8;
          } while (iVar24 < (int)uVar20);
        }
        auVar214._8_4_ = 0x3f800000;
        auVar214._0_8_ = 0x3f8000003f800000;
        auVar214._12_4_ = 0x3f800000;
        auVar250._8_4_ = 0x42b0c0a5;
        auVar250._0_8_ = 0x42b0c0a542b0c0a5;
        auVar250._12_4_ = 0x42b0c0a5;
        auVar261._8_4_ = 0xc2b0c0a5;
        auVar261._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar261._12_4_ = 0xc2b0c0a5;
        auVar242._8_4_ = 0x40000000;
        auVar242._0_8_ = 0x4000000040000000;
        auVar242._12_4_ = 0x40000000;
        uVar25 = uVar26 | 3;
        while ((int)uVar25 < (int)uVar20) {
          auVar30._0_4_ = *pfVar28 * -2.0;
          auVar30._4_4_ = pfVar28[1] * -2.0;
          auVar30._8_4_ = pfVar28[2] * -2.0;
          auVar30._12_4_ = pfVar28[3] * -2.0;
          auVar195 = vminps_avx(auVar30,auVar250);
          auVar141 = vmaxps_avx(auVar195,auVar261);
          auVar116._0_4_ = auVar141._0_4_ * 1.442695 + 0.5;
          auVar116._4_4_ = auVar141._4_4_ * 1.442695 + 0.5;
          auVar116._8_4_ = auVar141._8_4_ * 1.442695 + 0.5;
          auVar116._12_4_ = auVar141._12_4_ * 1.442695 + 0.5;
          auVar171._0_4_ = (int)auVar116._0_4_;
          auVar171._4_4_ = (int)auVar116._4_4_;
          auVar171._8_4_ = (int)auVar116._8_4_;
          auVar171._12_4_ = (int)auVar116._12_4_;
          auVar180 = vcvtdq2ps_avx(auVar171);
          auVar195 = vcmpps_avx(auVar116,auVar180,1);
          auVar195 = vandps_avx(auVar195,auVar214);
          auVar195 = vsubps_avx(auVar180,auVar195);
          fVar113 = auVar141._0_4_ + auVar195._0_4_ * -0.6931472;
          fVar165 = auVar141._4_4_ + auVar195._4_4_ * -0.6931472;
          fVar166 = auVar141._8_4_ + auVar195._8_4_ * -0.6931472;
          fVar167 = auVar141._12_4_ + auVar195._12_4_ * -0.6931472;
          auVar117._0_4_ = (int)auVar195._0_4_;
          auVar117._4_4_ = (int)auVar195._4_4_;
          auVar117._8_4_ = (int)auVar195._8_4_;
          auVar117._12_4_ = (int)auVar195._12_4_;
          auVar195 = vpslld_avx(auVar117,0x17);
          auVar195 = vpaddd_avx(auVar195,auVar214);
          auVar31._0_4_ =
               (fVar113 + 1.0 +
               fVar113 * fVar113 *
               (((((fVar113 * 0.00019875691 + 0.0013981999) * fVar113 + 0.008333452) * fVar113 +
                 0.041665796) * fVar113 + 0.16666666) * fVar113 + 0.5)) * auVar195._0_4_ + 1.0;
          auVar31._4_4_ =
               (fVar165 + 1.0 +
               fVar165 * fVar165 *
               (((((fVar165 * 0.00019875691 + 0.0013981999) * fVar165 + 0.008333452) * fVar165 +
                 0.041665796) * fVar165 + 0.16666666) * fVar165 + 0.5)) * auVar195._4_4_ + 1.0;
          auVar31._8_4_ =
               (fVar166 + 1.0 +
               fVar166 * fVar166 *
               (((((fVar166 * 0.00019875691 + 0.0013981999) * fVar166 + 0.008333452) * fVar166 +
                 0.041665796) * fVar166 + 0.16666666) * fVar166 + 0.5)) * auVar195._8_4_ + 1.0;
          auVar31._12_4_ =
               (fVar167 + 1.0 +
               fVar167 * fVar167 *
               (((((fVar167 * 0.00019875691 + 0.0013981999) * fVar167 + 0.008333452) * fVar167 +
                 0.041665796) * fVar167 + 0.16666666) * fVar167 + 0.5)) * auVar195._12_4_ + 1.0;
          auVar195 = vdivps_avx(auVar242,auVar31);
          *pfVar28 = auVar195._0_4_ + -1.0;
          pfVar28[1] = auVar195._4_4_ + -1.0;
          pfVar28[2] = auVar195._8_4_ + -1.0;
          pfVar28[3] = auVar195._12_4_ + -1.0;
          pfVar28 = pfVar28 + 4;
          uVar25 = uVar26 + 7;
          uVar26 = uVar26 + 4;
        }
        if (uVar20 - uVar26 != 0 && (int)uVar26 <= (int)uVar20) {
          lVar29 = 0;
          do {
            fVar113 = tanhf(pfVar28[lVar29]);
            pfVar28[lVar29] = fVar113;
            lVar29 = lVar29 + 1;
          } while (uVar20 - uVar26 != (int)lVar29);
        }
        lVar21 = lVar21 + 1;
      } while (lVar21 != iVar7);
    }
    break;
  case 0x11:
    iVar7 = bottom_top_blob->c;
    if (0 < (long)iVar7) {
      uVar20 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      lVar21 = 0;
      do {
        auVar195 = in_ZMM5._0_16_;
        auVar378._8_4_ = 0x3f3504f3;
        auVar378._0_8_ = 0x3f3504f33f3504f3;
        auVar351._8_4_ = 0x3f000000;
        auVar351._0_8_ = 0x3f0000003f000000;
        auVar286._8_4_ = 0x807fffff;
        auVar286._0_8_ = 0x807fffff807fffff;
        auVar260._8_4_ = 0x800000;
        auVar260._0_8_ = 0x80000000800000;
        auVar378._12_4_ = 0x3f3504f3;
        auVar351._12_4_ = 0x3f000000;
        auVar286._12_4_ = 0x807fffff;
        auVar260._12_4_ = 0x800000;
        auVar378._16_4_ = 0x3f3504f3;
        auVar351._16_4_ = 0x3f000000;
        auVar286._16_4_ = 0x807fffff;
        auVar260._16_4_ = 0x800000;
        auVar378._20_4_ = 0x3f3504f3;
        auVar351._20_4_ = 0x3f000000;
        auVar286._20_4_ = 0x807fffff;
        auVar260._20_4_ = 0x800000;
        auVar359._8_4_ = 0xffffff81;
        auVar359._0_8_ = 0xffffff81ffffff81;
        auVar378._24_4_ = 0x3f3504f3;
        auVar351._24_4_ = 0x3f000000;
        auVar286._24_4_ = 0x807fffff;
        auVar260._24_4_ = 0x800000;
        auVar378._28_4_ = 0x3f3504f3;
        auVar359._12_4_ = 0xffffff81;
        auVar351._28_4_ = 0x3f000000;
        auVar286._28_4_ = 0x807fffff;
        auVar260._28_4_ = 0x800000;
        pauVar22 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * lVar21 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar20 < 8) {
          uVar26 = 0;
        }
        else {
          iVar24 = 7;
          do {
            auVar290 = vmaxps_avx(*pauVar22,auVar260);
            auVar195 = vpsrld_avx(auVar290._16_16_,0x17);
            auVar293 = vandps_avx(auVar290,auVar286);
            auVar291 = vorps_avx(auVar351,auVar293);
            auVar294 = vcmpps_avx(auVar378,auVar291,2);
            auVar293 = vandnps_avx(auVar294,auVar291);
            fVar113 = auVar291._0_4_ + -1.0 + auVar293._0_4_;
            fVar165 = auVar291._4_4_ + -1.0 + auVar293._4_4_;
            fVar166 = auVar291._8_4_ + -1.0 + auVar293._8_4_;
            fVar167 = auVar291._12_4_ + -1.0 + auVar293._12_4_;
            fVar168 = auVar291._16_4_ + -1.0 + auVar293._16_4_;
            fVar169 = auVar291._20_4_ + -1.0 + auVar293._20_4_;
            fVar170 = auVar291._24_4_ + -1.0 + auVar293._24_4_;
            auVar195 = vpsubd_avx(auVar195,auVar294._16_16_);
            auVar180 = vpsrld_avx(auVar290._0_16_,0x17);
            auVar195 = vpaddd_avx(auVar359,auVar195);
            auVar180 = vpsubd_avx(auVar180,auVar294._0_16_);
            auVar180 = vpaddd_avx(auVar359,auVar180);
            auVar185._16_16_ = auVar195;
            auVar185._0_16_ = auVar180;
            auVar195._8_4_ = 0xbf000000;
            auVar195._0_8_ = 0xbf000000bf000000;
            auVar195._12_4_ = 0xbf000000;
            auVar290 = vcvtdq2ps_avx(auVar185);
            auVar294 = vcmpps_avx(*pauVar22,ZEXT1632(ZEXT816(0) << 0x40),2);
            auVar10._4_4_ =
                 (auVar290._4_4_ * 0.6931472 + fVar165 +
                 fVar165 * fVar165 *
                 (((((((((fVar165 * 0.070376836 + -0.1151461) * fVar165 + 0.116769984) * fVar165 +
                       -0.12420141) * fVar165 + 0.14249323) * fVar165 + -0.16668057) * fVar165 +
                    0.20000714) * fVar165 + -0.24999994) * fVar165 + 0.3333333) * fVar165 + -0.5)) *
                 0.4342945;
            auVar10._0_4_ =
                 (auVar290._0_4_ * 0.6931472 + fVar113 +
                 fVar113 * fVar113 *
                 (((((((((fVar113 * 0.070376836 + -0.1151461) * fVar113 + 0.116769984) * fVar113 +
                       -0.12420141) * fVar113 + 0.14249323) * fVar113 + -0.16668057) * fVar113 +
                    0.20000714) * fVar113 + -0.24999994) * fVar113 + 0.3333333) * fVar113 + -0.5)) *
                 0.4342945;
            auVar10._8_4_ =
                 (auVar290._8_4_ * 0.6931472 + fVar166 +
                 fVar166 * fVar166 *
                 (((((((((fVar166 * 0.070376836 + -0.1151461) * fVar166 + 0.116769984) * fVar166 +
                       -0.12420141) * fVar166 + 0.14249323) * fVar166 + -0.16668057) * fVar166 +
                    0.20000714) * fVar166 + -0.24999994) * fVar166 + 0.3333333) * fVar166 + -0.5)) *
                 0.4342945;
            auVar10._12_4_ =
                 (auVar290._12_4_ * 0.6931472 + fVar167 +
                 fVar167 * fVar167 *
                 (((((((((fVar167 * 0.070376836 + -0.1151461) * fVar167 + 0.116769984) * fVar167 +
                       -0.12420141) * fVar167 + 0.14249323) * fVar167 + -0.16668057) * fVar167 +
                    0.20000714) * fVar167 + -0.24999994) * fVar167 + 0.3333333) * fVar167 + -0.5)) *
                 0.4342945;
            auVar10._16_4_ =
                 (auVar290._16_4_ * 0.6931472 + fVar168 +
                 fVar168 * fVar168 *
                 (((((((((fVar168 * 0.070376836 + -0.1151461) * fVar168 + 0.116769984) * fVar168 +
                       -0.12420141) * fVar168 + 0.14249323) * fVar168 + -0.16668057) * fVar168 +
                    0.20000714) * fVar168 + -0.24999994) * fVar168 + 0.3333333) * fVar168 + -0.5)) *
                 0.4342945;
            auVar10._20_4_ =
                 (auVar290._20_4_ * 0.6931472 + fVar169 +
                 fVar169 * fVar169 *
                 (((((((((fVar169 * 0.070376836 + -0.1151461) * fVar169 + 0.116769984) * fVar169 +
                       -0.12420141) * fVar169 + 0.14249323) * fVar169 + -0.16668057) * fVar169 +
                    0.20000714) * fVar169 + -0.24999994) * fVar169 + 0.3333333) * fVar169 + -0.5)) *
                 0.4342945;
            auVar10._24_4_ =
                 (auVar290._24_4_ * 0.6931472 + fVar170 +
                 fVar170 * fVar170 *
                 (((((((((fVar170 * 0.070376836 + -0.1151461) * fVar170 + 0.116769984) * fVar170 +
                       -0.12420141) * fVar170 + 0.14249323) * fVar170 + -0.16668057) * fVar170 +
                    0.20000714) * fVar170 + -0.24999994) * fVar170 + 0.3333333) * fVar170 + -0.5)) *
                 0.4342945;
            auVar10._28_4_ = auVar290._28_4_ + auVar291._28_4_ + -1.0 + auVar293._28_4_ + 0.0;
            auVar293 = vorps_avx(auVar294,auVar10);
            *pauVar22 = auVar293;
            pauVar22 = pauVar22 + 1;
            iVar24 = iVar24 + 8;
            uVar26 = uVar20 & 0xfffffff8;
          } while (iVar24 < (int)uVar20);
        }
        auVar269._8_4_ = 0x807fffff;
        auVar269._0_8_ = 0x807fffff807fffff;
        auVar269._12_4_ = 0x807fffff;
        auVar301._8_4_ = 0x3f000000;
        auVar301._0_8_ = 0x3f0000003f000000;
        auVar301._12_4_ = 0x3f000000;
        auVar332._8_4_ = 0xffffff82;
        auVar332._0_8_ = 0xffffff82ffffff82;
        auVar332._12_4_ = 0xffffff82;
        auVar360._8_4_ = 0x3f3504f3;
        auVar360._0_8_ = 0x3f3504f33f3504f3;
        auVar360._12_4_ = 0x3f3504f3;
        auVar382._8_4_ = 0x3f800000;
        auVar382._0_8_ = 0x3f8000003f800000;
        auVar382._12_4_ = 0x3f800000;
        uVar25 = uVar26 | 3;
        while ((int)uVar25 < (int)uVar20) {
          auVar134._8_4_ = 0x800000;
          auVar134._0_8_ = 0x80000000800000;
          auVar134._12_4_ = 0x800000;
          auVar195 = vmaxps_avx(*(undefined1 (*) [16])*pauVar22,auVar134);
          auVar180 = vpsrld_avx(auVar195,0x17);
          auVar180 = vpaddd_avx(auVar332,auVar180);
          auVar195 = vandps_avx(auVar195,auVar269);
          auVar251 = vorps_avx(auVar301,auVar195);
          auVar141 = vcvtdq2ps_avx(auVar180);
          auVar180 = vcmpps_avx(auVar251,auVar360,1);
          auVar195 = vandps_avx(auVar180,auVar251);
          fVar113 = auVar251._0_4_ + -1.0 + auVar195._0_4_;
          fVar165 = auVar251._4_4_ + -1.0 + auVar195._4_4_;
          fVar166 = auVar251._8_4_ + -1.0 + auVar195._8_4_;
          fVar167 = auVar251._12_4_ + -1.0 + auVar195._12_4_;
          auVar195 = vandps_avx(auVar382,auVar180);
          auVar141 = vsubps_avx(auVar141,auVar195);
          auVar195._8_4_ = 0xbf000000;
          auVar195._0_8_ = 0xbf000000bf000000;
          auVar195._12_4_ = 0xbf000000;
          auVar180 = vcmpps_avx(*(undefined1 (*) [16])*pauVar22,_DAT_005e2030,2);
          auVar135._0_4_ =
               (auVar141._0_4_ * 0.6931472 + fVar113 +
               fVar113 * fVar113 *
               (((((((((fVar113 * 0.070376836 + -0.1151461) * fVar113 + 0.116769984) * fVar113 +
                     -0.12420141) * fVar113 + 0.14249323) * fVar113 + -0.16668057) * fVar113 +
                  0.20000714) * fVar113 + -0.24999994) * fVar113 + 0.3333333) * fVar113 + -0.5)) *
               0.4342945;
          auVar135._4_4_ =
               (auVar141._4_4_ * 0.6931472 + fVar165 +
               fVar165 * fVar165 *
               (((((((((fVar165 * 0.070376836 + -0.1151461) * fVar165 + 0.116769984) * fVar165 +
                     -0.12420141) * fVar165 + 0.14249323) * fVar165 + -0.16668057) * fVar165 +
                  0.20000714) * fVar165 + -0.24999994) * fVar165 + 0.3333333) * fVar165 + -0.5)) *
               0.4342945;
          auVar135._8_4_ =
               (auVar141._8_4_ * 0.6931472 + fVar166 +
               fVar166 * fVar166 *
               (((((((((fVar166 * 0.070376836 + -0.1151461) * fVar166 + 0.116769984) * fVar166 +
                     -0.12420141) * fVar166 + 0.14249323) * fVar166 + -0.16668057) * fVar166 +
                  0.20000714) * fVar166 + -0.24999994) * fVar166 + 0.3333333) * fVar166 + -0.5)) *
               0.4342945;
          auVar135._12_4_ =
               (auVar141._12_4_ * 0.6931472 + fVar167 +
               fVar167 * fVar167 *
               (((((((((fVar167 * 0.070376836 + -0.1151461) * fVar167 + 0.116769984) * fVar167 +
                     -0.12420141) * fVar167 + 0.14249323) * fVar167 + -0.16668057) * fVar167 +
                  0.20000714) * fVar167 + -0.24999994) * fVar167 + 0.3333333) * fVar167 + -0.5)) *
               0.4342945;
          auVar180 = vorps_avx(auVar180,auVar135);
          *(undefined1 (*) [16])*pauVar22 = auVar180;
          pauVar22 = (undefined1 (*) [32])(*pauVar22 + 0x10);
          uVar25 = uVar26 + 7;
          uVar26 = uVar26 + 4;
        }
        auVar16._8_8_ = 0x8000000000000000;
        auVar16._0_8_ = 0x8000000000000000;
        auVar195 = vpcmpeqd_avx(auVar195,auVar195);
        in_ZMM5 = ZEXT1664(auVar195);
        if ((int)uVar26 < (int)uVar20) {
          uVar19 = CONCAT44(0,~uVar26 + uVar20);
          auVar38._8_8_ = 0;
          auVar38._0_8_ = uVar19;
          auVar141 = vpshufd_avx(auVar38,0x44);
          auVar195 = vpor_avx(auVar141,auVar16);
          auVar180 = vpor_avx(auVar141,auVar16);
          uVar27 = 0;
          auVar260 = _DAT_005e2da0;
          do {
            auVar4._8_8_ = 0x8000000000000000;
            auVar4._0_8_ = 0x8000000000000000;
            auVar39._8_8_ = 0;
            auVar39._0_8_ = uVar27;
            auVar251 = vpshufd_avx(auVar39,0x44);
            auVar64._16_16_ = auVar251;
            auVar64._0_16_ = auVar251;
            auVar286 = vorps_avx(auVar64,_DAT_005e2d80);
            auVar260 = vorps_avx(auVar64,auVar260);
            auVar112 = vpor_avx(auVar141,auVar4);
            auVar251 = vpcmpgtq_avx(auVar260._16_16_ ^ auVar4,auVar112);
            auVar262 = vpcmpgtq_avx(auVar260._0_16_ ^ auVar4,auVar195);
            auVar251 = vpackssdw_avx(auVar262,auVar251);
            auVar111 = in_ZMM5._0_16_;
            auVar262 = vpcmpgtq_avx(auVar286._16_16_ ^ auVar4,auVar112);
            auVar136._0_8_ = auVar286._0_8_ ^ 0x8000000000000000;
            auVar136._8_4_ = auVar286._8_4_;
            auVar136._12_4_ = auVar286._12_4_ ^ 0x80000000;
            auVar112 = vpcmpgtq_avx(auVar136,auVar180);
            auVar262 = vpackssdw_avx(auVar112,auVar262);
            auVar251 = vpackssdw_avx(auVar262 ^ auVar111,auVar251 ^ auVar111);
            auVar262 = vpmovsxwd_avx(auVar251);
            auVar251 = vpunpckhwd_avx(auVar251,auVar251);
            auVar65._16_16_ = auVar251;
            auVar65._0_16_ = auVar262;
            auVar260 = vmaskmovps_avx(auVar65,*(undefined1 (*) [32])(*pauVar22 + uVar27 * 4));
            auVar112 = auVar260._16_16_;
            local_118._0_4_ = log10f(auVar260._16_4_);
            local_118._4_4_ = extraout_XMM0_Db_05;
            local_118._8_4_ = extraout_XMM0_Dc_05;
            local_118._12_4_ = extraout_XMM0_Dd_05;
            auVar251 = vmovshdup_avx(auVar112);
            auVar379._0_4_ = log10f(auVar251._0_4_);
            auVar379._4_60_ = extraout_var_17;
            auVar251 = vinsertps_avx(local_118,auVar379._0_16_,0x10);
            auVar262 = vpermilpd_avx(auVar112,1);
            auVar94._0_4_ = log10f(auVar262._0_4_);
            auVar94._4_60_ = extraout_var_18;
            auVar251 = vinsertps_avx(auVar251,auVar94._0_16_,0x20);
            auVar262 = vpermilps_avx(auVar112,0xff);
            auVar95._0_4_ = log10f(auVar262._0_4_);
            auVar95._4_60_ = extraout_var_19;
            auVar251 = vinsertps_avx(auVar251,auVar95._0_16_,0x30);
            local_e8._0_4_ = auVar260._0_4_;
            local_118._0_4_ = log10f((float)local_e8._0_4_);
            local_118._4_4_ = extraout_XMM0_Db_06;
            local_118._8_4_ = extraout_XMM0_Dc_06;
            local_118._12_4_ = extraout_XMM0_Dd_06;
            local_e8 = auVar260._0_16_;
            auVar262 = vmovshdup_avx(local_e8);
            auVar96._0_4_ = log10f(auVar262._0_4_);
            auVar96._4_60_ = extraout_var_20;
            auVar262 = vinsertps_avx(local_118,auVar96._0_16_,0x10);
            auVar112 = vpermilpd_avx(local_e8,1);
            auVar97._0_4_ = log10f(auVar112._0_4_);
            auVar97._4_60_ = extraout_var_21;
            auVar262 = vinsertps_avx(auVar262,auVar97._0_16_,0x20);
            auVar112 = vpermilps_avx(local_e8,0xff);
            auVar98._0_4_ = log10f(auVar112._0_4_);
            auVar260 = _DAT_005e2da0;
            auVar98._4_60_ = extraout_var_22;
            auVar112 = vpcmpeqd_avx(auVar111,auVar111);
            in_ZMM5 = ZEXT1664(auVar112);
            auVar262 = vinsertps_avx(auVar262,auVar98._0_16_,0x30);
            auVar66._16_16_ = auVar251;
            auVar66._0_16_ = auVar262;
            auVar286 = vmaskmovps_avx(auVar65,auVar66);
            *(undefined1 (*) [32])(*pauVar22 + uVar27 * 4) = auVar286;
            uVar27 = uVar27 + 8;
          } while ((uVar19 + 8 & 0x1fffffff8) != uVar27);
        }
        lVar21 = lVar21 + 1;
      } while (lVar21 != iVar7);
    }
    break;
  case 0x12:
    iVar24 = fegetround();
    fesetround(0);
    auVar286 = _DAT_005e2da0;
    auVar260 = _DAT_005e2d80;
    iVar7 = bottom_top_blob->c;
    if (0 < (long)iVar7) {
      uVar20 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      lVar21 = 0;
      auVar251._8_8_ = 0x8000000000000000;
      auVar251._0_8_ = 0x8000000000000000;
      auVar195 = vpcmpeqd_avx(auVar195,auVar195);
      do {
        pauVar22 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * lVar21 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar20 < 8) {
          uVar26 = 0;
        }
        else {
          iVar23 = 7;
          do {
            auVar351 = vroundps_avx(*pauVar22,8);
            *pauVar22 = auVar351;
            pauVar22 = pauVar22 + 1;
            iVar23 = iVar23 + 8;
            uVar26 = uVar20 & 0xfffffff8;
          } while (iVar23 < (int)uVar20);
        }
        uVar25 = uVar26 | 3;
        while ((int)uVar25 < (int)uVar20) {
          auVar180 = vroundps_avx(*(undefined1 (*) [16])*pauVar22,8);
          *(undefined1 (*) [16])*pauVar22 = auVar180;
          pauVar22 = (undefined1 (*) [32])(*pauVar22 + 0x10);
          uVar25 = uVar26 + 7;
          uVar26 = uVar26 + 4;
        }
        if ((int)uVar26 < (int)uVar20) {
          uVar19 = CONCAT44(0,~uVar26 + uVar20);
          auVar262._8_8_ = 0;
          auVar262._0_8_ = uVar19;
          auVar262 = vpshufd_avx(auVar262,0x44);
          auVar180 = vorps_avx(auVar262,auVar251);
          auVar141 = vorps_avx(auVar262,auVar251);
          auVar262 = vorps_avx(auVar262,auVar251);
          uVar27 = 0;
          do {
            auVar273._8_8_ = 0;
            auVar273._0_8_ = uVar27;
            auVar112 = vpshufd_avx(auVar273,0x44);
            auVar290._16_16_ = auVar112;
            auVar290._0_16_ = auVar112;
            auVar351 = vorps_avx(auVar290,auVar260);
            auVar293 = vorps_avx(auVar290,auVar286);
            auVar337._0_8_ = auVar293._16_8_ ^ 0x8000000000000000;
            auVar337._8_4_ = auVar293._24_4_;
            auVar337._12_4_ = auVar293._28_4_ ^ 0x80000000;
            auVar112 = vpcmpgtq_avx(auVar337,auVar180);
            auVar274._0_8_ = auVar293._0_8_ ^ 0x8000000000000000;
            auVar274._8_4_ = auVar293._8_4_;
            auVar274._12_4_ = auVar293._12_4_ ^ 0x80000000;
            auVar111 = vpcmpgtq_avx(auVar274,auVar141);
            auVar112 = vpackssdw_avx(auVar111,auVar112);
            auVar338._0_8_ = auVar351._16_8_ ^ 0x8000000000000000;
            auVar338._8_4_ = auVar351._24_4_;
            auVar338._12_4_ = auVar351._28_4_ ^ 0x80000000;
            auVar111 = vpcmpgtq_avx(auVar338,auVar180);
            auVar306._0_8_ = auVar351._0_8_ ^ 0x8000000000000000;
            auVar306._8_4_ = auVar351._8_4_;
            auVar306._12_4_ = auVar351._12_4_ ^ 0x80000000;
            auVar309 = vpcmpgtq_avx(auVar306,auVar262);
            auVar111 = vpackssdw_avx(auVar309,auVar111);
            auVar112 = vpackssdw_avx(auVar111 ^ auVar195,auVar112 ^ auVar195);
            auVar111 = vpmovsxwd_avx(auVar112);
            auVar112 = vpunpckhwd_avx(auVar112,auVar112);
            auVar291._16_16_ = auVar112;
            auVar291._0_16_ = auVar111;
            auVar351 = vmaskmovps_avx(auVar291,*(undefined1 (*) [32])(*pauVar22 + uVar27 * 4));
            auVar351 = vroundps_avx(auVar351,0xc);
            auVar351 = vmaskmovps_avx(auVar291,auVar351);
            *(undefined1 (*) [32])(*pauVar22 + uVar27 * 4) = auVar351;
            uVar27 = uVar27 + 8;
          } while ((uVar19 + 8 & 0x1fffffff8) != uVar27);
        }
        lVar21 = lVar21 + 1;
      } while (lVar21 != iVar7);
    }
    fesetround(iVar24);
    break;
  case 0x13:
    iVar7 = bottom_top_blob->c;
    if (0 < (long)iVar7) {
      uVar20 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
               bottom_top_blob->elempack;
      lVar21 = 0;
      auVar180._8_8_ = 0x8000000000000000;
      auVar180._0_8_ = 0x8000000000000000;
      auVar195 = vpcmpeqd_avx(auVar195,auVar195);
      do {
        pauVar22 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * lVar21 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar20 < 8) {
          uVar26 = 0;
        }
        else {
          iVar24 = 7;
          do {
            auVar351 = vroundps_avx(*pauVar22,0xb);
            *pauVar22 = auVar351;
            pauVar22 = pauVar22 + 1;
            iVar24 = iVar24 + 8;
            uVar26 = uVar20 & 0xfffffff8;
          } while (iVar24 < (int)uVar20);
        }
        uVar25 = uVar26 | 3;
        while ((int)uVar25 < (int)uVar20) {
          auVar141 = vroundps_avx(*(undefined1 (*) [16])*pauVar22,0xb);
          *(undefined1 (*) [16])*pauVar22 = auVar141;
          pauVar22 = (undefined1 (*) [32])(*pauVar22 + 0x10);
          uVar25 = uVar26 + 7;
          uVar26 = uVar26 + 4;
        }
        if ((int)uVar26 < (int)uVar20) {
          uVar19 = CONCAT44(0,~uVar26 + uVar20);
          auVar141._8_8_ = 0;
          auVar141._0_8_ = uVar19;
          auVar262 = vpshufd_avx(auVar141,0x44);
          auVar141 = vorps_avx(auVar262,auVar180);
          auVar251 = vorps_avx(auVar262,auVar180);
          auVar262 = vorps_avx(auVar262,auVar180);
          uVar27 = 0;
          do {
            auVar112._8_8_ = 0;
            auVar112._0_8_ = uVar27;
            auVar112 = vpshufd_avx(auVar112,0x44);
            auVar293._16_16_ = auVar112;
            auVar293._0_16_ = auVar112;
            auVar351 = vorps_avx(auVar293,auVar260);
            auVar293 = vorps_avx(auVar293,auVar286);
            auVar340._0_8_ = auVar293._16_8_ ^ 0x8000000000000000;
            auVar340._8_4_ = auVar293._24_4_;
            auVar340._12_4_ = auVar293._28_4_ ^ 0x80000000;
            auVar112 = vpcmpgtq_avx(auVar340,auVar141);
            auVar111._0_8_ = auVar293._0_8_ ^ 0x8000000000000000;
            auVar111._8_4_ = auVar293._8_4_;
            auVar111._12_4_ = auVar293._12_4_ ^ 0x80000000;
            auVar111 = vpcmpgtq_avx(auVar111,auVar251);
            auVar112 = vpackssdw_avx(auVar111,auVar112);
            auVar341._0_8_ = auVar351._16_8_ ^ 0x8000000000000000;
            auVar341._8_4_ = auVar351._24_4_;
            auVar341._12_4_ = auVar351._28_4_ ^ 0x80000000;
            auVar111 = vpcmpgtq_avx(auVar341,auVar141);
            auVar309._0_8_ = auVar351._0_8_ ^ 0x8000000000000000;
            auVar309._8_4_ = auVar351._8_4_;
            auVar309._12_4_ = auVar351._12_4_ ^ 0x80000000;
            auVar309 = vpcmpgtq_avx(auVar309,auVar262);
            auVar111 = vpackssdw_avx(auVar309,auVar111);
            auVar112 = vpackssdw_avx(auVar111 ^ auVar195,auVar112 ^ auVar195);
            auVar111 = vpmovsxwd_avx(auVar112);
            auVar112 = vpunpckhwd_avx(auVar112,auVar112);
            auVar294._16_16_ = auVar112;
            auVar294._0_16_ = auVar111;
            auVar351 = vmaskmovps_avx(auVar294,*(undefined1 (*) [32])(*pauVar22 + uVar27 * 4));
            auVar351 = vroundps_avx(auVar351,0xb);
            auVar351 = vmaskmovps_avx(auVar294,auVar351);
            *(undefined1 (*) [32])(*pauVar22 + uVar27 * 4) = auVar351;
            uVar27 = uVar27 + 8;
          } while ((uVar19 + 8 & 0x1fffffff8) != uVar27);
        }
        lVar21 = lVar21 + 1;
      } while (lVar21 != iVar7);
    }
  }
  return 0;
}

Assistant:

int UnaryOp_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    using namespace UnaryOp_x86_avx_functor;
    if (op_type == Operation_ABS)
        return unary_op_inplace<unary_op_abs>(bottom_top_blob, opt);

    if (op_type == Operation_NEG)
        return unary_op_inplace<unary_op_neg>(bottom_top_blob, opt);

    if (op_type == Operation_FLOOR)
        return unary_op_inplace<unary_op_floor>(bottom_top_blob, opt);

    if (op_type == Operation_CEIL)
        return unary_op_inplace<unary_op_ceil>(bottom_top_blob, opt);

    if (op_type == Operation_SQUARE)
        return unary_op_inplace<unary_op_square>(bottom_top_blob, opt);

    if (op_type == Operation_SQRT)
        return unary_op_inplace<unary_op_sqrt>(bottom_top_blob, opt);

    if (op_type == Operation_RSQRT)
        return unary_op_inplace<unary_op_rsqrt>(bottom_top_blob, opt);

    if (op_type == Operation_EXP)
        return unary_op_inplace<unary_op_exp>(bottom_top_blob, opt);

    if (op_type == Operation_LOG)
        return unary_op_inplace<unary_op_log>(bottom_top_blob, opt);

    if (op_type == Operation_SIN)
        return unary_op_inplace<unary_op_sin>(bottom_top_blob, opt);

    if (op_type == Operation_COS)
        return unary_op_inplace<unary_op_cos>(bottom_top_blob, opt);

    if (op_type == Operation_TAN)
        return unary_op_inplace<unary_op_tan>(bottom_top_blob, opt);

    if (op_type == Operation_ASIN)
        return unary_op_inplace<unary_op_asin>(bottom_top_blob, opt);

    if (op_type == Operation_ACOS)
        return unary_op_inplace<unary_op_acos>(bottom_top_blob, opt);

    if (op_type == Operation_ATAN)
        return unary_op_inplace<unary_op_atan>(bottom_top_blob, opt);

    if (op_type == Operation_RECIPROCAL)
        return unary_op_inplace<unary_op_reciprocal>(bottom_top_blob, opt);

    if (op_type == Operation_TANH)
        return unary_op_inplace<unary_op_tanh>(bottom_top_blob, opt);

    if (op_type == Operation_LOG10)
        return unary_op_inplace<unary_op_log10>(bottom_top_blob, opt);

    if (op_type == Operation_ROUND)
    {
        // round to nearest even
#ifdef FE_TONEAREST
        int old_rm = fegetround();
        fesetround(FE_TONEAREST);
#endif
        int ret = unary_op_inplace<unary_op_round>(bottom_top_blob, opt);
#ifdef FE_TONEAREST
        fesetround(old_rm);
#endif
        return ret;
    }

    if (op_type == Operation_TRUNC)
        return unary_op_inplace<unary_op_trunc>(bottom_top_blob, opt);

    return 0;
}